

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

char * duckdb_yyjson::yyjson_val_write_opts
                 (yyjson_val *val,yyjson_write_flag flg,yyjson_alc *alc_ptr,usize *dat_len,
                 yyjson_write_err *err)

{
  undefined4 *puVar1;
  byte bVar2;
  ushort uVar3;
  undefined4 uVar4;
  _func_void_ptr_void_ptr_size_t *p_Var5;
  _func_void_void_ptr_void_ptr *p_Var6;
  void *pvVar7;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  uint64_t uVar58;
  yyjson_write_err *pyVar59;
  ulong uVar60;
  uint *puVar61;
  ulong uVar62;
  char *pcVar63;
  int iVar64;
  undefined **ppuVar65;
  uint *puVar66;
  ulong uVar67;
  undefined1 *puVar68;
  ulong uVar69;
  yyjson_write_err *pyVar70;
  undefined2 uVar71;
  int iVar72;
  long lVar73;
  long lVar74;
  undefined8 uVar75;
  size_t sVar76;
  size_t sVar77;
  byte bVar78;
  ulong uVar79;
  uint *puVar80;
  uint uVar81;
  ulong uVar82;
  long lVar83;
  uint uVar84;
  int iVar85;
  undefined2 *puVar86;
  ulong *puVar87;
  int iVar88;
  uint uVar89;
  ulong uVar90;
  long lVar91;
  yyjson_val *pyVar92;
  char cVar93;
  uint uVar94;
  uint uVar95;
  ulong uVar96;
  undefined1 *puVar97;
  ulong uVar98;
  long lVar99;
  byte *pbVar100;
  uint uVar101;
  uint *puVar102;
  uint *puVar103;
  undefined8 *puVar104;
  int iVar105;
  uint *puVar106;
  byte *pbVar107;
  bool bVar108;
  bool bVar109;
  yyjson_write_err dummy_err;
  char local_ec;
  byte *local_e0;
  ulong local_d8;
  ulong *local_c0;
  uint *local_b8;
  undefined1 *local_a8;
  ulong *local_88;
  ulong local_68;
  ulong local_58;
  yyjson_write_err local_48;
  uint *local_38;
  
  ppuVar65 = &YYJSON_DEFAULT_ALC;
  if (alc_ptr != (yyjson_alc *)0x0) {
    ppuVar65 = &alc_ptr->malloc;
  }
  pyVar59 = err;
  if (err == (yyjson_write_err *)0x0) {
    pyVar59 = &local_48;
  }
  if (val == (yyjson_val *)0x0) {
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar70 = &local_48;
    if (err != (yyjson_write_err *)0x0) {
      pyVar70 = err;
    }
    pyVar70->msg = "input JSON is NULL";
    pyVar59->code = 1;
    return (char *)0x0;
  }
  p_Var5 = ((yyjson_alc *)ppuVar65)->malloc;
  p_Var6 = ((yyjson_alc *)ppuVar65)->free;
  pvVar7 = ((yyjson_alc *)ppuVar65)->ctx;
  uVar67 = val->tag;
  bVar78 = (byte)uVar67;
  local_ec = (char)flg;
  if (0xff < uVar67 && (~bVar78 & 6) == 0) {
    p_Var8 = ((yyjson_alc *)ppuVar65)->realloc;
    if ((flg & 0x41) == 0) {
      if ((flg & 2) == 0) {
        puVar68 = enc_table_cpy;
        puVar97 = enc_table_cpy_slash;
      }
      else {
        puVar68 = enc_table_esc;
        puVar97 = enc_table_esc_slash;
      }
      if ((flg & 4) == 0) {
        puVar97 = puVar68;
      }
      local_d8 = ((val->uni).u64 >> 4) * 0x12 + 0x47 & 0xfffffffffffffff8;
      local_e0 = (byte *)(*p_Var5)(pvVar7,local_d8);
      if (local_e0 != (byte *)0x0) {
        bVar109 = (~(uint)val->tag & 7) == 0;
        local_58 = (ulong)bVar109;
        lVar91 = (val->tag >> 8) << bVar109;
        *local_e0 = bVar109 << 5 | 0x5b;
        puVar106 = (uint *)(local_e0 + 1);
        pyVar92 = val + 1;
        puVar102 = (uint *)(local_e0 + local_d8);
        local_b8 = puVar102;
LAB_01238d6b:
        do {
          uVar67 = local_58 & 0xff;
          do {
            uVar69 = pyVar92->tag;
            bVar78 = (byte)uVar69 & 7;
            puVar80 = puVar102;
            if (bVar78 == 4) {
              if (puVar102 <= puVar106 + 8) {
                uVar69 = local_d8 >> 1;
                if (uVar69 < 0x21) {
                  uVar69 = 0x20;
                }
                sVar77 = (uVar69 + 7 & 0xfffffffffffffff8) + local_d8;
                pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,local_d8,sVar77);
                if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
                puVar80 = (uint *)(pbVar100 + (sVar77 - ((long)local_b8 - (long)puVar102)));
                memmove(puVar80,pbVar100 + ((long)puVar102 - (long)local_e0),
                        (long)local_b8 - (long)puVar102);
                puVar106 = (uint *)(pbVar100 + ((long)puVar106 - (long)local_e0));
                local_b8 = (uint *)(pbVar100 + sVar77);
                uVar69 = pyVar92->tag;
                local_e0 = pbVar100;
                local_d8 = sVar77;
              }
              uVar98 = (pyVar92->uni).u64;
              uVar101 = (uint)(uVar98 >> 0x20);
              if ((uVar69 & 0x10) == 0) {
                uVar101 = uVar101 >> 0x1f & (uint)(uVar69 >> 3);
                *(byte *)puVar106 = 0x2d;
                uVar69 = -uVar98;
                if (uVar101 == 0) {
                  uVar69 = uVar98;
                }
                pbVar100 = (byte *)((ulong)uVar101 + (long)puVar106);
                if (uVar69 < 100000000) {
                  if (uVar69 < 100) {
                    *(undefined2 *)pbVar100 =
                         *(undefined2 *)(digit_table + (ulong)(uVar69 < 10) + uVar69 * 2);
                    puVar106 = (uint *)(pbVar100 + (2 - (ulong)(uVar69 < 10)));
                  }
                  else {
                    iVar72 = (int)uVar69;
                    if (uVar69 < 10000) {
                      uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar69 = (ulong)(uVar69 < 1000);
                      *(undefined2 *)pbVar100 =
                           *(undefined2 *)(digit_table + uVar69 + (ulong)uVar101 * 2);
                      *(undefined2 *)(pbVar100 + (2 - uVar69)) =
                           *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                      puVar106 = (uint *)(pbVar100 + (4 - uVar69));
                    }
                    else if (uVar69 < 1000000) {
                      iVar72 = (int)(uVar69 * 0x68db9 >> 0x20) * -10000 + iVar72;
                      uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar98 = (ulong)(uVar69 < 100000);
                      *(undefined2 *)pbVar100 =
                           *(undefined2 *)(digit_table + uVar98 + (uVar69 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)(pbVar100 + (2 - uVar98)) =
                           *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                      *(undefined2 *)(pbVar100 + (4 - uVar98)) =
                           *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                      puVar106 = (uint *)(pbVar100 + (6 - uVar98));
                    }
                    else {
                      uVar101 = (uint)(uVar69 * 0x68db8bb >> 0x20);
                      uVar81 = uVar101 >> 8;
                      iVar72 = uVar81 * -10000 + iVar72;
                      uVar81 = uVar81 * 0x147b >> 0x13;
                      uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar69 = (ulong)(uVar69 < 10000000);
                      *(undefined2 *)pbVar100 =
                           *(undefined2 *)(digit_table + uVar69 + (ulong)uVar81 * 2);
                      *(undefined2 *)(pbVar100 + (2 - uVar69)) =
                           *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                      *(undefined2 *)(pbVar100 + (4 - uVar69)) =
                           *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                      *(undefined2 *)(pbVar100 + (6 - uVar69)) =
                           *(undefined2 *)(digit_table + (uVar84 * -100 + iVar72) * 2);
                      puVar106 = (uint *)(pbVar100 + (8 - uVar69));
                    }
                  }
                }
                else {
                  uVar98 = uVar69 / 100000000;
                  uVar62 = uVar98 * 0xfa0a1f00 + uVar69;
                  iVar72 = (int)uVar98;
                  if (uVar69 < 10000000000000000) {
                    if (uVar69 < 10000000000) {
                      *(undefined2 *)pbVar100 =
                           *(undefined2 *)(digit_table + (ulong)(uVar69 < 1000000000) + uVar98 * 2);
                      pbVar100 = pbVar100 + (2 - (ulong)(uVar69 < 1000000000));
                    }
                    else if (uVar69 < 1000000000000) {
                      uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar69 = (ulong)(uVar69 < 100000000000);
                      *(undefined2 *)pbVar100 =
                           *(undefined2 *)(digit_table + uVar69 + (ulong)uVar101 * 2);
                      *(undefined2 *)(pbVar100 + (2 - uVar69)) =
                           *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                      pbVar100 = pbVar100 + (4 - uVar69);
                    }
                    else if (uVar69 < 100000000000000) {
                      iVar72 = (int)(uVar98 * 0x68db9 >> 0x20) * -10000 + iVar72;
                      uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar69 = (ulong)(uVar69 >> 0xd < 0x48c27395);
                      *(undefined2 *)pbVar100 =
                           *(undefined2 *)(digit_table + uVar69 + (uVar98 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)(pbVar100 + (2 - uVar69)) =
                           *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                      *(undefined2 *)(pbVar100 + (4 - uVar69)) =
                           *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                      pbVar100 = pbVar100 + (6 - uVar69);
                    }
                    else {
                      uVar101 = (uint)(uVar98 * 0x68db8bb >> 0x20);
                      uVar81 = uVar101 >> 8;
                      iVar72 = uVar81 * -10000 + iVar72;
                      uVar81 = uVar81 * 0x147b >> 0x13;
                      uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar69 = (ulong)(uVar69 < 1000000000000000);
                      *(undefined2 *)pbVar100 =
                           *(undefined2 *)(digit_table + uVar69 + (ulong)uVar81 * 2);
                      *(undefined2 *)(pbVar100 + (2 - uVar69)) =
                           *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                      *(undefined2 *)(pbVar100 + (4 - uVar69)) =
                           *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                      *(undefined2 *)(pbVar100 + (6 - uVar69)) =
                           *(undefined2 *)(digit_table + (uVar84 * -100 + iVar72) * 2);
                      pbVar100 = pbVar100 + (8 - uVar69);
                    }
                    uVar101 = (uint)((uVar62 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar81 = uVar101 >> 8;
                    iVar72 = uVar81 * -10000 + (int)uVar62;
                    uVar81 = uVar81 * 0x147b >> 0x13;
                    uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar100 = *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                    *(undefined2 *)(pbVar100 + 2) =
                         *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                    *(undefined2 *)(pbVar100 + 4) = *(undefined2 *)(digit_table + (ulong)uVar84 * 2)
                    ;
                    *(undefined2 *)(pbVar100 + 6) =
                         *(undefined2 *)(digit_table + (uVar84 * 0x7fffff9c + iVar72) * 2);
                    puVar106 = (uint *)(pbVar100 + 8);
                  }
                  else {
                    uVar98 = uVar69 / 1000000000000;
                    iVar64 = (int)uVar98;
                    if (uVar69 < 1000000000000000000) {
                      iVar88 = (int)(uVar98 * 0x68db9 >> 0x20) * -10000 + iVar64;
                      uVar101 = (uint)(iVar88 * 0x147b) >> 0x13;
                      uVar69 = (ulong)(uVar69 < 100000000000000000);
                      *(undefined2 *)pbVar100 =
                           *(undefined2 *)(digit_table + uVar69 + (uVar98 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)(pbVar100 + (2 - uVar69)) =
                           *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                      *(undefined2 *)(pbVar100 + (4 - uVar69)) =
                           *(undefined2 *)(digit_table + (uVar101 * -100 + iVar88) * 2);
                      lVar73 = 6 - uVar69;
                    }
                    else {
                      uVar101 = (uint)(uVar98 / 10000);
                      iVar88 = uVar101 * -10000 + iVar64;
                      uVar101 = uVar101 / 100;
                      uVar81 = (uint)(iVar88 * 0x147b) >> 0x13;
                      uVar69 = (ulong)(uVar69 < 10000000000000000000);
                      *(undefined2 *)pbVar100 =
                           *(undefined2 *)(digit_table + uVar69 + (ulong)uVar101 * 2);
                      *(undefined2 *)(pbVar100 + (2 - uVar69)) =
                           *(undefined2 *)
                            (digit_table + (uVar101 * -100 + (int)(uVar98 / 10000)) * 2);
                      *(undefined2 *)(pbVar100 + (4 - uVar69)) =
                           *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                      *(undefined2 *)(pbVar100 + (6 - uVar69)) =
                           *(undefined2 *)(digit_table + (uVar81 * -100 + iVar88) * 2);
                      lVar73 = 8 - uVar69;
                    }
                    pbVar100 = pbVar100 + lVar73;
                    iVar72 = iVar72 + iVar64 * -10000;
                    uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar100 = *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                    *(undefined2 *)(pbVar100 + 2) =
                         *(undefined2 *)(digit_table + (uVar101 * 0x7fffff9c + iVar72) * 2);
                    uVar101 = (uint)((uVar62 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar81 = uVar101 >> 8;
                    iVar72 = uVar81 * -10000 + (int)uVar62;
                    uVar81 = uVar81 * 0x147b >> 0x13;
                    uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                    *(undefined2 *)(pbVar100 + 4) = *(undefined2 *)(digit_table + (ulong)uVar81 * 2)
                    ;
                    *(undefined2 *)(pbVar100 + 6) =
                         *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                    *(undefined2 *)(pbVar100 + 8) = *(undefined2 *)(digit_table + (ulong)uVar84 * 2)
                    ;
                    *(undefined2 *)(pbVar100 + 10) =
                         *(undefined2 *)(digit_table + (uVar84 * 0x7fffff9c + iVar72) * 2);
                    puVar106 = (uint *)(pbVar100 + 0xc);
                  }
                }
              }
              else {
                uVar69 = uVar98 & 0xfffffffffffff;
                uVar101 = uVar101 >> 0x14 & 0x7ff;
                if (uVar101 == 0x7ff) {
                  if ((flg & 0x10) == 0) {
                    if ((flg & 8) == 0) {
                      if (dat_len != (usize *)0x0) {
                        *dat_len = 0;
                      }
                      pyVar70 = &local_48;
                      if (err != (yyjson_write_err *)0x0) {
                        pyVar70 = err;
                      }
                      pyVar59->code = 4;
                      pyVar70->msg = "nan or inf number is not allowed";
                      goto joined_r0x0123b975;
                    }
                    if (uVar69 == 0) {
                      *(byte *)puVar106 = 0x2d;
                      puVar104 = (undefined8 *)((long)puVar106 - ((long)uVar98 >> 0x3f));
                      puVar106 = (uint *)(puVar104 + 1);
                      *puVar104 = 0x7974696e69666e49;
                    }
                    else {
                      *puVar106 = 0x4e614e;
                      puVar106 = (uint *)((long)puVar106 + 3);
                    }
                  }
                  else {
                    *puVar106 = 0x6c6c756e;
                    puVar106 = puVar106 + 1;
                  }
                }
                else {
                  *(byte *)puVar106 = 0x2d;
                  lVar73 = -((long)uVar98 >> 0x3f);
                  puVar1 = (undefined4 *)((long)puVar106 + lVar73);
                  if ((uVar98 & 0x7fffffffffffffff) == 0) {
                    *puVar1 = 0x302e30;
                    puVar106 = (uint *)((long)puVar1 + 3);
                  }
                  else if (uVar101 == 0) {
                    yyjson_val_write_opts();
                    puVar106 = local_38;
                  }
                  else {
                    uVar62 = uVar69 + 0x10000000000000;
                    if (uVar101 - 0x3ff < 0x35) {
                      lVar99 = 0;
                      if (uVar62 != 0) {
                        for (; (uVar62 >> lVar99 & 1) == 0; lVar99 = lVar99 + 1) {
                        }
                      }
                      if ((uint)lVar99 < 0x433 - uVar101) goto LAB_01239007;
                      uVar62 = uVar62 >> ((byte)(0x433 - uVar101) & 0x3f);
                      if (uVar62 < 100000000) {
                        if (uVar62 < 100) {
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)(digit_table + (ulong)(uVar62 < 10) + uVar62 * 2);
                          pcVar63 = (char *)((long)puVar1 + (2 - (ulong)(uVar62 < 10)));
                        }
                        else {
                          iVar72 = (int)uVar62;
                          if (uVar62 < 10000) {
                            uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                            uVar69 = (ulong)(uVar62 < 1000);
                            *(undefined2 *)puVar1 =
                                 *(undefined2 *)(digit_table + uVar69 + (ulong)uVar101 * 2);
                            *(undefined2 *)((long)puVar1 + (2 - uVar69)) =
                                 *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                            pcVar63 = (char *)((long)puVar1 + (4 - uVar69));
                          }
                          else if (uVar62 < 1000000) {
                            iVar72 = (int)(uVar62 * 0x68db9 >> 0x20) * -10000 + iVar72;
                            uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                            uVar69 = (ulong)(uVar62 < 100000);
                            *(undefined2 *)puVar1 =
                                 *(undefined2 *)
                                  (digit_table + uVar69 + (uVar62 * 0x68db9 >> 0x20) * 2);
                            *(undefined2 *)((long)puVar1 + (2 - uVar69)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                            *(undefined2 *)((long)puVar1 + (4 - uVar69)) =
                                 *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                            pcVar63 = (char *)((long)puVar1 + (6 - uVar69));
                          }
                          else {
                            uVar101 = (uint)(uVar62 * 0x68db8bb >> 0x20);
                            uVar81 = uVar101 >> 8;
                            iVar72 = uVar81 * -10000 + iVar72;
                            uVar81 = uVar81 * 0x147b >> 0x13;
                            uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                            uVar69 = (ulong)(uVar62 < 10000000);
                            *(undefined2 *)puVar1 =
                                 *(undefined2 *)(digit_table + uVar69 + (ulong)uVar81 * 2);
                            *(undefined2 *)((long)puVar1 + (2 - uVar69)) =
                                 *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2)
                            ;
                            *(undefined2 *)((long)puVar1 + (4 - uVar69)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                            *(undefined2 *)((long)puVar1 + (6 - uVar69)) =
                                 *(undefined2 *)(digit_table + (uVar84 * -100 + iVar72) * 2);
                            pcVar63 = (char *)((long)puVar1 + (8 - uVar69));
                          }
                        }
                      }
                      else {
                        auVar23._8_8_ = 0;
                        auVar23._0_8_ = uVar62;
                        uVar69 = SUB168(auVar23 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                        if (uVar62 < 10000000000) {
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)
                                (digit_table + (ulong)(uVar62 < 1000000000) + uVar69 * 2);
                          puVar86 = (undefined2 *)
                                    ((long)puVar1 + (2 - (ulong)(uVar62 < 1000000000)));
                        }
                        else {
                          iVar72 = (int)uVar69;
                          if (uVar62 < 1000000000000) {
                            uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                            uVar98 = (ulong)(uVar62 < 100000000000);
                            *(undefined2 *)puVar1 =
                                 *(undefined2 *)(digit_table + uVar98 + (ulong)uVar101 * 2);
                            *(undefined2 *)((long)puVar1 + (2 - uVar98)) =
                                 *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                            puVar86 = (undefined2 *)((long)puVar1 + (4 - uVar98));
                          }
                          else if (uVar62 < 100000000000000) {
                            iVar72 = (int)(uVar69 * 0x68db9 >> 0x20) * -10000 + iVar72;
                            uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                            uVar98 = (ulong)(uVar62 >> 0xd < 0x48c27395);
                            *(undefined2 *)puVar1 =
                                 *(undefined2 *)
                                  (digit_table + uVar98 + (uVar69 * 0x68db9 >> 0x20) * 2);
                            *(undefined2 *)((long)puVar1 + (2 - uVar98)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                            *(undefined2 *)((long)puVar1 + (4 - uVar98)) =
                                 *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                            puVar86 = (undefined2 *)((long)puVar1 + (6 - uVar98));
                          }
                          else {
                            uVar101 = (uint)(uVar69 * 0x68db8bb >> 0x20);
                            uVar81 = uVar101 >> 8;
                            iVar72 = uVar81 * -10000 + iVar72;
                            uVar81 = uVar81 * 0x147b >> 0x13;
                            uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                            uVar98 = (ulong)(uVar62 < 1000000000000000);
                            *(undefined2 *)puVar1 =
                                 *(undefined2 *)(digit_table + uVar98 + (ulong)uVar81 * 2);
                            *(undefined2 *)((long)puVar1 + (2 - uVar98)) =
                                 *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2)
                            ;
                            *(undefined2 *)((long)puVar1 + (4 - uVar98)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                            *(undefined2 *)((long)puVar1 + (6 - uVar98)) =
                                 *(undefined2 *)(digit_table + (uVar84 * -100 + iVar72) * 2);
                            puVar86 = (undefined2 *)((long)puVar1 + (8 - uVar98));
                          }
                        }
                        uVar62 = uVar69 * 0xfa0a1f00 + uVar62;
                        uVar101 = (uint)((uVar62 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar81 = uVar101 >> 8;
                        iVar72 = uVar81 * -10000 + (int)uVar62;
                        uVar81 = uVar81 * 0x147b >> 0x13;
                        uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                        *puVar86 = *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                        puVar86[1] = *(undefined2 *)
                                      (digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                        puVar86[2] = *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                        puVar86[3] = *(undefined2 *)
                                      (digit_table + (uVar84 * 0x7fffff9c + iVar72) * 2);
                        pcVar63 = (char *)(puVar86 + 4);
                      }
                      pcVar63[0] = '.';
                      pcVar63[1] = '0';
LAB_0123aacf:
                      puVar106 = (uint *)(pcVar63 + 2);
                    }
                    else {
LAB_01239007:
                      uVar98 = (ulong)((uint)uVar98 & 1);
                      iVar72 = uVar101 * 0x4d105 + -0x200a5;
                      if (uVar101 == 1 || uVar69 != 0) {
                        iVar72 = uVar101 * 0x4d105;
                      }
                      iVar72 = iVar72 + -0x1439b7ff >> 0x14;
                      uVar60 = *(ulong *)(pow10_sig_table + (ulong)(iVar72 * -2 + 0x2ae) * 8);
                      uVar82 = *(long *)(pow10_sig_table + (ulong)(iVar72 * -2 + 0x2af) * 8) +
                               (ulong)(iVar72 - 1U < 0xffffffc8);
                      bVar78 = ((char)((uint)(iVar72 * -0x3526b) >> 0x10) + (char)uVar101) - 0x32;
                      uVar69 = (ulong)(uVar101 != 1 && uVar69 == 0) + uVar62 * 4 + -2 <<
                               (bVar78 & 0x3f);
                      auVar17._8_8_ = 0;
                      auVar17._0_8_ = uVar82;
                      auVar37._8_8_ = 0;
                      auVar37._0_8_ = uVar69;
                      auVar52._8_8_ = 0;
                      auVar52._0_8_ = SUB168(auVar17 * auVar37,8);
                      auVar18._8_8_ = 0;
                      auVar18._0_8_ = uVar60;
                      auVar38._8_8_ = 0;
                      auVar38._0_8_ = uVar69;
                      auVar52 = auVar18 * auVar38 + auVar52;
                      uVar69 = uVar62 * 4 << (bVar78 & 0x3f);
                      auVar19._8_8_ = 0;
                      auVar19._0_8_ = uVar82;
                      auVar39._8_8_ = 0;
                      auVar39._0_8_ = uVar69;
                      auVar53._8_8_ = 0;
                      auVar53._0_8_ = SUB168(auVar19 * auVar39,8);
                      auVar20._8_8_ = 0;
                      auVar20._0_8_ = uVar60;
                      auVar40._8_8_ = 0;
                      auVar40._0_8_ = uVar69;
                      auVar53 = auVar20 * auVar40 + auVar53;
                      uVar79 = auVar53._8_8_;
                      uVar69 = uVar62 * 4 + 2 << (bVar78 & 0x3f);
                      auVar21._8_8_ = 0;
                      auVar21._0_8_ = uVar82;
                      auVar41._8_8_ = 0;
                      auVar41._0_8_ = uVar69;
                      auVar54._8_8_ = 0;
                      auVar54._0_8_ = SUB168(auVar21 * auVar41,8);
                      auVar22._8_8_ = 0;
                      auVar22._0_8_ = uVar60;
                      auVar42._8_8_ = 0;
                      auVar42._0_8_ = uVar69;
                      auVar54 = auVar22 * auVar42 + auVar54;
                      uVar69 = ((ulong)((auVar52 & (undefined1  [16])0xfffffffffffffffe) !=
                                       (undefined1  [16])0x0) | auVar52._8_8_) + uVar98;
                      uVar98 = ((ulong)((auVar54 & (undefined1  [16])0xfffffffffffffffe) !=
                                       (undefined1  [16])0x0) | auVar54._8_8_) - uVar98;
                      if (uVar79 < 0x28) {
LAB_01239166:
                        uVar60 = (auVar53 & (undefined1  [16])0xfffffffffffffffe) !=
                                 (undefined1  [16])0x0 | uVar79;
                        uVar62 = uVar79 & 0xfffffffffffffffc;
                        bVar109 = true;
                        if (uVar60 <= uVar62 + 2) {
                          bVar109 = (bool)((byte)((uVar79 & 0xffffffff) >> 2) & 0x3f &
                                          uVar60 == uVar62 + 2);
                        }
                        bVar108 = uVar62 + 4 <= uVar98;
                        if (uVar62 < uVar69 == bVar108) {
                          bVar109 = bVar108;
                        }
                        uVar69 = (ulong)bVar109 + (uVar79 >> 2);
                      }
                      else {
                        uVar60 = uVar79 / 0x28;
                        uVar62 = uVar60 * 0x28 + 0x28;
                        if (uVar60 * 0x28 < uVar69 != uVar62 <= uVar98) goto LAB_01239166;
                        uVar69 = (uVar60 + 1) - (ulong)(uVar98 < uVar62);
                        iVar72 = iVar72 + 1;
                      }
                      iVar64 = (0x11 - (uint)(uVar69 < 10000000000000000)) -
                               (uint)(uVar69 < 1000000000000000);
                      uVar101 = iVar64 + iVar72;
                      if (iVar64 + iVar72 + 5U < 0x1b) {
                        if ((int)uVar101 < 1) {
                          uVar98 = uVar69 / 100000000;
                          uVar81 = (uint)uVar98;
                          puVar86 = (undefined2 *)
                                    ((long)puVar1 +
                                    (((ulong)(2 - uVar101) + 1) - (ulong)(uVar81 < 100000000)));
                          iVar88 = (int)((uVar98 & 0xffffffff) / 10000);
                          iVar64 = iVar88 * -10000 + uVar81;
                          uVar69 = uVar98 * 0xfa0a1f00 + uVar69;
                          iVar72 = (int)(((uVar98 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                          uVar94 = (uint)(iVar72 * 0x29) >> 0xc;
                          uVar89 = uVar94 * -100 + iVar72;
                          uVar84 = iVar72 * -100 + iVar88;
                          *(char *)((long)puVar1 + (ulong)(2 - uVar101)) = (char)uVar94 + '0';
                          uVar98 = (ulong)(uVar89 < 10 && uVar81 < 100000000);
                          *puVar86 = *(undefined2 *)(digit_table + uVar98 + uVar89 * 2);
                          *(undefined2 *)((long)puVar86 + (2 - uVar98)) =
                               *(undefined2 *)(digit_table + uVar84 * 2);
                          iVar72 = (int)uVar69;
                          if (iVar72 == 0) {
                            if (iVar64 == 0) {
                              uVar69 = (ulong)(byte)dec_trailing_zero_table[uVar89];
                              if (uVar84 != 0) {
                                uVar69 = 0;
                              }
                              uVar69 = uVar69 + (byte)dec_trailing_zero_table[uVar84];
                              lVar73 = 4;
                            }
                            else {
                              uVar81 = (uint)(iVar64 * 0x147b) >> 0x13;
                              uVar84 = uVar81 * -100 + iVar64;
                              *(undefined2 *)((long)puVar86 + (4 - uVar98)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                              *(undefined2 *)((long)puVar86 + (6 - uVar98)) =
                                   *(undefined2 *)(digit_table + uVar84 * 2);
                              uVar69 = (ulong)(byte)dec_trailing_zero_table[uVar81] + 2;
                              if (uVar84 != 0) {
                                uVar69 = (ulong)(byte)dec_trailing_zero_table[uVar84];
                              }
                              lVar73 = 8;
                            }
                            uVar69 = lVar73 - uVar69;
                          }
                          else {
                            uVar89 = (uint)(iVar64 * 0x147b) >> 0x13;
                            uVar81 = (uint)((uVar69 & 0xffffffff) * 0x68db8bb >> 0x20);
                            uVar94 = uVar81 >> 8;
                            uVar84 = uVar94 * 0x147b >> 0x13;
                            uVar69 = (ulong)uVar84;
                            uVar81 = uVar84 * -100 + (uVar81 >> 8);
                            *(undefined2 *)((long)puVar86 + (4 - uVar98)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar89 * 2);
                            *(undefined2 *)((long)puVar86 + (6 - uVar98)) =
                                 *(undefined2 *)(digit_table + (uVar89 * 0x7fffff9c + iVar64) * 2);
                            *(undefined2 *)((long)puVar86 + (8 - uVar98)) =
                                 *(undefined2 *)(digit_table + uVar69 * 2);
                            *(undefined2 *)((long)puVar86 + (10 - uVar98)) =
                                 *(undefined2 *)(digit_table + uVar81 * 2);
                            iVar72 = uVar94 * -10000 + iVar72;
                            if (iVar72 == 0) {
                              lVar73 = 0xc;
                            }
                            else {
                              uVar81 = (uint)(iVar72 * 0x147b) >> 0x13;
                              uVar69 = (ulong)uVar81;
                              uVar81 = uVar81 * -100 + iVar72;
                              *(undefined2 *)((long)puVar86 + (0xc - uVar98)) =
                                   *(undefined2 *)(digit_table + uVar69 * 2);
                              *(undefined2 *)((long)puVar86 + (0xe - uVar98)) =
                                   *(undefined2 *)(digit_table + uVar81 * 2);
                              lVar73 = 0x10;
                            }
                            uVar69 = (ulong)(byte)dec_trailing_zero_table[uVar69] + 2;
                            if (uVar81 != 0) {
                              uVar69 = (ulong)(byte)dec_trailing_zero_table[uVar81];
                            }
                            uVar69 = lVar73 - uVar69;
                          }
                          puVar106 = (uint *)((long)puVar86 + ((uVar69 & 0xffffffff) - uVar98));
                          *(undefined2 *)puVar1 = 0x2e30;
                          if ((int)uVar101 < 0) {
                            switchD_005681f0::default
                                      ((undefined2 *)((long)puVar1 + 2),0x30,(ulong)-uVar101);
                          }
                        }
                        else {
                          uVar98 = uVar69 / 100000000;
                          uVar81 = (uint)uVar98;
                          puVar86 = (undefined2 *)((long)puVar1 + (2 - (ulong)(uVar81 < 100000000)))
                          ;
                          iVar88 = (int)((uVar98 & 0xffffffff) / 10000);
                          iVar64 = iVar88 * -10000 + uVar81;
                          uVar69 = uVar98 * 0xfa0a1f00 + uVar69;
                          iVar72 = (int)(((uVar98 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                          uVar94 = (uint)(iVar72 * 0x29) >> 0xc;
                          uVar89 = uVar94 * -100 + iVar72;
                          uVar84 = iVar72 * -100 + iVar88;
                          *puVar1 = 0x30303030;
                          puVar1[1] = 0x30303030;
                          puVar1[2] = 0x30303030;
                          puVar1[3] = 0x30303030;
                          *(undefined8 *)(puVar1 + 4) = 0x3030303030303030;
                          *(char *)((long)puVar1 + 1) = (char)uVar94 + '0';
                          uVar98 = (ulong)(uVar89 < 10 && uVar81 < 100000000);
                          *puVar86 = *(undefined2 *)(digit_table + uVar98 + uVar89 * 2);
                          *(undefined2 *)((long)puVar86 + (2 - uVar98)) =
                               *(undefined2 *)(digit_table + uVar84 * 2);
                          iVar72 = (int)uVar69;
                          if (iVar72 == 0) {
                            if (iVar64 == 0) {
                              uVar69 = (ulong)(byte)dec_trailing_zero_table[uVar89];
                              if (uVar84 != 0) {
                                uVar69 = 0;
                              }
                              uVar69 = uVar69 + (byte)dec_trailing_zero_table[uVar84];
                              lVar99 = 4;
                            }
                            else {
                              uVar81 = (uint)(iVar64 * 0x147b) >> 0x13;
                              uVar84 = uVar81 * -100 + iVar64;
                              *(undefined2 *)((long)puVar86 + (4 - uVar98)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                              *(undefined2 *)((long)puVar86 + (6 - uVar98)) =
                                   *(undefined2 *)(digit_table + uVar84 * 2);
                              uVar69 = (ulong)(byte)dec_trailing_zero_table[uVar81] + 2;
                              if (uVar84 != 0) {
                                uVar69 = (ulong)(byte)dec_trailing_zero_table[uVar84];
                              }
                              lVar99 = 8;
                            }
                            uVar69 = lVar99 - uVar69;
                          }
                          else {
                            uVar89 = (uint)(iVar64 * 0x147b) >> 0x13;
                            uVar81 = (uint)((uVar69 & 0xffffffff) * 0x68db8bb >> 0x20);
                            uVar94 = uVar81 >> 8;
                            uVar84 = uVar94 * 0x147b >> 0x13;
                            uVar69 = (ulong)uVar84;
                            uVar81 = uVar84 * -100 + (uVar81 >> 8);
                            *(undefined2 *)((long)puVar86 + (4 - uVar98)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar89 * 2);
                            *(undefined2 *)((long)puVar86 + (6 - uVar98)) =
                                 *(undefined2 *)(digit_table + (uVar89 * 0x7fffff9c + iVar64) * 2);
                            *(undefined2 *)((long)puVar86 + (8 - uVar98)) =
                                 *(undefined2 *)(digit_table + uVar69 * 2);
                            *(undefined2 *)((long)puVar86 + (10 - uVar98)) =
                                 *(undefined2 *)(digit_table + uVar81 * 2);
                            iVar72 = uVar94 * -10000 + iVar72;
                            if (iVar72 == 0) {
                              lVar99 = 0xc;
                            }
                            else {
                              uVar81 = (uint)(iVar72 * 0x147b) >> 0x13;
                              uVar69 = (ulong)uVar81;
                              uVar81 = uVar81 * -100 + iVar72;
                              *(undefined2 *)((long)puVar86 + (0xc - uVar98)) =
                                   *(undefined2 *)(digit_table + uVar69 * 2);
                              *(undefined2 *)((long)puVar86 + (0xe - uVar98)) =
                                   *(undefined2 *)(digit_table + uVar81 * 2);
                              lVar99 = 0x10;
                            }
                            uVar69 = (ulong)(byte)dec_trailing_zero_table[uVar69] + 2;
                            if (uVar81 != 0) {
                              uVar69 = (ulong)(byte)dec_trailing_zero_table[uVar81];
                            }
                            uVar69 = lVar99 - uVar69;
                          }
                          puVar102 = (uint *)((long)puVar86 + ((uVar69 & 0xffffffff) - uVar98));
                          uVar69 = 0;
                          do {
                            *(byte *)((long)puVar106 + uVar69 + lVar73) =
                                 *(byte *)((long)puVar106 + uVar69 + lVar73 + 1);
                            uVar69 = uVar69 + 1;
                          } while (uVar101 != uVar69);
                          puVar68 = (undefined1 *)((ulong)uVar101 + (long)puVar1);
                          puVar106 = (uint *)(puVar68 + 2);
                          *puVar68 = 0x2e;
                          if (puVar106 < puVar102) {
                            puVar106 = puVar102;
                          }
                        }
                      }
                      else {
                        uVar98 = uVar69 / 100000000;
                        uVar81 = (uint)uVar98;
                        lVar73 = 2 - (ulong)(uVar81 < 100000000);
                        iVar88 = (int)((uVar98 & 0xffffffff) / 10000);
                        iVar64 = iVar88 * -10000 + uVar81;
                        uVar69 = uVar98 * 0xfa0a1f00 + uVar69;
                        iVar72 = (int)(((uVar98 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar94 = (uint)(iVar72 * 0x29) >> 0xc;
                        uVar89 = uVar94 * -100 + iVar72;
                        uVar84 = iVar72 * -100 + iVar88;
                        *(char *)((long)puVar1 + 1) = (char)uVar94 + '0';
                        uVar98 = (ulong)(uVar89 < 10 && uVar81 < 100000000);
                        *(undefined2 *)((long)puVar1 + lVar73) =
                             *(undefined2 *)(digit_table + uVar98 + uVar89 * 2);
                        lVar73 = lVar73 - uVar98;
                        *(undefined2 *)((long)puVar1 + lVar73 + 2) =
                             *(undefined2 *)(digit_table + uVar84 * 2);
                        iVar72 = (int)uVar69;
                        if (iVar72 == 0) {
                          if (iVar64 == 0) {
                            uVar81 = (uint)(byte)dec_trailing_zero_table[uVar89];
                            if (uVar84 != 0) {
                              uVar81 = 0;
                            }
                            uVar81 = uVar81 + (byte)dec_trailing_zero_table[uVar84];
                            iVar72 = 4;
                          }
                          else {
                            uVar81 = (uint)(iVar64 * 0x147b) >> 0x13;
                            uVar84 = uVar81 * -100 + iVar64;
                            *(undefined2 *)((long)puVar1 + lVar73 + 4) =
                                 *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                            *(undefined2 *)((long)puVar1 + lVar73 + 6) =
                                 *(undefined2 *)(digit_table + uVar84 * 2);
                            uVar81 = (byte)dec_trailing_zero_table[uVar81] + 2;
                            if (uVar84 != 0) {
                              uVar81 = (uint)(byte)dec_trailing_zero_table[uVar84];
                            }
                            iVar72 = 8;
                          }
                          uVar81 = iVar72 - uVar81;
                        }
                        else {
                          uVar94 = (uint)(iVar64 * 0x147b) >> 0x13;
                          uVar81 = (uint)((uVar69 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar95 = uVar81 >> 8;
                          uVar89 = uVar95 * 0x147b >> 0x13;
                          uVar84 = uVar89 * -100 + (uVar81 >> 8);
                          *(undefined2 *)((long)puVar1 + lVar73 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar94 * 2);
                          *(undefined2 *)((long)puVar1 + lVar73 + 6) =
                               *(undefined2 *)(digit_table + (uVar94 * 0x7fffff9c + iVar64) * 2);
                          *(undefined2 *)((long)puVar1 + lVar73 + 8) =
                               *(undefined2 *)(digit_table + (ulong)uVar89 * 2);
                          *(undefined2 *)((long)puVar1 + lVar73 + 10) =
                               *(undefined2 *)(digit_table + uVar84 * 2);
                          iVar72 = uVar95 * -10000 + iVar72;
                          if (iVar72 == 0) {
                            uVar81 = (byte)dec_trailing_zero_table[uVar89] + 2;
                            if (uVar84 != 0) {
                              uVar81 = (uint)(byte)dec_trailing_zero_table[uVar84];
                            }
                            iVar72 = 0xc;
                          }
                          else {
                            uVar81 = (uint)(iVar72 * 0x147b) >> 0x13;
                            uVar84 = uVar81 * -100 + iVar72;
                            *(undefined2 *)((long)puVar1 + lVar73 + 0xc) =
                                 *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                            *(undefined2 *)((long)puVar1 + lVar73 + 0xe) =
                                 *(undefined2 *)(digit_table + uVar84 * 2);
                            uVar81 = (byte)dec_trailing_zero_table[uVar81] + 2;
                            if (uVar84 != 0) {
                              uVar81 = (uint)(byte)dec_trailing_zero_table[uVar84];
                            }
                            iVar72 = 0x10;
                          }
                          uVar81 = iVar72 - uVar81;
                        }
                        puVar86 = (undefined2 *)
                                  ((long)puVar1 +
                                  (((ulong)uVar81 + lVar73) - (ulong)((ulong)uVar81 + lVar73 == 2)))
                        ;
                        uVar101 = uVar101 - 1;
                        *(undefined1 *)puVar1 = *(undefined1 *)((long)puVar1 + 1);
                        *(undefined1 *)((long)puVar1 + 1) = 0x2e;
                        *puVar86 = 0x2d65;
                        uVar84 = uVar101 >> 0x1f;
                        pcVar63 = (char *)((long)puVar86 + (ulong)uVar84 + 1);
                        uVar81 = -uVar101;
                        if (0 < (int)uVar101) {
                          uVar81 = uVar101;
                        }
                        if (uVar81 < 100) {
                          *(undefined2 *)pcVar63 =
                               *(undefined2 *)
                                (digit_table + (ulong)(uVar81 < 10) + (ulong)uVar81 * 2);
                          pcVar63 = pcVar63 + -(ulong)(uVar81 < 10);
                          goto LAB_0123aacf;
                        }
                        *pcVar63 = (char)(uVar81 * 0x290 >> 0x10) + '0';
                        *(undefined2 *)((long)puVar86 + (ulong)uVar84 + 2) =
                             *(undefined2 *)
                              (digit_table + ((uVar81 * 0x290 >> 0x10) * 0x7fffff9c + uVar81) * 2);
                        puVar106 = (uint *)((long)puVar86 + (ulong)uVar84 + 4);
                      }
                    }
                  }
                }
              }
              *(byte *)puVar106 = 0x2c;
              puVar106 = (uint *)((long)puVar106 + 1);
            }
            else if (((uint)uVar69 & 7) == 5) {
              uVar98 = uVar69 >> 8;
              puVar66 = (uint *)(pyVar92->uni).str;
              if (puVar102 <= (uint *)((long)puVar106 + uVar98 * 6 + 0x10)) {
                uVar62 = uVar98 * 6 + 0x10;
                uVar60 = local_d8 >> 1;
                if (local_d8 >> 1 <= uVar62) {
                  uVar60 = uVar62;
                }
                sVar77 = (uVar60 + 7 & 0xfffffffffffffff8) + local_d8;
                pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,local_d8,sVar77);
                if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
                puVar80 = (uint *)(pbVar100 + (sVar77 - ((long)local_b8 - (long)puVar102)));
                memmove(puVar80,pbVar100 + ((long)puVar102 - (long)local_e0),
                        (long)local_b8 - (long)puVar102);
                puVar106 = (uint *)(pbVar100 + ((long)puVar106 - (long)local_e0));
                local_b8 = (uint *)(pbVar100 + sVar77);
                local_e0 = pbVar100;
                local_d8 = sVar77;
              }
              if (puVar97 != enc_table_cpy) {
                puVar102 = (uint *)(uVar98 + (long)puVar66);
                *(byte *)puVar106 = 0x22;
LAB_0123ac59:
                lVar73 = (long)puVar102 - (long)puVar66;
                if (0xf < lVar73) {
                  lVar99 = 0;
                  do {
                    puVar103 = (uint *)((long)puVar106 + lVar99 + 1);
                    puVar61 = (uint *)(lVar99 + (long)puVar66);
                    bVar78 = *(byte *)((long)puVar66 + lVar99);
                    if (puVar97[bVar78] != '\0') goto LAB_0123b016;
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 1)] != '\0') {
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 1);
                      puVar61 = (uint *)((long)puVar66 + lVar99);
                      goto LAB_0123ae2d;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 2)] != '\0') {
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 1);
                      puVar61 = (uint *)((long)puVar66 + lVar99);
                      goto LAB_0123ae42;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 3)] != '\0') {
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 1);
                      puVar61 = (uint *)((long)puVar66 + lVar99);
                      goto LAB_0123ae5d;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 4)] != '\0') {
                      puVar61 = (uint *)((byte *)(lVar99 + (long)puVar66) + 4);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 5);
                      *(undefined4 *)((long)puVar106 + lVar99 + 1) =
                           *(undefined4 *)(lVar99 + (long)puVar66);
                      goto LAB_0123b016;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 5)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 5);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 6);
                      *(byte *)((long)puVar103 + -1) = pbVar100[4];
                      *(undefined4 *)((long)puVar103 + -5) = *(undefined4 *)pbVar100;
                      goto LAB_0123b016;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 6)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 6);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 7);
                      *(ushort *)((long)puVar103 + -2) = *(ushort *)(pbVar100 + 4);
                      *(undefined4 *)((long)puVar103 + -6) = *(undefined4 *)pbVar100;
                      goto LAB_0123b016;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 7)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 7);
                      uVar4 = *(undefined4 *)pbVar100;
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 8);
                      *(undefined4 *)((long)puVar106 + lVar99 + 4) = *(undefined4 *)(pbVar100 + 3);
                      *(undefined4 *)((long)puVar106 + lVar99 + 1) = uVar4;
                      goto LAB_0123b016;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 8)] != '\0') {
                      puVar61 = (uint *)((byte *)(lVar99 + (long)puVar66) + 8);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 9);
                      *(undefined8 *)((long)puVar106 + lVar99 + 1) =
                           *(undefined8 *)(lVar99 + (long)puVar66);
                      goto LAB_0123b016;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 9)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 9);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 10);
                      *(byte *)((long)puVar103 + -1) = pbVar100[8];
                      *(undefined8 *)((long)puVar103 + -9) = *(undefined8 *)pbVar100;
                      goto LAB_0123b016;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 10)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 10);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 0xb);
                      *(ushort *)((long)puVar103 + -2) = *(ushort *)(pbVar100 + 8);
                      *(undefined8 *)((long)puVar103 + -10) = *(undefined8 *)pbVar100;
                      goto LAB_0123b016;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 0xb)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 0xb);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 0xc);
                      puVar103[-1] = *(uint *)(pbVar100 + 7);
                      *(undefined8 *)((long)puVar103 + -0xb) = *(undefined8 *)pbVar100;
                      goto LAB_0123b016;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 0xc)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 0xc);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 0xd);
                      puVar103[-1] = *(uint *)(pbVar100 + 8);
                      *(undefined8 *)(puVar103 + -3) = *(undefined8 *)pbVar100;
                      goto LAB_0123b016;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 0xd)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 0xd);
                      uVar75 = *(undefined8 *)pbVar100;
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 0xe);
                      *(undefined8 *)((long)puVar106 + lVar99 + 6) = *(undefined8 *)(pbVar100 + 5);
                      *(undefined8 *)((long)puVar106 + lVar99 + 1) = uVar75;
                      goto LAB_0123b016;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 0xe)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 0xe);
                      uVar75 = *(undefined8 *)pbVar100;
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 0xf);
                      *(undefined8 *)((long)puVar106 + lVar99 + 7) = *(undefined8 *)(pbVar100 + 6);
                      *(undefined8 *)((long)puVar106 + lVar99 + 1) = uVar75;
                      goto LAB_0123b016;
                    }
                    if (puVar97[*(byte *)((long)puVar66 + lVar99 + 0xf)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 0xf);
                      uVar75 = *(undefined8 *)pbVar100;
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 0x10);
                      *(undefined8 *)((long)puVar106 + lVar99 + 8) = *(undefined8 *)(pbVar100 + 7);
                      *(undefined8 *)((long)puVar106 + lVar99 + 1) = uVar75;
                      goto LAB_0123b016;
                    }
                    uVar101 = puVar61[1];
                    uVar81 = puVar61[2];
                    uVar84 = puVar61[3];
                    *puVar103 = *puVar61;
                    *(uint *)((long)puVar106 + lVar99 + 5) = uVar101;
                    *(uint *)((long)puVar106 + lVar99 + 9) = uVar81;
                    *(uint *)((long)puVar106 + lVar99 + 0xd) = uVar84;
                    lVar99 = lVar99 + 0x10;
                    lVar73 = lVar73 + -0x10;
                  } while (0xf < lVar73);
                  puVar106 = (uint *)((long)puVar106 + lVar99);
                  puVar66 = (uint *)((long)puVar66 + lVar99);
                }
                puVar103 = (uint *)((long)puVar106 + 1);
                puVar61 = puVar66;
                if (3 < lVar73) {
                  lVar73 = (long)puVar102 - (long)puVar66;
                  do {
                    bVar78 = (byte)*puVar61;
                    if (puVar97[bVar78] != '\0') goto LAB_0123b016;
                    if (puVar97[*(byte *)((long)puVar61 + 1)] != '\0') goto LAB_0123ae2d;
                    if (puVar97[*(byte *)((long)puVar61 + 2)] != '\0') goto LAB_0123ae42;
                    if (puVar97[*(byte *)((long)puVar61 + 3)] != '\0') goto LAB_0123ae5d;
                    *puVar103 = *puVar61;
                    puVar103 = puVar103 + 1;
                    puVar61 = puVar61 + 1;
                    lVar73 = lVar73 + -4;
                  } while (3 < lVar73);
                }
                if (puVar61 < puVar102) {
                  while (uVar101 = *puVar61, puVar97[(byte)uVar101] == '\0') {
                    puVar61 = (uint *)((long)puVar61 + 1);
                    *(byte *)puVar103 = (byte)uVar101;
                    puVar103 = (uint *)((long)puVar103 + 1);
                    if (puVar102 <= puVar61) goto switchD_01239403_default;
                  }
                  goto LAB_0123b016;
                }
                goto switchD_01239403_default;
              }
              uVar58 = pyVar92->tag;
              *(byte *)puVar106 = 0x22;
              if ((uVar58 & 0x18) == 0) {
                puVar102 = (uint *)(uVar98 + (long)puVar66);
LAB_012391c0:
                lVar73 = (long)puVar102 - (long)puVar66;
                if (0xf < lVar73) {
                  lVar99 = 0;
                  do {
                    puVar103 = (uint *)((long)puVar106 + lVar99 + 1);
                    puVar61 = (uint *)(lVar99 + (long)puVar66);
                    bVar78 = *(byte *)((long)puVar66 + lVar99);
                    if (enc_table_cpy[bVar78] != '\0') goto LAB_012393d8;
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 1)] != '\0') {
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 1);
                      puVar61 = (uint *)((long)puVar66 + lVar99);
                      goto LAB_0123938d;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 2)] != '\0') {
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 1);
                      puVar61 = (uint *)((long)puVar66 + lVar99);
                      goto LAB_012393a2;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 3)] != '\0') {
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 1);
                      puVar61 = (uint *)((long)puVar66 + lVar99);
                      goto LAB_012393bd;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 4)] != '\0') {
                      puVar61 = (uint *)((byte *)(lVar99 + (long)puVar66) + 4);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 5);
                      *(undefined4 *)((long)puVar106 + lVar99 + 1) =
                           *(undefined4 *)(lVar99 + (long)puVar66);
                      goto LAB_012393d8;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 5)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 5);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 6);
                      *(byte *)((long)puVar103 + -1) = pbVar100[4];
                      *(undefined4 *)((long)puVar103 + -5) = *(undefined4 *)pbVar100;
                      goto LAB_012393d8;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 6)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 6);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 7);
                      *(ushort *)((long)puVar103 + -2) = *(ushort *)(pbVar100 + 4);
                      *(undefined4 *)((long)puVar103 + -6) = *(undefined4 *)pbVar100;
                      goto LAB_012393d8;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 7)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 7);
                      uVar4 = *(undefined4 *)pbVar100;
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 8);
                      *(undefined4 *)((long)puVar106 + lVar99 + 4) = *(undefined4 *)(pbVar100 + 3);
                      *(undefined4 *)((long)puVar106 + lVar99 + 1) = uVar4;
                      goto LAB_012393d8;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 8)] != '\0') {
                      puVar61 = (uint *)((byte *)(lVar99 + (long)puVar66) + 8);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 9);
                      *(undefined8 *)((long)puVar106 + lVar99 + 1) =
                           *(undefined8 *)(lVar99 + (long)puVar66);
                      goto LAB_012393d8;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 9)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 9);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 10);
                      *(byte *)((long)puVar103 + -1) = pbVar100[8];
                      *(undefined8 *)((long)puVar103 + -9) = *(undefined8 *)pbVar100;
                      goto LAB_012393d8;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 10)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 10);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 0xb);
                      *(ushort *)((long)puVar103 + -2) = *(ushort *)(pbVar100 + 8);
                      *(undefined8 *)((long)puVar103 + -10) = *(undefined8 *)pbVar100;
                      goto LAB_012393d8;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 0xb)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 0xb);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 0xc);
                      puVar103[-1] = *(uint *)(pbVar100 + 7);
                      *(undefined8 *)((long)puVar103 + -0xb) = *(undefined8 *)pbVar100;
                      goto LAB_012393d8;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 0xc)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 0xc);
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 0xd);
                      puVar103[-1] = *(uint *)(pbVar100 + 8);
                      *(undefined8 *)(puVar103 + -3) = *(undefined8 *)pbVar100;
                      goto LAB_012393d8;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 0xd)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 0xd);
                      uVar75 = *(undefined8 *)pbVar100;
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 0xe);
                      *(undefined8 *)((long)puVar106 + lVar99 + 6) = *(undefined8 *)(pbVar100 + 5);
                      *(undefined8 *)((long)puVar106 + lVar99 + 1) = uVar75;
                      goto LAB_012393d8;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 0xe)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 0xe);
                      uVar75 = *(undefined8 *)pbVar100;
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 0xf);
                      *(undefined8 *)((long)puVar106 + lVar99 + 7) = *(undefined8 *)(pbVar100 + 6);
                      *(undefined8 *)((long)puVar106 + lVar99 + 1) = uVar75;
                      goto LAB_012393d8;
                    }
                    if (enc_table_cpy[*(byte *)((long)puVar66 + lVar99 + 0xf)] != '\0') {
                      pbVar100 = (byte *)(lVar99 + (long)puVar66);
                      puVar61 = (uint *)(pbVar100 + 0xf);
                      uVar75 = *(undefined8 *)pbVar100;
                      puVar103 = (uint *)((long)puVar106 + lVar99 + 0x10);
                      *(undefined8 *)((long)puVar106 + lVar99 + 8) = *(undefined8 *)(pbVar100 + 7);
                      *(undefined8 *)((long)puVar106 + lVar99 + 1) = uVar75;
                      goto LAB_012393d8;
                    }
                    uVar101 = puVar61[1];
                    uVar81 = puVar61[2];
                    uVar84 = puVar61[3];
                    *puVar103 = *puVar61;
                    *(uint *)((long)puVar106 + lVar99 + 5) = uVar101;
                    *(uint *)((long)puVar106 + lVar99 + 9) = uVar81;
                    *(uint *)((long)puVar106 + lVar99 + 0xd) = uVar84;
                    lVar99 = lVar99 + 0x10;
                    lVar73 = lVar73 + -0x10;
                  } while (0xf < lVar73);
                  puVar106 = (uint *)((long)puVar106 + lVar99);
                  puVar66 = (uint *)((long)puVar66 + lVar99);
                }
                puVar103 = (uint *)((long)puVar106 + 1);
                puVar61 = puVar66;
                if (3 < lVar73) {
                  lVar73 = (long)puVar102 - (long)puVar66;
                  do {
                    bVar78 = (byte)*puVar61;
                    if (enc_table_cpy[bVar78] != '\0') goto LAB_012393d8;
                    if (enc_table_cpy[*(byte *)((long)puVar61 + 1)] != '\0') goto LAB_0123938d;
                    if (enc_table_cpy[*(byte *)((long)puVar61 + 2)] != '\0') goto LAB_012393a2;
                    if (enc_table_cpy[*(byte *)((long)puVar61 + 3)] != '\0') goto LAB_012393bd;
                    *puVar103 = *puVar61;
                    puVar103 = puVar103 + 1;
                    puVar61 = puVar61 + 1;
                    lVar73 = lVar73 + -4;
                  } while (3 < lVar73);
                }
                if (puVar61 < puVar102) {
                  while (uVar101 = *puVar61, enc_table_cpy[(byte)uVar101] == '\0') {
                    puVar61 = (uint *)((long)puVar61 + 1);
                    *(byte *)puVar103 = (byte)uVar101;
                    puVar103 = (uint *)((long)puVar103 + 1);
                    if (puVar102 <= puVar61) goto switchD_01239403_default;
                  }
                  goto LAB_012393d8;
                }
                goto switchD_01239403_default;
              }
              puVar103 = (uint *)((long)puVar106 + 1);
              if (0xfff < uVar69) {
                do {
                  uVar101 = puVar66[1];
                  uVar81 = puVar66[2];
                  uVar84 = puVar66[3];
                  *puVar103 = *puVar66;
                  puVar103[1] = uVar101;
                  puVar103[2] = uVar81;
                  puVar103[3] = uVar84;
                  puVar103 = puVar103 + 4;
                  puVar66 = puVar66 + 4;
                  uVar98 = uVar98 - 0x10;
                } while (0xf < uVar98);
              }
              for (; 3 < uVar98; uVar98 = uVar98 - 4) {
                *puVar103 = *puVar66;
                puVar103 = puVar103 + 1;
                puVar66 = puVar66 + 1;
              }
              if (uVar98 != 0) {
                uVar69 = 0;
                do {
                  *(byte *)((long)puVar103 + uVar69) = *(byte *)((long)puVar66 + uVar69);
                  uVar69 = uVar69 + 1;
                } while (uVar98 != uVar69);
                puVar103 = (uint *)((long)puVar103 + uVar69);
              }
switchD_01239403_default:
              bVar78 = 0x3a;
              if ((~(uint)lVar91 & (uint)uVar67) == 0) {
                bVar78 = 0x2c;
              }
              *(byte *)puVar103 = 0x22;
              *(byte *)((long)puVar103 + 1) = bVar78;
              puVar106 = (uint *)((long)puVar103 + 2);
            }
            else if ((~(byte)uVar69 & 6) == 0) {
              if (puVar102 <= puVar106 + 4) {
                uVar98 = local_d8 >> 1;
                if (uVar98 < 0x11) {
                  uVar98 = 0x10;
                }
                sVar77 = (uVar98 + 7 & 0xfffffffffffffff8) + local_d8;
                pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,local_d8,sVar77);
                if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
                sVar76 = (long)local_b8 - (long)puVar102;
                memmove(pbVar100 + (sVar77 - sVar76),pbVar100 + ((long)puVar102 - (long)local_e0),
                        sVar76);
                puVar106 = (uint *)(pbVar100 + ((long)puVar106 - (long)local_e0));
                local_b8 = (uint *)(pbVar100 + sVar77);
                local_d8 = sVar77;
                puVar80 = (uint *)(pbVar100 + (sVar77 - sVar76));
                local_e0 = pbVar100;
              }
              if (0xff < uVar69) {
                bVar109 = bVar78 == 7;
                local_58 = (ulong)bVar109;
                *(ulong *)(puVar80 + -2) = uVar67 + lVar91 * 2;
                lVar91 = (uVar69 >> 8) << bVar109;
                puVar102 = puVar80 + -2;
                *(byte *)puVar106 = bVar109 << 5 | 0x5b;
                puVar106 = (uint *)((long)puVar106 + 1);
                pyVar92 = pyVar92 + 1;
                goto LAB_01238d6b;
              }
              bVar78 = (bVar78 == 7) * ' ';
              *(byte *)puVar106 = bVar78 + 0x5b;
              *(byte *)((long)puVar106 + 1) = bVar78 | 0x5d;
              *(byte *)((long)puVar106 + 2) = 0x2c;
              puVar106 = (uint *)((long)puVar106 + 3);
            }
            else if (bVar78 == 1) {
              uVar69 = uVar69 >> 8;
              pvVar9 = (pyVar92->uni).ptr;
              if (puVar102 <= (uint *)((long)puVar106 + uVar69 + 2)) {
                uVar98 = local_d8 >> 1;
                if (local_d8 >> 1 <= uVar69 + 2) {
                  uVar98 = uVar69 + 2;
                }
                sVar77 = (uVar98 + 7 & 0xfffffffffffffff8) + local_d8;
                pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,local_d8,sVar77);
                if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
                sVar76 = (long)local_b8 - (long)puVar102;
                memmove(pbVar100 + (sVar77 - sVar76),pbVar100 + ((long)puVar102 - (long)local_e0),
                        sVar76);
                puVar106 = (uint *)(pbVar100 + ((long)puVar106 - (long)local_e0));
                local_b8 = (uint *)(pbVar100 + sVar77);
                puVar80 = (uint *)(pbVar100 + (sVar77 - sVar76));
                local_e0 = pbVar100;
                local_d8 = sVar77;
              }
              switchD_00b03519::default(puVar106,pvVar9,uVar69);
              pbVar100 = (byte *)((long)puVar106 + uVar69);
              puVar106 = (uint *)(pbVar100 + 1);
              *pbVar100 = 0x2c;
            }
            else {
              uVar101 = (uint)uVar69 & 7;
              if (uVar101 == 2) {
                if (puVar102 <= puVar106 + 4) {
                  uVar69 = local_d8 >> 1;
                  if (uVar69 < 0x11) {
                    uVar69 = 0x10;
                  }
                  sVar77 = (uVar69 + 7 & 0xfffffffffffffff8) + local_d8;
                  pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,local_d8,sVar77);
                  if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
                  puVar80 = (uint *)(pbVar100 + (sVar77 - ((long)local_b8 - (long)puVar102)));
                  memmove(puVar80,pbVar100 + ((long)puVar102 - (long)local_e0),
                          (long)local_b8 - (long)puVar102);
                  puVar106 = (uint *)(pbVar100 + ((long)puVar106 - (long)local_e0));
                  local_b8 = (uint *)(pbVar100 + sVar77);
                  local_e0 = pbVar100;
                  local_d8 = sVar77;
                }
                puVar106[0] = 0x6c6c756e;
                puVar106[1] = 0xa2c;
                puVar106 = (uint *)((long)puVar106 + 5);
              }
              else {
                if (uVar101 != 3) goto LAB_0123b8e7;
                if (puVar102 <= puVar106 + 4) {
                  uVar69 = local_d8 >> 1;
                  if (uVar69 < 0x11) {
                    uVar69 = 0x10;
                  }
                  sVar77 = (uVar69 + 7 & 0xfffffffffffffff8) + local_d8;
                  pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,local_d8,sVar77);
                  if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
                  puVar80 = (uint *)(pbVar100 + (sVar77 - ((long)local_b8 - (long)puVar102)));
                  memmove(puVar80,pbVar100 + ((long)puVar102 - (long)local_e0),
                          (long)local_b8 - (long)puVar102);
                  puVar106 = (uint *)(pbVar100 + ((long)puVar106 - (long)local_e0));
                  local_b8 = (uint *)(pbVar100 + sVar77);
                  uVar69 = pyVar92->tag;
                  local_e0 = pbVar100;
                  local_d8 = sVar77;
                }
                bVar109 = (uVar69 & 0x18) != 0;
                uVar75 = 0xa2c65736c6166;
                if (bVar109) {
                  uVar75 = 0xa2c65757274;
                }
                *(undefined8 *)puVar106 = uVar75;
                puVar106 = (uint *)((long)puVar106 + (6 - (ulong)bVar109));
              }
            }
            pyVar92 = pyVar92 + 1;
            lVar91 = lVar91 + -1;
            puVar102 = puVar80;
          } while (lVar91 != 0);
          lVar73 = 0;
          lVar99 = 0;
          do {
            *(byte *)((long)puVar106 + lVar99 + -1) = (char)local_58 * ' ' + 0x5d;
            *(byte *)((long)puVar106 + lVar99) = 0x2c;
            if (local_b8 <= (uint *)((long)puVar80 + lVar73)) {
              if (local_ec < '\0') {
                if ((uint *)((long)puVar80 + lVar73) <= (uint *)((long)puVar106 + lVar99 + 3)) {
                  uVar67 = 2;
                  if (2 < local_d8 >> 1) {
                    uVar67 = local_d8 >> 1;
                  }
                  uVar67 = uVar67 + 7 & 0xfffffffffffffff8;
                  pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,local_d8,uVar67 + local_d8);
                  if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
                  memmove(pbVar100 +
                          (long)((long)puVar80 + lVar99 * 8 + ((uVar67 + local_d8) - (long)local_b8)
                                ),pbVar100 + (long)((long)puVar80 + (lVar99 * 8 - (long)local_e0)),
                          (size_t)((long)local_b8 + (-lVar73 - (long)puVar80)));
                  puVar106 = (uint *)(pbVar100 + ((long)puVar106 - (long)local_e0));
                  local_e0 = pbVar100;
                }
                pbVar100 = (byte *)((long)puVar106 + lVar99) + 1;
                *(byte *)((long)puVar106 + lVar99) = 10;
              }
              else {
                pbVar100 = (byte *)((long)puVar106 + lVar99);
              }
              *pbVar100 = 0;
              if (dat_len != (usize *)0x0) {
                *dat_len = (long)pbVar100 - (long)local_e0;
              }
              goto LAB_0123e059;
            }
            lVar91 = lVar99 * 2;
            local_58 = *(ulong *)(puVar80 + lVar91) & 0xffffffffffffff01;
            lVar99 = lVar99 + 1;
            lVar73 = lVar73 + 8;
            lVar91 = (*(ulong *)(puVar80 + lVar91) >> 1) - 1;
          } while (lVar91 == 0);
          puVar102 = (uint *)((long)puVar80 + lVar73);
          puVar106 = (uint *)((long)puVar106 + lVar99);
        } while( true );
      }
    }
    else {
      if ((flg & 2) == 0) {
        local_a8 = enc_table_cpy_slash;
        if ((flg & 4) == 0) {
          local_a8 = enc_table_cpy;
        }
      }
      else {
        local_a8 = enc_table_esc_slash;
        if ((flg & 4) == 0) {
          local_a8 = enc_table_esc;
        }
      }
      local_b8 = (uint *)(((val->uni).u64 & 0xfffffffffffffff0) * 2 + 0x40);
      local_e0 = (byte *)(*p_Var5)(pvVar7,(size_t)local_b8);
      if (local_e0 != (byte *)0x0) {
        lVar91 = (ulong)((flg & 0x40) == 0) * 2 + 2;
        bVar109 = (~(uint)val->tag & 7) == 0;
        local_68 = (ulong)bVar109;
        lVar99 = (val->tag >> 8) << bVar109;
        *local_e0 = bVar109 << 5 | 0x5b;
        puVar102 = (uint *)(local_e0 + 2);
        local_e0[1] = 10;
        pyVar92 = val + 1;
        local_c0 = (ulong *)(local_e0 + (long)local_b8);
        lVar73 = 1;
        local_88 = local_c0;
LAB_01235c51:
        uVar98 = local_68 & 0xff;
        uVar67 = lVar73 * 4 + 0x20;
        uVar69 = lVar73 * 4 + 0x10;
LAB_01235c88:
        uVar62 = pyVar92->tag;
        bVar78 = (byte)uVar62 & 7;
        uVar101 = (uint)uVar98;
        uVar81 = (uint)lVar99;
        if (bVar78 == 4) {
          uVar62 = uVar67;
          if ((uVar81 & uVar101) != 0) {
            uVar62 = 0x20;
          }
          puVar87 = local_c0;
          if (local_c0 <= (ulong *)((long)puVar102 + uVar62)) {
            uVar60 = (ulong)local_b8 >> 1;
            if ((ulong)local_b8 >> 1 <= uVar62) {
              uVar60 = uVar62;
            }
            sVar77 = (uVar60 + 7 & 0xfffffffffffffff8) + (long)local_b8;
            pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,(size_t)local_b8,sVar77);
            if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
            puVar87 = (ulong *)(pbVar100 + (sVar77 - ((long)local_88 - (long)local_c0)));
            memmove(puVar87,pbVar100 + ((long)local_c0 - (long)local_e0),
                    (long)local_88 - (long)local_c0);
            puVar102 = (uint *)(pbVar100 + ((long)puVar102 - (long)local_e0));
            local_88 = (ulong *)(pbVar100 + sVar77);
            local_e0 = pbVar100;
            local_b8 = (uint *)sVar77;
          }
          lVar83 = lVar73;
          puVar106 = puVar102;
          if (lVar73 != 0 && (uVar81 & uVar101) == 0) {
            do {
              puVar102 = (uint *)((long)puVar106 + lVar91);
              *puVar106 = 0x20202020;
              lVar83 = lVar83 + -1;
              puVar106 = puVar102;
            } while (lVar83 != 0);
          }
          uVar62 = (pyVar92->uni).u64;
          uVar101 = (uint)(uVar62 >> 0x20);
          if ((pyVar92->tag & 0x10) == 0) {
            uVar101 = uVar101 >> 0x1f & (uint)(pyVar92->tag >> 3);
            *(byte *)puVar102 = 0x2d;
            uVar60 = -uVar62;
            if (uVar101 == 0) {
              uVar60 = uVar62;
            }
            pbVar100 = (byte *)((ulong)uVar101 + (long)puVar102);
            if (uVar60 < 100000000) {
              if (uVar60 < 100) {
                *(undefined2 *)pbVar100 =
                     *(undefined2 *)(digit_table + (ulong)(uVar60 < 10) + uVar60 * 2);
                puVar102 = (uint *)(pbVar100 + (2 - (ulong)(uVar60 < 10)));
              }
              else {
                iVar72 = (int)uVar60;
                if (uVar60 < 10000) {
                  uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                  uVar62 = (ulong)(uVar60 < 1000);
                  *(undefined2 *)pbVar100 =
                       *(undefined2 *)(digit_table + uVar62 + (ulong)uVar101 * 2);
                  *(undefined2 *)(pbVar100 + (2 - uVar62)) =
                       *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                  puVar102 = (uint *)(pbVar100 + (4 - uVar62));
                }
                else if (uVar60 < 1000000) {
                  iVar72 = (int)(uVar60 * 0x68db9 >> 0x20) * -10000 + iVar72;
                  uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                  uVar62 = (ulong)(uVar60 < 100000);
                  *(undefined2 *)pbVar100 =
                       *(undefined2 *)(digit_table + uVar62 + (uVar60 * 0x68db9 >> 0x20) * 2);
                  *(undefined2 *)(pbVar100 + (2 - uVar62)) =
                       *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                  *(undefined2 *)(pbVar100 + (4 - uVar62)) =
                       *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                  puVar102 = (uint *)(pbVar100 + (6 - uVar62));
                }
                else {
                  uVar101 = (uint)(uVar60 * 0x68db8bb >> 0x20);
                  uVar81 = uVar101 >> 8;
                  iVar72 = uVar81 * -10000 + iVar72;
                  uVar81 = uVar81 * 0x147b >> 0x13;
                  uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                  uVar62 = (ulong)(uVar60 < 10000000);
                  *(undefined2 *)pbVar100 =
                       *(undefined2 *)(digit_table + uVar62 + (ulong)uVar81 * 2);
                  *(undefined2 *)(pbVar100 + (2 - uVar62)) =
                       *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                  *(undefined2 *)(pbVar100 + (4 - uVar62)) =
                       *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                  *(undefined2 *)(pbVar100 + (6 - uVar62)) =
                       *(undefined2 *)(digit_table + (uVar84 * -100 + iVar72) * 2);
                  puVar102 = (uint *)(pbVar100 + (8 - uVar62));
                }
              }
            }
            else {
              uVar62 = uVar60 / 100000000;
              uVar79 = uVar62 * 0xfa0a1f00 + uVar60;
              iVar72 = (int)uVar62;
              if (uVar60 < 10000000000000000) {
                if (uVar60 < 10000000000) {
                  *(undefined2 *)pbVar100 =
                       *(undefined2 *)(digit_table + (ulong)(uVar60 < 1000000000) + uVar62 * 2);
                  pbVar100 = pbVar100 + (2 - (ulong)(uVar60 < 1000000000));
                }
                else if (uVar60 < 1000000000000) {
                  uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                  uVar62 = (ulong)(uVar60 < 100000000000);
                  *(undefined2 *)pbVar100 =
                       *(undefined2 *)(digit_table + uVar62 + (ulong)uVar101 * 2);
                  *(undefined2 *)(pbVar100 + (2 - uVar62)) =
                       *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                  pbVar100 = pbVar100 + (4 - uVar62);
                }
                else if (uVar60 < 100000000000000) {
                  iVar72 = (int)(uVar62 * 0x68db9 >> 0x20) * -10000 + iVar72;
                  uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                  uVar60 = (ulong)(uVar60 >> 0xd < 0x48c27395);
                  *(undefined2 *)pbVar100 =
                       *(undefined2 *)(digit_table + uVar60 + (uVar62 * 0x68db9 >> 0x20) * 2);
                  *(undefined2 *)(pbVar100 + (2 - uVar60)) =
                       *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                  *(undefined2 *)(pbVar100 + (4 - uVar60)) =
                       *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                  pbVar100 = pbVar100 + (6 - uVar60);
                }
                else {
                  uVar101 = (uint)(uVar62 * 0x68db8bb >> 0x20);
                  uVar81 = uVar101 >> 8;
                  iVar72 = uVar81 * -10000 + iVar72;
                  uVar81 = uVar81 * 0x147b >> 0x13;
                  uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                  uVar62 = (ulong)(uVar60 < 1000000000000000);
                  *(undefined2 *)pbVar100 =
                       *(undefined2 *)(digit_table + uVar62 + (ulong)uVar81 * 2);
                  *(undefined2 *)(pbVar100 + (2 - uVar62)) =
                       *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                  *(undefined2 *)(pbVar100 + (4 - uVar62)) =
                       *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                  *(undefined2 *)(pbVar100 + (6 - uVar62)) =
                       *(undefined2 *)(digit_table + (uVar84 * -100 + iVar72) * 2);
                  pbVar100 = pbVar100 + (8 - uVar62);
                }
                uVar101 = (uint)((uVar79 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar81 = uVar101 >> 8;
                iVar72 = uVar81 * -10000 + (int)uVar79;
                uVar81 = uVar81 * 0x147b >> 0x13;
                uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                *(undefined2 *)pbVar100 = *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                *(undefined2 *)(pbVar100 + 2) =
                     *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                *(undefined2 *)(pbVar100 + 4) = *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                *(undefined2 *)(pbVar100 + 6) =
                     *(undefined2 *)(digit_table + (uVar84 * 0x7fffff9c + iVar72) * 2);
                puVar102 = (uint *)(pbVar100 + 8);
              }
              else {
                uVar62 = uVar60 / 1000000000000;
                iVar64 = (int)uVar62;
                if (uVar60 < 1000000000000000000) {
                  iVar88 = (int)(uVar62 * 0x68db9 >> 0x20) * -10000 + iVar64;
                  uVar101 = (uint)(iVar88 * 0x147b) >> 0x13;
                  uVar60 = (ulong)(uVar60 < 100000000000000000);
                  *(undefined2 *)pbVar100 =
                       *(undefined2 *)(digit_table + uVar60 + (uVar62 * 0x68db9 >> 0x20) * 2);
                  *(undefined2 *)(pbVar100 + (2 - uVar60)) =
                       *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                  *(undefined2 *)(pbVar100 + (4 - uVar60)) =
                       *(undefined2 *)(digit_table + (uVar101 * -100 + iVar88) * 2);
                  lVar83 = 6 - uVar60;
                }
                else {
                  uVar101 = (uint)(uVar62 / 10000);
                  iVar88 = uVar101 * -10000 + iVar64;
                  uVar101 = uVar101 / 100;
                  uVar81 = (uint)(iVar88 * 0x147b) >> 0x13;
                  uVar60 = (ulong)(uVar60 < 10000000000000000000);
                  *(undefined2 *)pbVar100 =
                       *(undefined2 *)(digit_table + uVar60 + (ulong)uVar101 * 2);
                  *(undefined2 *)(pbVar100 + (2 - uVar60)) =
                       *(undefined2 *)(digit_table + (uVar101 * -100 + (int)(uVar62 / 10000)) * 2);
                  *(undefined2 *)(pbVar100 + (4 - uVar60)) =
                       *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                  *(undefined2 *)(pbVar100 + (6 - uVar60)) =
                       *(undefined2 *)(digit_table + (uVar81 * -100 + iVar88) * 2);
                  lVar83 = 8 - uVar60;
                }
                pbVar100 = pbVar100 + lVar83;
                iVar72 = iVar72 + iVar64 * -10000;
                uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                *(undefined2 *)pbVar100 = *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                *(undefined2 *)(pbVar100 + 2) =
                     *(undefined2 *)(digit_table + (uVar101 * 0x7fffff9c + iVar72) * 2);
                uVar101 = (uint)((uVar79 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar81 = uVar101 >> 8;
                iVar72 = uVar81 * -10000 + (int)uVar79;
                uVar81 = uVar81 * 0x147b >> 0x13;
                uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                *(undefined2 *)(pbVar100 + 4) = *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                *(undefined2 *)(pbVar100 + 6) =
                     *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                *(undefined2 *)(pbVar100 + 8) = *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                *(undefined2 *)(pbVar100 + 10) =
                     *(undefined2 *)(digit_table + (uVar84 * 0x7fffff9c + iVar72) * 2);
                puVar102 = (uint *)(pbVar100 + 0xc);
              }
            }
          }
          else {
            uVar60 = uVar62 & 0xfffffffffffff;
            uVar101 = uVar101 >> 0x14 & 0x7ff;
            if (uVar101 == 0x7ff) {
              if ((flg & 0x10) == 0) {
                if ((flg & 8) == 0) {
                  if (dat_len != (usize *)0x0) {
                    *dat_len = 0;
                  }
                  pyVar70 = &local_48;
                  if (err != (yyjson_write_err *)0x0) {
                    pyVar70 = err;
                  }
                  pyVar59->code = 4;
                  pyVar70->msg = "nan or inf number is not allowed";
                  goto joined_r0x0123b975;
                }
                if (uVar60 == 0) {
                  *(byte *)puVar102 = 0x2d;
                  puVar104 = (undefined8 *)((long)puVar102 - ((long)uVar62 >> 0x3f));
                  *puVar104 = 0x7974696e69666e49;
                  puVar102 = (uint *)(puVar104 + 1);
                }
                else {
                  *puVar102 = 0x4e614e;
                  puVar102 = (uint *)((long)puVar102 + 3);
                }
              }
              else {
                *puVar102 = 0x6c6c756e;
                puVar102 = puVar102 + 1;
              }
            }
            else {
              *(byte *)puVar102 = 0x2d;
              lVar83 = -((long)uVar62 >> 0x3f);
              puVar1 = (undefined4 *)(lVar83 + (long)puVar102);
              if ((uVar62 & 0x7fffffffffffffff) == 0) {
                *puVar1 = 0x302e30;
                puVar102 = (uint *)((long)puVar1 + 3);
              }
              else if (uVar101 == 0) {
                yyjson_val_write_opts();
                puVar102 = local_38;
              }
              else {
                uVar79 = uVar60 + 0x10000000000000;
                if (uVar101 - 0x3ff < 0x35) {
                  lVar74 = 0;
                  if (uVar79 != 0) {
                    for (; (uVar79 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                    }
                  }
                  if (0x433 - uVar101 <= (uint)lVar74) {
                    uVar79 = uVar79 >> ((byte)(0x433 - uVar101) & 0x3f);
                    if (uVar79 < 100000000) {
                      if (uVar79 < 100) {
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)(digit_table + (ulong)(uVar79 < 10) + uVar79 * 2);
                        puVar86 = (undefined2 *)((long)puVar1 + (2 - (ulong)(uVar79 < 10)));
                      }
                      else {
                        iVar72 = (int)uVar79;
                        if (uVar79 < 10000) {
                          uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                          uVar62 = (ulong)(uVar79 < 1000);
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)(digit_table + uVar62 + (ulong)uVar101 * 2);
                          *(undefined2 *)((long)puVar1 + (2 - uVar62)) =
                               *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                          puVar86 = (undefined2 *)((long)puVar1 + (4 - uVar62));
                        }
                        else if (uVar79 < 1000000) {
                          iVar72 = (int)(uVar79 * 0x68db9 >> 0x20) * -10000 + iVar72;
                          uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                          uVar62 = (ulong)(uVar79 < 100000);
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)
                                (digit_table + uVar62 + (uVar79 * 0x68db9 >> 0x20) * 2);
                          *(undefined2 *)((long)puVar1 + (2 - uVar62)) =
                               *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                          *(undefined2 *)((long)puVar1 + (4 - uVar62)) =
                               *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                          puVar86 = (undefined2 *)((long)puVar1 + (6 - uVar62));
                        }
                        else {
                          uVar101 = (uint)(uVar79 * 0x68db8bb >> 0x20);
                          uVar81 = uVar101 >> 8;
                          iVar72 = uVar81 * -10000 + iVar72;
                          uVar81 = uVar81 * 0x147b >> 0x13;
                          uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                          uVar62 = (ulong)(uVar79 < 10000000);
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)(digit_table + uVar62 + (ulong)uVar81 * 2);
                          *(undefined2 *)((long)puVar1 + (2 - uVar62)) =
                               *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                          *(undefined2 *)((long)puVar1 + (4 - uVar62)) =
                               *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                          *(undefined2 *)((long)puVar1 + (6 - uVar62)) =
                               *(undefined2 *)(digit_table + (uVar84 * -100 + iVar72) * 2);
                          puVar86 = (undefined2 *)((long)puVar1 + (8 - uVar62));
                        }
                      }
                    }
                    else {
                      auVar16._8_8_ = 0;
                      auVar16._0_8_ = uVar79;
                      uVar62 = SUB168(auVar16 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                      if (uVar79 < 10000000000) {
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)
                              (digit_table + (ulong)(uVar79 < 1000000000) + uVar62 * 2);
                        puVar86 = (undefined2 *)((long)puVar1 + (2 - (ulong)(uVar79 < 1000000000)));
                      }
                      else {
                        iVar72 = (int)uVar62;
                        if (uVar79 < 1000000000000) {
                          uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                          uVar60 = (ulong)(uVar79 < 100000000000);
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)(digit_table + uVar60 + (ulong)uVar101 * 2);
                          *(undefined2 *)((long)puVar1 + (2 - uVar60)) =
                               *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                          puVar86 = (undefined2 *)((long)puVar1 + (4 - uVar60));
                        }
                        else if (uVar79 < 100000000000000) {
                          iVar72 = (int)(uVar62 * 0x68db9 >> 0x20) * -10000 + iVar72;
                          uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                          uVar60 = (ulong)(uVar79 >> 0xd < 0x48c27395);
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)
                                (digit_table + uVar60 + (uVar62 * 0x68db9 >> 0x20) * 2);
                          *(undefined2 *)((long)puVar1 + (2 - uVar60)) =
                               *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                          *(undefined2 *)((long)puVar1 + (4 - uVar60)) =
                               *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                          puVar86 = (undefined2 *)((long)puVar1 + (6 - uVar60));
                        }
                        else {
                          uVar101 = (uint)(uVar62 * 0x68db8bb >> 0x20);
                          uVar81 = uVar101 >> 8;
                          iVar72 = uVar81 * -10000 + iVar72;
                          uVar81 = uVar81 * 0x147b >> 0x13;
                          uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                          uVar60 = (ulong)(uVar79 < 1000000000000000);
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)(digit_table + uVar60 + (ulong)uVar81 * 2);
                          *(undefined2 *)((long)puVar1 + (2 - uVar60)) =
                               *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                          *(undefined2 *)((long)puVar1 + (4 - uVar60)) =
                               *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                          *(undefined2 *)((long)puVar1 + (6 - uVar60)) =
                               *(undefined2 *)(digit_table + (uVar84 * -100 + iVar72) * 2);
                          puVar86 = (undefined2 *)((long)puVar1 + (8 - uVar60));
                        }
                      }
                      uVar79 = uVar62 * 0xfa0a1f00 + uVar79;
                      uVar101 = (uint)((uVar79 & 0xffffffff) * 0x68db8bb >> 0x20);
                      uVar81 = uVar101 >> 8;
                      iVar72 = uVar81 * -10000 + (int)uVar79;
                      uVar81 = uVar81 * 0x147b >> 0x13;
                      uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                      *puVar86 = *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                      puVar86[1] = *(undefined2 *)
                                    (digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                      puVar86[2] = *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                      puVar86[3] = *(undefined2 *)(digit_table + (uVar84 * 0x7fffff9c + iVar72) * 2)
                      ;
                      puVar86 = puVar86 + 4;
                    }
                    *puVar86 = 0x302e;
                    puVar102 = (uint *)(puVar86 + 1);
                    goto LAB_01237c7d;
                  }
                }
                uVar62 = (ulong)((uint)uVar62 & 1);
                iVar72 = uVar101 * 0x4d105 + -0x200a5;
                if (uVar101 == 1 || uVar60 != 0) {
                  iVar72 = uVar101 * 0x4d105;
                }
                iVar72 = iVar72 + -0x1439b7ff >> 0x14;
                uVar82 = *(ulong *)(pow10_sig_table + (ulong)(iVar72 * -2 + 0x2ae) * 8);
                uVar96 = *(long *)(pow10_sig_table + (ulong)(iVar72 * -2 + 0x2af) * 8) +
                         (ulong)(iVar72 - 1U < 0xffffffc8);
                bVar78 = ((char)((uint)(iVar72 * -0x3526b) >> 0x10) + (char)uVar101) - 0x32;
                uVar60 = (ulong)(uVar101 != 1 && uVar60 == 0) + uVar79 * 4 + -2 << (bVar78 & 0x3f);
                auVar10._8_8_ = 0;
                auVar10._0_8_ = uVar96;
                auVar31._8_8_ = 0;
                auVar31._0_8_ = uVar60;
                auVar49._8_8_ = 0;
                auVar49._0_8_ = SUB168(auVar10 * auVar31,8);
                auVar11._8_8_ = 0;
                auVar11._0_8_ = uVar82;
                auVar32._8_8_ = 0;
                auVar32._0_8_ = uVar60;
                auVar49 = auVar11 * auVar32 + auVar49;
                uVar60 = uVar79 * 4 << (bVar78 & 0x3f);
                auVar12._8_8_ = 0;
                auVar12._0_8_ = uVar96;
                auVar33._8_8_ = 0;
                auVar33._0_8_ = uVar60;
                auVar50._8_8_ = 0;
                auVar50._0_8_ = SUB168(auVar12 * auVar33,8);
                auVar13._8_8_ = 0;
                auVar13._0_8_ = uVar82;
                auVar34._8_8_ = 0;
                auVar34._0_8_ = uVar60;
                auVar50 = auVar13 * auVar34 + auVar50;
                uVar90 = auVar50._8_8_;
                uVar60 = uVar79 * 4 + 2 << (bVar78 & 0x3f);
                auVar14._8_8_ = 0;
                auVar14._0_8_ = uVar96;
                auVar35._8_8_ = 0;
                auVar35._0_8_ = uVar60;
                auVar51._8_8_ = 0;
                auVar51._0_8_ = SUB168(auVar14 * auVar35,8);
                auVar15._8_8_ = 0;
                auVar15._0_8_ = uVar82;
                auVar36._8_8_ = 0;
                auVar36._0_8_ = uVar60;
                auVar51 = auVar15 * auVar36 + auVar51;
                uVar60 = ((ulong)((auVar49 & (undefined1  [16])0xfffffffffffffffe) !=
                                 (undefined1  [16])0x0) | auVar49._8_8_) + uVar62;
                uVar62 = ((ulong)((auVar51 & (undefined1  [16])0xfffffffffffffffe) !=
                                 (undefined1  [16])0x0) | auVar51._8_8_) - uVar62;
                if (uVar90 < 0x28) {
LAB_01236142:
                  uVar82 = (auVar50 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0
                           | uVar90;
                  uVar79 = uVar90 & 0xfffffffffffffffc;
                  bVar109 = true;
                  if (uVar82 <= uVar79 + 2) {
                    bVar109 = (bool)((byte)((uVar90 & 0xffffffff) >> 2) & 0x3f &
                                    uVar82 == uVar79 + 2);
                  }
                  bVar108 = uVar79 + 4 <= uVar62;
                  if (uVar79 < uVar60 == bVar108) {
                    bVar109 = bVar108;
                  }
                  uVar62 = (ulong)bVar109 + (uVar90 >> 2);
                }
                else {
                  uVar82 = uVar90 / 0x28;
                  uVar79 = uVar82 * 0x28 + 0x28;
                  if (uVar82 * 0x28 < uVar60 != uVar79 <= uVar62) goto LAB_01236142;
                  uVar62 = (uVar82 + 1) - (ulong)(uVar62 < uVar79);
                  iVar72 = iVar72 + 1;
                }
                iVar64 = (0x11 - (uint)(uVar62 < 10000000000000000)) -
                         (uint)(uVar62 < 1000000000000000);
                uVar101 = iVar64 + iVar72;
                if (iVar64 + iVar72 + 5U < 0x1b) {
                  if ((int)uVar101 < 1) {
                    uVar60 = uVar62 / 100000000;
                    uVar81 = (uint)uVar60;
                    puVar86 = (undefined2 *)
                              ((long)puVar1 +
                              (((ulong)(2 - uVar101) + 1) - (ulong)(uVar81 < 100000000)));
                    iVar88 = (int)((uVar60 & 0xffffffff) / 10000);
                    iVar64 = iVar88 * -10000 + uVar81;
                    uVar62 = uVar60 * 0xfa0a1f00 + uVar62;
                    iVar72 = (int)(((uVar60 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                    uVar94 = (uint)(iVar72 * 0x29) >> 0xc;
                    uVar89 = uVar94 * -100 + iVar72;
                    uVar84 = iVar72 * -100 + iVar88;
                    *(char *)((long)puVar1 + (ulong)(2 - uVar101)) = (char)uVar94 + '0';
                    uVar60 = (ulong)(uVar89 < 10 && uVar81 < 100000000);
                    *puVar86 = *(undefined2 *)(digit_table + uVar60 + uVar89 * 2);
                    *(undefined2 *)((long)puVar86 + (2 - uVar60)) =
                         *(undefined2 *)(digit_table + uVar84 * 2);
                    iVar72 = (int)uVar62;
                    if (iVar72 == 0) {
                      if (iVar64 == 0) {
                        uVar62 = (ulong)(byte)dec_trailing_zero_table[uVar89];
                        if (uVar84 != 0) {
                          uVar62 = 0;
                        }
                        uVar62 = uVar62 + (byte)dec_trailing_zero_table[uVar84];
                        lVar83 = 4;
                      }
                      else {
                        uVar81 = (uint)(iVar64 * 0x147b) >> 0x13;
                        uVar84 = uVar81 * -100 + iVar64;
                        *(undefined2 *)((long)puVar86 + (4 - uVar60)) =
                             *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                        *(undefined2 *)((long)puVar86 + (6 - uVar60)) =
                             *(undefined2 *)(digit_table + uVar84 * 2);
                        uVar62 = (ulong)(byte)dec_trailing_zero_table[uVar81] + 2;
                        if (uVar84 != 0) {
                          uVar62 = (ulong)(byte)dec_trailing_zero_table[uVar84];
                        }
                        lVar83 = 8;
                      }
                      uVar62 = lVar83 - uVar62;
                    }
                    else {
                      uVar89 = (uint)(iVar64 * 0x147b) >> 0x13;
                      uVar81 = (uint)((uVar62 & 0xffffffff) * 0x68db8bb >> 0x20);
                      uVar94 = uVar81 >> 8;
                      uVar84 = uVar94 * 0x147b >> 0x13;
                      uVar62 = (ulong)uVar84;
                      uVar81 = uVar84 * -100 + (uVar81 >> 8);
                      *(undefined2 *)((long)puVar86 + (4 - uVar60)) =
                           *(undefined2 *)(digit_table + (ulong)uVar89 * 2);
                      *(undefined2 *)((long)puVar86 + (6 - uVar60)) =
                           *(undefined2 *)(digit_table + (uVar89 * 0x7fffff9c + iVar64) * 2);
                      *(undefined2 *)((long)puVar86 + (8 - uVar60)) =
                           *(undefined2 *)(digit_table + uVar62 * 2);
                      *(undefined2 *)((long)puVar86 + (10 - uVar60)) =
                           *(undefined2 *)(digit_table + uVar81 * 2);
                      iVar72 = uVar94 * -10000 + iVar72;
                      if (iVar72 == 0) {
                        lVar83 = 0xc;
                      }
                      else {
                        uVar81 = (uint)(iVar72 * 0x147b) >> 0x13;
                        uVar62 = (ulong)uVar81;
                        uVar81 = uVar81 * -100 + iVar72;
                        *(undefined2 *)((long)puVar86 + (0xc - uVar60)) =
                             *(undefined2 *)(digit_table + uVar62 * 2);
                        *(undefined2 *)((long)puVar86 + (0xe - uVar60)) =
                             *(undefined2 *)(digit_table + uVar81 * 2);
                        lVar83 = 0x10;
                      }
                      uVar62 = (ulong)(byte)dec_trailing_zero_table[uVar62] + 2;
                      if (uVar81 != 0) {
                        uVar62 = (ulong)(byte)dec_trailing_zero_table[uVar81];
                      }
                      uVar62 = lVar83 - uVar62;
                    }
                    puVar102 = (uint *)((long)puVar86 + ((uVar62 & 0xffffffff) - uVar60));
                    *(undefined2 *)puVar1 = 0x2e30;
                    if ((int)uVar101 < 0) {
                      switchD_005681f0::default
                                ((undefined2 *)((long)puVar1 + 2),0x30,(ulong)-uVar101);
                    }
                  }
                  else {
                    uVar60 = uVar62 / 100000000;
                    uVar81 = (uint)uVar60;
                    puVar86 = (undefined2 *)((long)puVar1 + (2 - (ulong)(uVar81 < 100000000)));
                    iVar88 = (int)((uVar60 & 0xffffffff) / 10000);
                    iVar64 = iVar88 * -10000 + uVar81;
                    uVar62 = uVar60 * 0xfa0a1f00 + uVar62;
                    iVar72 = (int)(((uVar60 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                    uVar94 = (uint)(iVar72 * 0x29) >> 0xc;
                    uVar89 = uVar94 * -100 + iVar72;
                    uVar84 = iVar72 * -100 + iVar88;
                    *puVar1 = 0x30303030;
                    puVar1[1] = 0x30303030;
                    puVar1[2] = 0x30303030;
                    puVar1[3] = 0x30303030;
                    *(undefined8 *)(puVar1 + 4) = 0x3030303030303030;
                    *(char *)((long)puVar1 + 1) = (char)uVar94 + '0';
                    uVar60 = (ulong)(uVar89 < 10 && uVar81 < 100000000);
                    *puVar86 = *(undefined2 *)(digit_table + uVar60 + uVar89 * 2);
                    *(undefined2 *)((long)puVar86 + (2 - uVar60)) =
                         *(undefined2 *)(digit_table + uVar84 * 2);
                    iVar72 = (int)uVar62;
                    if (iVar72 == 0) {
                      if (iVar64 == 0) {
                        uVar62 = (ulong)(byte)dec_trailing_zero_table[uVar89];
                        if (uVar84 != 0) {
                          uVar62 = 0;
                        }
                        uVar62 = uVar62 + (byte)dec_trailing_zero_table[uVar84];
                        lVar74 = 4;
                      }
                      else {
                        uVar81 = (uint)(iVar64 * 0x147b) >> 0x13;
                        uVar84 = uVar81 * -100 + iVar64;
                        *(undefined2 *)((long)puVar86 + (4 - uVar60)) =
                             *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                        *(undefined2 *)((long)puVar86 + (6 - uVar60)) =
                             *(undefined2 *)(digit_table + uVar84 * 2);
                        uVar62 = (ulong)(byte)dec_trailing_zero_table[uVar81] + 2;
                        if (uVar84 != 0) {
                          uVar62 = (ulong)(byte)dec_trailing_zero_table[uVar84];
                        }
                        lVar74 = 8;
                      }
                      uVar62 = lVar74 - uVar62;
                    }
                    else {
                      uVar89 = (uint)(iVar64 * 0x147b) >> 0x13;
                      uVar81 = (uint)((uVar62 & 0xffffffff) * 0x68db8bb >> 0x20);
                      uVar94 = uVar81 >> 8;
                      uVar84 = uVar94 * 0x147b >> 0x13;
                      uVar62 = (ulong)uVar84;
                      uVar81 = uVar84 * -100 + (uVar81 >> 8);
                      *(undefined2 *)((long)puVar86 + (4 - uVar60)) =
                           *(undefined2 *)(digit_table + (ulong)uVar89 * 2);
                      *(undefined2 *)((long)puVar86 + (6 - uVar60)) =
                           *(undefined2 *)(digit_table + (uVar89 * 0x7fffff9c + iVar64) * 2);
                      *(undefined2 *)((long)puVar86 + (8 - uVar60)) =
                           *(undefined2 *)(digit_table + uVar62 * 2);
                      *(undefined2 *)((long)puVar86 + (10 - uVar60)) =
                           *(undefined2 *)(digit_table + uVar81 * 2);
                      iVar72 = uVar94 * -10000 + iVar72;
                      if (iVar72 == 0) {
                        lVar74 = 0xc;
                      }
                      else {
                        uVar81 = (uint)(iVar72 * 0x147b) >> 0x13;
                        uVar62 = (ulong)uVar81;
                        uVar81 = uVar81 * -100 + iVar72;
                        *(undefined2 *)((long)puVar86 + (0xc - uVar60)) =
                             *(undefined2 *)(digit_table + uVar62 * 2);
                        *(undefined2 *)((long)puVar86 + (0xe - uVar60)) =
                             *(undefined2 *)(digit_table + uVar81 * 2);
                        lVar74 = 0x10;
                      }
                      uVar62 = (ulong)(byte)dec_trailing_zero_table[uVar62] + 2;
                      if (uVar81 != 0) {
                        uVar62 = (ulong)(byte)dec_trailing_zero_table[uVar81];
                      }
                      uVar62 = lVar74 - uVar62;
                    }
                    puVar106 = (uint *)((long)puVar86 + ((uVar62 & 0xffffffff) - uVar60));
                    uVar62 = 0;
                    do {
                      *(byte *)((long)puVar102 + uVar62 + lVar83) =
                           *(byte *)((long)puVar102 + uVar62 + lVar83 + 1);
                      uVar62 = uVar62 + 1;
                    } while (uVar101 != uVar62);
                    puVar97 = (undefined1 *)((ulong)uVar101 + (long)puVar1);
                    puVar102 = (uint *)(puVar97 + 2);
                    *puVar97 = 0x2e;
                    if (puVar102 < puVar106) {
                      puVar102 = puVar106;
                    }
                  }
                }
                else {
                  uVar60 = uVar62 / 100000000;
                  uVar81 = (uint)uVar60;
                  lVar83 = 2 - (ulong)(uVar81 < 100000000);
                  iVar88 = (int)((uVar60 & 0xffffffff) / 10000);
                  iVar64 = iVar88 * -10000 + uVar81;
                  uVar62 = uVar60 * 0xfa0a1f00 + uVar62;
                  iVar72 = (int)(((uVar60 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                  uVar94 = (uint)(iVar72 * 0x29) >> 0xc;
                  uVar89 = uVar94 * -100 + iVar72;
                  uVar84 = iVar72 * -100 + iVar88;
                  *(char *)((long)puVar1 + 1) = (char)uVar94 + '0';
                  uVar60 = (ulong)(uVar89 < 10 && uVar81 < 100000000);
                  *(undefined2 *)((long)puVar1 + lVar83) =
                       *(undefined2 *)(digit_table + uVar60 + uVar89 * 2);
                  lVar83 = lVar83 - uVar60;
                  *(undefined2 *)((long)puVar1 + lVar83 + 2) =
                       *(undefined2 *)(digit_table + uVar84 * 2);
                  iVar72 = (int)uVar62;
                  if (iVar72 == 0) {
                    if (iVar64 == 0) {
                      uVar81 = (uint)(byte)dec_trailing_zero_table[uVar89];
                      if (uVar84 != 0) {
                        uVar81 = 0;
                      }
                      uVar81 = uVar81 + (byte)dec_trailing_zero_table[uVar84];
                      iVar72 = 4;
                    }
                    else {
                      uVar81 = (uint)(iVar64 * 0x147b) >> 0x13;
                      uVar84 = uVar81 * -100 + iVar64;
                      *(undefined2 *)((long)puVar1 + lVar83 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                      *(undefined2 *)((long)puVar1 + lVar83 + 6) =
                           *(undefined2 *)(digit_table + uVar84 * 2);
                      uVar81 = (byte)dec_trailing_zero_table[uVar81] + 2;
                      if (uVar84 != 0) {
                        uVar81 = (uint)(byte)dec_trailing_zero_table[uVar84];
                      }
                      iVar72 = 8;
                    }
                    uVar81 = iVar72 - uVar81;
                  }
                  else {
                    uVar94 = (uint)(iVar64 * 0x147b) >> 0x13;
                    uVar81 = (uint)((uVar62 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar95 = uVar81 >> 8;
                    uVar89 = uVar95 * 0x147b >> 0x13;
                    uVar84 = uVar89 * -100 + (uVar81 >> 8);
                    *(undefined2 *)((long)puVar1 + lVar83 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar94 * 2);
                    *(undefined2 *)((long)puVar1 + lVar83 + 6) =
                         *(undefined2 *)(digit_table + (uVar94 * 0x7fffff9c + iVar64) * 2);
                    *(undefined2 *)((long)puVar1 + lVar83 + 8) =
                         *(undefined2 *)(digit_table + (ulong)uVar89 * 2);
                    *(undefined2 *)((long)puVar1 + lVar83 + 10) =
                         *(undefined2 *)(digit_table + uVar84 * 2);
                    iVar72 = uVar95 * -10000 + iVar72;
                    if (iVar72 == 0) {
                      uVar81 = (byte)dec_trailing_zero_table[uVar89] + 2;
                      if (uVar84 != 0) {
                        uVar81 = (uint)(byte)dec_trailing_zero_table[uVar84];
                      }
                      iVar72 = 0xc;
                    }
                    else {
                      uVar81 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar84 = uVar81 * -100 + iVar72;
                      *(undefined2 *)((long)puVar1 + lVar83 + 0xc) =
                           *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                      *(undefined2 *)((long)puVar1 + lVar83 + 0xe) =
                           *(undefined2 *)(digit_table + uVar84 * 2);
                      uVar81 = (byte)dec_trailing_zero_table[uVar81] + 2;
                      if (uVar84 != 0) {
                        uVar81 = (uint)(byte)dec_trailing_zero_table[uVar84];
                      }
                      iVar72 = 0x10;
                    }
                    uVar81 = iVar72 - uVar81;
                  }
                  puVar86 = (undefined2 *)
                            ((long)puVar1 +
                            (((ulong)uVar81 + lVar83) - (ulong)((ulong)uVar81 + lVar83 == 2)));
                  uVar101 = uVar101 - 1;
                  *(undefined1 *)puVar1 = *(undefined1 *)((long)puVar1 + 1);
                  *(undefined1 *)((long)puVar1 + 1) = 0x2e;
                  *puVar86 = 0x2d65;
                  uVar84 = uVar101 >> 0x1f;
                  pcVar63 = (char *)((long)puVar86 + (ulong)uVar84 + 1);
                  uVar81 = -uVar101;
                  if (0 < (int)uVar101) {
                    uVar81 = uVar101;
                  }
                  if (uVar81 < 100) {
                    *(undefined2 *)pcVar63 =
                         *(undefined2 *)(digit_table + (ulong)(uVar81 < 10) + (ulong)uVar81 * 2);
                    puVar102 = (uint *)(pcVar63 + (2 - (ulong)(uVar81 < 10)));
                  }
                  else {
                    *pcVar63 = (char)(uVar81 * 0x290 >> 0x10) + '0';
                    *(undefined2 *)((long)puVar86 + (ulong)uVar84 + 2) =
                         *(undefined2 *)
                          (digit_table + ((uVar81 * 0x290 >> 0x10) * 0x7fffff9c + uVar81) * 2);
                    puVar102 = (uint *)((long)puVar86 + (ulong)uVar84 + 4);
                  }
                }
              }
            }
          }
LAB_01237c7d:
          *(ushort *)puVar102 = 0xa2c;
          puVar102 = (uint *)((long)puVar102 + 2);
          local_c0 = puVar87;
        }
        else if (((uint)uVar62 & 7) == 5) {
          uVar79 = uVar62 >> 8;
          puVar106 = (uint *)(pyVar92->uni).str;
          uVar60 = uVar69;
          if ((uVar81 & uVar101) != 0) {
            uVar60 = 0x10;
          }
          uVar60 = uVar60 + uVar79 * 6;
          if (local_c0 <= (ulong *)((long)puVar102 + uVar60)) {
            uVar82 = (ulong)local_b8 >> 1;
            if ((ulong)local_b8 >> 1 <= uVar60) {
              uVar82 = uVar60;
            }
            sVar77 = (uVar82 + 7 & 0xfffffffffffffff8) + (long)local_b8;
            pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,(size_t)local_b8,sVar77);
            if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
            sVar76 = (long)local_88 - (long)local_c0;
            memmove(pbVar100 + (sVar77 - sVar76),pbVar100 + ((long)local_c0 - (long)local_e0),sVar76
                   );
            puVar102 = (uint *)(pbVar100 + ((long)puVar102 - (long)local_e0));
            local_88 = (ulong *)(pbVar100 + sVar77);
            local_e0 = pbVar100;
            local_c0 = (ulong *)(pbVar100 + (sVar77 - sVar76));
            local_b8 = (uint *)sVar77;
          }
          lVar83 = lVar73;
          puVar80 = puVar102;
          if (lVar73 != 0 && (uVar81 & uVar101) == 0) {
            do {
              puVar102 = (uint *)((long)puVar80 + lVar91);
              *puVar80 = 0x20202020;
              lVar83 = lVar83 + -1;
              puVar80 = puVar102;
            } while (lVar83 != 0);
          }
          if (local_a8 != enc_table_cpy) {
            puVar80 = (uint *)(uVar79 + (long)puVar106);
            *(byte *)puVar102 = 0x22;
LAB_01237e04:
            lVar83 = (long)puVar80 - (long)puVar106;
            if (0xf < lVar83) {
              lVar74 = 0;
              do {
                puVar61 = (uint *)((long)puVar102 + lVar74 + 1);
                puVar66 = (uint *)((long)puVar106 + lVar74);
                bVar78 = *(byte *)((long)puVar106 + lVar74);
                if (local_a8[bVar78] != '\0') goto LAB_0123806a;
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 1)] != '\0') {
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 1);
                  puVar66 = (uint *)((long)puVar106 + lVar74);
                  goto LAB_01238007;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 2)] != '\0') {
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 1);
                  puVar66 = (uint *)((long)puVar106 + lVar74);
                  goto LAB_0123801c;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 3)] != '\0') {
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 1);
                  puVar66 = (uint *)((long)puVar106 + lVar74);
                  goto LAB_01238038;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 4)] != '\0') {
                  puVar66 = (uint *)((byte *)((long)puVar106 + lVar74) + 4);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 5);
                  *(undefined4 *)((long)puVar102 + lVar74 + 1) =
                       *(undefined4 *)((long)puVar106 + lVar74);
                  goto LAB_0123806a;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 5)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 5);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 6);
                  *(byte *)((long)puVar61 + -1) = pbVar100[4];
                  *(undefined4 *)((long)puVar61 + -5) = *(undefined4 *)pbVar100;
                  goto LAB_0123806a;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 6)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 6);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 7);
                  *(ushort *)((long)puVar61 + -2) = *(ushort *)(pbVar100 + 4);
                  *(undefined4 *)((long)puVar61 + -6) = *(undefined4 *)pbVar100;
                  goto LAB_0123806a;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 7)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 7);
                  uVar4 = *(undefined4 *)pbVar100;
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 8);
                  *(undefined4 *)((long)puVar102 + lVar74 + 4) = *(undefined4 *)(pbVar100 + 3);
                  *(undefined4 *)((long)puVar102 + lVar74 + 1) = uVar4;
                  goto LAB_0123806a;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 8)] != '\0') {
                  puVar66 = (uint *)((byte *)((long)puVar106 + lVar74) + 8);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 9);
                  *(undefined8 *)((long)puVar102 + lVar74 + 1) =
                       *(undefined8 *)((long)puVar106 + lVar74);
                  goto LAB_0123806a;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 9)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 9);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 10);
                  *(byte *)((long)puVar61 + -1) = pbVar100[8];
                  *(undefined8 *)((long)puVar61 + -9) = *(undefined8 *)pbVar100;
                  goto LAB_0123806a;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 10)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 10);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 0xb);
                  *(ushort *)((long)puVar61 + -2) = *(ushort *)(pbVar100 + 8);
                  *(undefined8 *)((long)puVar61 + -10) = *(undefined8 *)pbVar100;
                  goto LAB_0123806a;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 0xb)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 0xb);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 0xc);
                  puVar61[-1] = *(uint *)(pbVar100 + 7);
                  *(undefined8 *)((long)puVar61 + -0xb) = *(undefined8 *)pbVar100;
                  goto LAB_0123806a;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 0xc)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 0xc);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 0xd);
                  puVar61[-1] = *(uint *)(pbVar100 + 8);
                  *(undefined8 *)(puVar61 + -3) = *(undefined8 *)pbVar100;
                  goto LAB_0123806a;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 0xd)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 0xd);
                  uVar75 = *(undefined8 *)pbVar100;
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 0xe);
                  *(undefined8 *)((long)puVar102 + lVar74 + 6) = *(undefined8 *)(pbVar100 + 5);
                  *(undefined8 *)((long)puVar102 + lVar74 + 1) = uVar75;
                  goto LAB_0123806a;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 0xe)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 0xe);
                  uVar75 = *(undefined8 *)pbVar100;
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 0xf);
                  *(undefined8 *)((long)puVar102 + lVar74 + 7) = *(undefined8 *)(pbVar100 + 6);
                  *(undefined8 *)((long)puVar102 + lVar74 + 1) = uVar75;
                  goto LAB_0123806a;
                }
                if (local_a8[*(byte *)((long)puVar106 + lVar74 + 0xf)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 0xf);
                  uVar75 = *(undefined8 *)pbVar100;
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 0x10);
                  *(undefined8 *)((long)puVar102 + lVar74 + 8) = *(undefined8 *)(pbVar100 + 7);
                  *(undefined8 *)((long)puVar102 + lVar74 + 1) = uVar75;
                  goto LAB_0123806a;
                }
                uVar84 = puVar66[1];
                uVar89 = puVar66[2];
                uVar94 = puVar66[3];
                *puVar61 = *puVar66;
                *(uint *)((long)puVar102 + lVar74 + 5) = uVar84;
                *(uint *)((long)puVar102 + lVar74 + 9) = uVar89;
                *(uint *)((long)puVar102 + lVar74 + 0xd) = uVar94;
                lVar74 = lVar74 + 0x10;
                lVar83 = lVar83 + -0x10;
              } while (0xf < lVar83);
              puVar102 = (uint *)((long)puVar102 + lVar74);
              puVar106 = (uint *)((long)puVar106 + lVar74);
            }
            puVar61 = (uint *)((long)puVar102 + 1);
            puVar66 = puVar106;
            if (3 < lVar83) {
              lVar83 = (long)puVar80 - (long)puVar106;
              do {
                bVar78 = (byte)*puVar66;
                if (local_a8[bVar78] != '\0') goto LAB_0123806a;
                if (local_a8[*(byte *)((long)puVar66 + 1)] != '\0') goto LAB_01238007;
                if (local_a8[*(byte *)((long)puVar66 + 2)] != '\0') goto LAB_0123801c;
                if (local_a8[*(byte *)((long)puVar66 + 3)] != '\0') goto LAB_01238038;
                *puVar61 = *puVar66;
                puVar61 = puVar61 + 1;
                puVar66 = puVar66 + 1;
                lVar83 = lVar83 + -4;
              } while (3 < lVar83);
            }
            if (puVar66 < puVar80) {
              while (uVar84 = *puVar66, local_a8[(byte)uVar84] == '\0') {
                puVar66 = (uint *)((long)puVar66 + 1);
                *(byte *)puVar61 = (byte)uVar84;
                puVar61 = (uint *)((long)puVar61 + 1);
                if (puVar80 <= puVar66) goto switchD_01236417_default;
              }
              goto LAB_0123806a;
            }
            goto switchD_01236417_default;
          }
          uVar58 = pyVar92->tag;
          *(byte *)puVar102 = 0x22;
          if ((uVar58 & 0x18) == 0) {
            puVar80 = (uint *)(uVar79 + (long)puVar106);
LAB_0123619c:
            lVar83 = (long)puVar80 - (long)puVar106;
            if (0xf < lVar83) {
              lVar74 = 0;
              do {
                puVar61 = (uint *)((long)puVar102 + lVar74 + 1);
                puVar66 = (uint *)((long)puVar106 + lVar74);
                bVar78 = *(byte *)((long)puVar106 + lVar74);
                if (enc_table_cpy[bVar78] != '\0') goto LAB_012363e9;
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 1)] != '\0') {
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 1);
                  puVar66 = (uint *)((long)puVar106 + lVar74);
                  goto LAB_01236390;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 2)] != '\0') {
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 1);
                  puVar66 = (uint *)((long)puVar106 + lVar74);
                  goto LAB_012363a5;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 3)] != '\0') {
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 1);
                  puVar66 = (uint *)((long)puVar106 + lVar74);
                  goto LAB_012363c1;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 4)] != '\0') {
                  puVar66 = (uint *)((byte *)((long)puVar106 + lVar74) + 4);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 5);
                  *(undefined4 *)((long)puVar102 + lVar74 + 1) =
                       *(undefined4 *)((long)puVar106 + lVar74);
                  goto LAB_012363e9;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 5)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 5);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 6);
                  *(byte *)((long)puVar61 + -1) = pbVar100[4];
                  *(undefined4 *)((long)puVar61 + -5) = *(undefined4 *)pbVar100;
                  goto LAB_012363e9;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 6)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 6);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 7);
                  *(ushort *)((long)puVar61 + -2) = *(ushort *)(pbVar100 + 4);
                  *(undefined4 *)((long)puVar61 + -6) = *(undefined4 *)pbVar100;
                  goto LAB_012363e9;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 7)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 7);
                  uVar4 = *(undefined4 *)pbVar100;
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 8);
                  *(undefined4 *)((long)puVar102 + lVar74 + 4) = *(undefined4 *)(pbVar100 + 3);
                  *(undefined4 *)((long)puVar102 + lVar74 + 1) = uVar4;
                  goto LAB_012363e9;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 8)] != '\0') {
                  puVar66 = (uint *)((byte *)((long)puVar106 + lVar74) + 8);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 9);
                  *(undefined8 *)((long)puVar102 + lVar74 + 1) =
                       *(undefined8 *)((long)puVar106 + lVar74);
                  goto LAB_012363e9;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 9)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 9);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 10);
                  *(byte *)((long)puVar61 + -1) = pbVar100[8];
                  *(undefined8 *)((long)puVar61 + -9) = *(undefined8 *)pbVar100;
                  goto LAB_012363e9;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 10)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 10);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 0xb);
                  *(ushort *)((long)puVar61 + -2) = *(ushort *)(pbVar100 + 8);
                  *(undefined8 *)((long)puVar61 + -10) = *(undefined8 *)pbVar100;
                  goto LAB_012363e9;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 0xb)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 0xb);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 0xc);
                  puVar61[-1] = *(uint *)(pbVar100 + 7);
                  *(undefined8 *)((long)puVar61 + -0xb) = *(undefined8 *)pbVar100;
                  goto LAB_012363e9;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 0xc)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 0xc);
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 0xd);
                  puVar61[-1] = *(uint *)(pbVar100 + 8);
                  *(undefined8 *)(puVar61 + -3) = *(undefined8 *)pbVar100;
                  goto LAB_012363e9;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 0xd)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 0xd);
                  uVar75 = *(undefined8 *)pbVar100;
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 0xe);
                  *(undefined8 *)((long)puVar102 + lVar74 + 6) = *(undefined8 *)(pbVar100 + 5);
                  *(undefined8 *)((long)puVar102 + lVar74 + 1) = uVar75;
                  goto LAB_012363e9;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 0xe)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 0xe);
                  uVar75 = *(undefined8 *)pbVar100;
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 0xf);
                  *(undefined8 *)((long)puVar102 + lVar74 + 7) = *(undefined8 *)(pbVar100 + 6);
                  *(undefined8 *)((long)puVar102 + lVar74 + 1) = uVar75;
                  goto LAB_012363e9;
                }
                if (enc_table_cpy[*(byte *)((long)puVar106 + lVar74 + 0xf)] != '\0') {
                  pbVar100 = (byte *)((long)puVar106 + lVar74);
                  puVar66 = (uint *)(pbVar100 + 0xf);
                  uVar75 = *(undefined8 *)pbVar100;
                  puVar61 = (uint *)((long)puVar102 + lVar74 + 0x10);
                  *(undefined8 *)((long)puVar102 + lVar74 + 8) = *(undefined8 *)(pbVar100 + 7);
                  *(undefined8 *)((long)puVar102 + lVar74 + 1) = uVar75;
                  goto LAB_012363e9;
                }
                uVar84 = puVar66[1];
                uVar89 = puVar66[2];
                uVar94 = puVar66[3];
                *puVar61 = *puVar66;
                *(uint *)((long)puVar102 + lVar74 + 5) = uVar84;
                *(uint *)((long)puVar102 + lVar74 + 9) = uVar89;
                *(uint *)((long)puVar102 + lVar74 + 0xd) = uVar94;
                lVar74 = lVar74 + 0x10;
                lVar83 = lVar83 + -0x10;
              } while (0xf < lVar83);
              puVar102 = (uint *)((long)puVar102 + lVar74);
              puVar106 = (uint *)((long)puVar106 + lVar74);
            }
            puVar61 = (uint *)((long)puVar102 + 1);
            puVar66 = puVar106;
            if (3 < lVar83) {
              lVar83 = (long)puVar80 - (long)puVar106;
              do {
                bVar78 = (byte)*puVar66;
                if (enc_table_cpy[bVar78] != '\0') goto LAB_012363e9;
                if (enc_table_cpy[*(byte *)((long)puVar66 + 1)] != '\0') goto LAB_01236390;
                if (enc_table_cpy[*(byte *)((long)puVar66 + 2)] != '\0') goto LAB_012363a5;
                if (enc_table_cpy[*(byte *)((long)puVar66 + 3)] != '\0') goto LAB_012363c1;
                *puVar61 = *puVar66;
                puVar61 = puVar61 + 1;
                puVar66 = puVar66 + 1;
                lVar83 = lVar83 + -4;
              } while (3 < lVar83);
            }
            if (puVar66 < puVar80) {
              while (uVar84 = *puVar66, enc_table_cpy[(byte)uVar84] == '\0') {
                puVar66 = (uint *)((long)puVar66 + 1);
                *(byte *)puVar61 = (byte)uVar84;
                puVar61 = (uint *)((long)puVar61 + 1);
                if (puVar80 <= puVar66) goto switchD_01236417_default;
              }
              goto LAB_012363e9;
            }
            goto switchD_01236417_default;
          }
          puVar61 = (uint *)((long)puVar102 + 1);
          if (0xfff < uVar62) {
            do {
              uVar84 = puVar106[1];
              uVar89 = puVar106[2];
              uVar94 = puVar106[3];
              *puVar61 = *puVar106;
              puVar61[1] = uVar84;
              puVar61[2] = uVar89;
              puVar61[3] = uVar94;
              puVar61 = puVar61 + 4;
              puVar106 = puVar106 + 4;
              uVar79 = uVar79 - 0x10;
            } while (0xf < uVar79);
          }
          for (; 3 < uVar79; uVar79 = uVar79 - 4) {
            *puVar61 = *puVar106;
            puVar61 = puVar61 + 1;
            puVar106 = puVar106 + 1;
          }
          if (uVar79 != 0) {
            uVar62 = 0;
            do {
              *(byte *)((long)puVar61 + uVar62) = *(byte *)((long)puVar106 + uVar62);
              uVar62 = uVar62 + 1;
            } while (uVar79 != uVar62);
            puVar61 = (uint *)((long)puVar61 + uVar62);
          }
switchD_01236417_default:
          bVar109 = (~uVar81 & uVar101) == 0;
          *(byte *)puVar61 = 0x22;
          bVar78 = 0x3a;
          if (bVar109) {
            bVar78 = 0x2c;
          }
          *(byte *)((long)puVar61 + 1) = bVar78;
          bVar78 = 0x20;
          if (bVar109) {
            bVar78 = 10;
          }
          *(byte *)((long)puVar61 + 2) = bVar78;
          puVar102 = (uint *)((long)puVar61 + 3);
        }
        else if ((~(byte)uVar62 & 6) == 0) {
          if (0xff < uVar62) {
            local_68 = (ulong)(bVar78 == 7);
            if ((uVar81 & uVar101) != 0) {
              uVar67 = 0x20;
            }
            if (local_c0 <= (ulong *)((long)puVar102 + uVar67)) {
              uVar69 = (ulong)local_b8 >> 1;
              if ((ulong)local_b8 >> 1 <= uVar67) {
                uVar69 = uVar67;
              }
              sVar77 = (uVar69 + 7 & 0xfffffffffffffff8) + (long)local_b8;
              pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,(size_t)local_b8,sVar77);
              if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
              sVar76 = (long)local_88 - (long)local_c0;
              memmove(pbVar100 + (sVar77 - sVar76),pbVar100 + ((long)local_c0 - (long)local_e0),
                      sVar76);
              puVar102 = (uint *)(pbVar100 + ((long)puVar102 - (long)local_e0));
              local_88 = (ulong *)(pbVar100 + sVar77);
              local_b8 = (uint *)sVar77;
              local_e0 = pbVar100;
              local_c0 = (ulong *)(pbVar100 + (sVar77 - sVar76));
            }
            lVar83 = lVar99 * 2;
            lVar99 = (uVar62 >> 8) << (bVar78 == 7);
            local_c0[-1] = uVar98 + lVar83;
            lVar83 = lVar73;
            puVar106 = puVar102;
            if (lVar73 != 0 && (uVar81 & uVar101) == 0) {
              do {
                puVar102 = (uint *)((long)puVar106 + lVar91);
                *puVar106 = 0x20202020;
                lVar83 = lVar83 + -1;
                puVar106 = puVar102;
              } while (lVar83 != 0);
            }
            local_c0 = local_c0 + -1;
            lVar73 = lVar73 + 1;
            *(byte *)puVar102 = (bVar78 == 7) << 5 | 0x5b;
            *(byte *)((long)puVar102 + 1) = 10;
            puVar102 = (uint *)((long)puVar102 + 2);
            pyVar92 = pyVar92 + 1;
            goto LAB_01235c51;
          }
          uVar62 = uVar69;
          if ((uVar81 & uVar101) != 0) {
            uVar62 = 0x10;
          }
          puVar87 = local_c0;
          if (local_c0 <= (ulong *)((long)puVar102 + uVar62)) {
            uVar60 = (ulong)local_b8 >> 1;
            if ((ulong)local_b8 >> 1 <= uVar62) {
              uVar60 = uVar62;
            }
            sVar77 = (uVar60 + 7 & 0xfffffffffffffff8) + (long)local_b8;
            pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,(size_t)local_b8,sVar77);
            if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
            puVar87 = (ulong *)(pbVar100 + (sVar77 - ((long)local_88 - (long)local_c0)));
            memmove(puVar87,pbVar100 + ((long)local_c0 - (long)local_e0),
                    (long)local_88 - (long)local_c0);
            puVar102 = (uint *)(pbVar100 + ((long)puVar102 - (long)local_e0));
            local_88 = (ulong *)(pbVar100 + sVar77);
            local_e0 = pbVar100;
            local_b8 = (uint *)sVar77;
          }
          lVar83 = lVar73;
          puVar106 = puVar102;
          if (lVar73 != 0 && (uVar81 & uVar101) == 0) {
            do {
              puVar102 = (uint *)((long)puVar106 + lVar91);
              *puVar106 = 0x20202020;
              lVar83 = lVar83 + -1;
              puVar106 = puVar102;
            } while (lVar83 != 0);
          }
          bVar78 = (bVar78 == 7) * ' ';
          *(byte *)puVar102 = bVar78 + 0x5b;
          *(byte *)((long)puVar102 + 1) = bVar78 | 0x5d;
          *(ushort *)((long)puVar102 + 2) = 0xa2c;
          puVar102 = puVar102 + 1;
          local_c0 = puVar87;
        }
        else if (bVar78 == 1) {
          uVar62 = uVar62 >> 8;
          pvVar9 = (pyVar92->uni).ptr;
          if (local_c0 <= (ulong *)((long)puVar102 + uVar62 + 3)) {
            uVar60 = (ulong)local_b8 >> 1;
            if ((ulong)local_b8 >> 1 <= uVar62 + 3) {
              uVar60 = uVar62 + 3;
            }
            sVar77 = (uVar60 + 7 & 0xfffffffffffffff8) + (long)local_b8;
            pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,(size_t)local_b8,sVar77);
            if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
            sVar76 = (long)local_88 - (long)local_c0;
            memmove(pbVar100 + (sVar77 - sVar76),pbVar100 + ((long)local_c0 - (long)local_e0),sVar76
                   );
            puVar102 = (uint *)(pbVar100 + ((long)puVar102 - (long)local_e0));
            local_88 = (ulong *)(pbVar100 + sVar77);
            local_e0 = pbVar100;
            local_c0 = (ulong *)(pbVar100 + (sVar77 - sVar76));
            local_b8 = (uint *)sVar77;
          }
          switchD_00b03519::default(puVar102,pvVar9,uVar62);
          pbVar100 = (byte *)((long)puVar102 + uVar62);
          puVar102 = (uint *)(pbVar100 + 2);
          pbVar100[0] = 0x2c;
          pbVar100[1] = 10;
        }
        else if (bVar78 == 2) {
          uVar62 = uVar69;
          if ((uVar81 & uVar101) != 0) {
            uVar62 = 0x10;
          }
          puVar87 = local_c0;
          if (local_c0 <= (ulong *)((long)puVar102 + uVar62)) {
            uVar60 = (ulong)local_b8 >> 1;
            if ((ulong)local_b8 >> 1 <= uVar62) {
              uVar60 = uVar62;
            }
            sVar77 = (uVar60 + 7 & 0xfffffffffffffff8) + (long)local_b8;
            pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,(size_t)local_b8,sVar77);
            if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
            puVar87 = (ulong *)(pbVar100 + (sVar77 - ((long)local_88 - (long)local_c0)));
            memmove(puVar87,pbVar100 + ((long)local_c0 - (long)local_e0),
                    (long)local_88 - (long)local_c0);
            puVar102 = (uint *)(pbVar100 + ((long)puVar102 - (long)local_e0));
            local_88 = (ulong *)(pbVar100 + sVar77);
            local_e0 = pbVar100;
            local_b8 = (uint *)sVar77;
          }
          lVar83 = lVar73;
          puVar106 = puVar102;
          if (lVar73 != 0 && (uVar81 & uVar101) == 0) {
            do {
              puVar102 = (uint *)((long)puVar106 + lVar91);
              *puVar106 = 0x20202020;
              lVar83 = lVar83 + -1;
              puVar106 = puVar102;
            } while (lVar83 != 0);
          }
          puVar102[0] = 0x6c6c756e;
          puVar102[1] = 0xa2c;
          puVar102 = (uint *)((long)puVar102 + 6);
          local_c0 = puVar87;
        }
        else {
          if (bVar78 != 3) goto LAB_0123b8e7;
          uVar62 = uVar69;
          if ((uVar81 & uVar101) != 0) {
            uVar62 = 0x10;
          }
          puVar87 = local_c0;
          if (local_c0 <= (ulong *)((long)puVar102 + uVar62)) {
            uVar60 = (ulong)local_b8 >> 1;
            if ((ulong)local_b8 >> 1 <= uVar62) {
              uVar60 = uVar62;
            }
            sVar77 = (uVar60 + 7 & 0xfffffffffffffff8) + (long)local_b8;
            pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,(size_t)local_b8,sVar77);
            if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
            puVar87 = (ulong *)(pbVar100 + (sVar77 - ((long)local_88 - (long)local_c0)));
            memmove(puVar87,pbVar100 + ((long)local_c0 - (long)local_e0),
                    (long)local_88 - (long)local_c0);
            puVar102 = (uint *)(pbVar100 + ((long)puVar102 - (long)local_e0));
            local_88 = (ulong *)(pbVar100 + sVar77);
            local_e0 = pbVar100;
            local_b8 = (uint *)sVar77;
          }
          lVar83 = lVar73;
          puVar106 = puVar102;
          if (lVar73 != 0 && (uVar81 & uVar101) == 0) {
            do {
              puVar102 = (uint *)((long)puVar106 + lVar91);
              *puVar106 = 0x20202020;
              lVar83 = lVar83 + -1;
              puVar106 = puVar102;
            } while (lVar83 != 0);
          }
          bVar109 = (pyVar92->tag & 0x18) != 0;
          uVar75 = 0xa2c65736c6166;
          if (bVar109) {
            uVar75 = 0xa2c65757274;
          }
          *(undefined8 *)puVar102 = uVar75;
          puVar102 = (uint *)((long)puVar102 + (7 - (ulong)bVar109));
          local_c0 = puVar87;
        }
        pyVar92 = pyVar92 + 1;
        lVar99 = lVar99 + -1;
        lVar83 = lVar73;
        if (lVar99 == 0) goto LAB_01238c36;
        goto LAB_01235c88;
      }
    }
    local_e0 = (byte *)0x0;
LAB_0123b888:
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar70 = &local_48;
    if (err != (yyjson_write_err *)0x0) {
      pyVar70 = err;
    }
    pyVar59->code = 2;
    pyVar70->msg = "memory allocation failed";
joined_r0x0123b975:
    if (local_e0 == (byte *)0x0) {
      return (char *)0x0;
    }
    (*p_Var6)(pvVar7,local_e0);
    return (char *)0x0;
  }
  if ((flg & 2) == 0) {
    puVar97 = enc_table_cpy_slash;
    if ((flg & 4) == 0) {
      puVar97 = enc_table_cpy;
    }
    switch(bVar78 & 7) {
    case 0:
      goto switchD_01235b3c_caseD_0;
    case 2:
      goto switchD_01235b3c_caseD_2;
    case 3:
      goto switchD_01235b3c_caseD_3;
    case 4:
      goto switchD_01235b3c_caseD_4;
    case 5:
      goto switchD_01235b3c_caseD_5;
    case 6:
      goto switchD_01235b3c_caseD_6;
    case 7:
      goto switchD_01235b3c_caseD_7;
    }
switchD_01235b3c_caseD_1:
    uVar67 = uVar67 >> 8;
    pvVar9 = (val->uni).ptr;
    puVar102 = (uint *)(*p_Var5)(pvVar7,uVar67 + 2);
    if (puVar102 != (uint *)0x0) {
      switchD_00b03519::default(puVar102,pvVar9,uVar67);
      local_38 = (uint *)((long)puVar102 + uVar67);
LAB_0123bc73:
      if (local_ec < '\0') {
        *(byte *)local_38 = 10;
        local_38 = (uint *)((long)local_38 + 1);
      }
      *(byte *)local_38 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)local_38 - (long)puVar102;
      }
      *(undefined8 *)pyVar59 = 0;
      pyVar59->msg = (char *)0x0;
      return (char *)puVar102;
    }
  }
  else {
    puVar97 = enc_table_esc_slash;
    if ((flg & 4) == 0) {
      puVar97 = enc_table_esc;
    }
    switch(bVar78 & 7) {
    case 0:
switchD_01235b3c_caseD_0:
      if (dat_len != (usize *)0x0) {
        *dat_len = 0;
      }
      pyVar70 = &local_48;
      if (err != (yyjson_write_err *)0x0) {
        pyVar70 = err;
      }
      pyVar59->code = 3;
      pyVar70->msg = "invalid JSON value type";
      return (char *)0x0;
    case 1:
      goto switchD_01235b3c_caseD_1;
    case 2:
switchD_01235b3c_caseD_2:
      puVar102 = (uint *)(*p_Var5)(pvVar7,8);
      if (puVar102 != (uint *)0x0) {
        puVar102[0] = 0x6c6c756e;
        puVar102[1] = 0xa2c;
LAB_0123bb25:
        local_38 = puVar102 + 1;
        goto LAB_0123bc73;
      }
      break;
    case 3:
switchD_01235b3c_caseD_3:
      puVar102 = (uint *)(*p_Var5)(pvVar7,8);
      if (puVar102 != (uint *)0x0) {
        bVar109 = (val->tag & 0x18) != 0;
        uVar75 = 0xa2c65736c6166;
        if (bVar109) {
          uVar75 = 0xa2c65757274;
        }
        *(undefined8 *)puVar102 = uVar75;
        local_38 = (uint *)((long)puVar102 + (5 - (ulong)bVar109));
        goto LAB_0123bc73;
      }
      break;
    case 4:
switchD_01235b3c_caseD_4:
      puVar102 = (uint *)(*p_Var5)(pvVar7,0x22);
      if (puVar102 != (uint *)0x0) {
        uVar67 = (val->uni).u64;
        uVar101 = (uint)(uVar67 >> 0x20);
        if ((val->tag & 0x10) == 0) {
          uVar101 = uVar101 >> 0x1f & (uint)(val->tag >> 3);
          uVar69 = -uVar67;
          if (uVar101 == 0) {
            uVar69 = uVar67;
          }
          *(byte *)puVar102 = 0x2d;
          pbVar100 = (byte *)((long)puVar102 + (ulong)uVar101);
          if (uVar69 < 100000000) {
            if (uVar69 < 100) {
              *(undefined2 *)pbVar100 =
                   *(undefined2 *)(digit_table + (ulong)(uVar69 < 10) + uVar69 * 2);
              pbVar100 = pbVar100 + -(ulong)(uVar69 < 10);
              goto LAB_0123d6e4;
            }
            iVar72 = (int)uVar69;
            if (uVar69 < 10000) {
              uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
              uVar67 = (ulong)(uVar69 < 1000);
              *(undefined2 *)pbVar100 = *(undefined2 *)(digit_table + uVar67 + (ulong)uVar101 * 2);
              *(undefined2 *)(pbVar100 + (2 - uVar67)) =
                   *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
              local_38 = (uint *)(pbVar100 + (4 - uVar67));
              goto LAB_0123bc73;
            }
            if (uVar69 < 1000000) {
              iVar72 = (int)(uVar69 * 0x68db9 >> 0x20) * -10000 + iVar72;
              uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
              uVar67 = (ulong)(uVar69 < 100000);
              *(undefined2 *)pbVar100 =
                   *(undefined2 *)(digit_table + uVar67 + (uVar69 * 0x68db9 >> 0x20) * 2);
              *(undefined2 *)(pbVar100 + (2 - uVar67)) =
                   *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
              *(undefined2 *)(pbVar100 + (4 - uVar67)) =
                   *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
              local_38 = (uint *)(pbVar100 + (6 - uVar67));
              goto LAB_0123bc73;
            }
            uVar101 = (uint)(uVar69 * 0x68db8bb >> 0x20);
            uVar81 = uVar101 >> 8;
            iVar72 = uVar81 * -10000 + iVar72;
            uVar81 = uVar81 * 0x147b >> 0x13;
            uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
            iVar72 = uVar84 * -100 + iVar72;
            *(undefined2 *)pbVar100 =
                 *(undefined2 *)(digit_table + (ulong)(uVar69 < 10000000) + (ulong)uVar81 * 2);
            pbVar100 = pbVar100 + -(ulong)(uVar69 < 10000000);
            *(undefined2 *)(pbVar100 + 2) =
                 *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
            uVar71 = *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
          }
          else {
            uVar67 = uVar69 / 100000000;
            uVar98 = uVar67 * 0xfa0a1f00 + uVar69;
            iVar72 = (int)uVar67;
            if (9999999999999999 < uVar69) {
              uVar67 = uVar69 / 1000000000000;
              iVar64 = (int)uVar67;
              iVar72 = iVar72 + iVar64 * -10000;
              if (uVar69 < 1000000000000000000) {
                iVar64 = (int)(uVar67 * 0x68db9 >> 0x20) * -10000 + iVar64;
                uVar101 = (uint)(iVar64 * 0x147b) >> 0x13;
                uVar69 = (ulong)(uVar69 < 100000000000000000);
                *(undefined2 *)pbVar100 =
                     *(undefined2 *)(digit_table + uVar69 + (uVar67 * 0x68db9 >> 0x20) * 2);
                *(undefined2 *)(pbVar100 + (2 - uVar69)) =
                     *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                *(undefined2 *)(pbVar100 + (4 - uVar69)) =
                     *(undefined2 *)(digit_table + (uVar101 * -100 + iVar64) * 2);
                lVar91 = 6 - uVar69;
              }
              else {
                uVar101 = (uint)(uVar67 / 10000);
                iVar64 = uVar101 * -10000 + iVar64;
                uVar101 = uVar101 / 100;
                uVar81 = (uint)(iVar64 * 0x147b) >> 0x13;
                uVar69 = (ulong)(uVar69 < 10000000000000000000);
                *(undefined2 *)pbVar100 = *(undefined2 *)(digit_table + uVar69 + (ulong)uVar101 * 2)
                ;
                *(undefined2 *)(pbVar100 + (2 - uVar69)) =
                     *(undefined2 *)(digit_table + (uVar101 * -100 + (int)(uVar67 / 10000)) * 2);
                *(undefined2 *)(pbVar100 + (4 - uVar69)) =
                     *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                *(undefined2 *)(pbVar100 + (6 - uVar69)) =
                     *(undefined2 *)(digit_table + (uVar81 * -100 + iVar64) * 2);
                lVar91 = 8 - uVar69;
              }
              pbVar100 = pbVar100 + lVar91;
              uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar100 = *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
              *(undefined2 *)(pbVar100 + 2) =
                   *(undefined2 *)(digit_table + (uVar101 * 0x7fffff9c + iVar72) * 2);
              uVar101 = (uint)((uVar98 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar81 = uVar101 >> 8;
              iVar72 = uVar81 * -10000 + (int)uVar98;
              uVar81 = uVar81 * 0x147b >> 0x13;
              uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
              *(undefined2 *)(pbVar100 + 4) = *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
              *(undefined2 *)(pbVar100 + 6) =
                   *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
              *(undefined2 *)(pbVar100 + 8) = *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
              *(undefined2 *)(pbVar100 + 10) =
                   *(undefined2 *)(digit_table + (uVar84 * 0x7fffff9c + iVar72) * 2);
              local_38 = (uint *)(pbVar100 + 0xc);
              goto LAB_0123bc73;
            }
            if (uVar69 >> 10 < 0x9502f9) {
              *(undefined2 *)pbVar100 =
                   *(undefined2 *)(digit_table + (ulong)(uVar69 < 1000000000) + uVar67 * 2);
              pbVar100 = pbVar100 + (2 - (ulong)(uVar69 < 1000000000));
            }
            else if (uVar69 >> 0xc < 0xe8d4a51) {
              uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
              uVar67 = (ulong)(uVar69 >> 0xb < 0x2e90edd);
              *(undefined2 *)pbVar100 = *(undefined2 *)(digit_table + uVar67 + (ulong)uVar101 * 2);
              *(undefined2 *)(pbVar100 + (2 - uVar67)) =
                   *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
              pbVar100 = pbVar100 + (4 - uVar67);
            }
            else if (uVar69 < 100000000000000) {
              iVar72 = (int)(uVar67 * 0x68db9 >> 0x20) * -10000 + iVar72;
              uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
              uVar69 = (ulong)(uVar69 >> 0xd < 0x48c27395);
              *(undefined2 *)pbVar100 =
                   *(undefined2 *)(digit_table + uVar69 + (uVar67 * 0x68db9 >> 0x20) * 2);
              *(undefined2 *)(pbVar100 + (2 - uVar69)) =
                   *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
              *(undefined2 *)(pbVar100 + (4 - uVar69)) =
                   *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
              pbVar100 = pbVar100 + (6 - uVar69);
            }
            else {
              uVar101 = (uint)(uVar67 * 0x68db8bb >> 0x20);
              uVar81 = uVar101 >> 8;
              iVar72 = uVar81 * -10000 + iVar72;
              uVar81 = uVar81 * 0x147b >> 0x13;
              uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
              uVar67 = (ulong)(uVar69 < 1000000000000000);
              *(undefined2 *)pbVar100 = *(undefined2 *)(digit_table + uVar67 + (ulong)uVar81 * 2);
              *(undefined2 *)(pbVar100 + (2 - uVar67)) =
                   *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
              *(undefined2 *)(pbVar100 + (4 - uVar67)) =
                   *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
              *(undefined2 *)(pbVar100 + (6 - uVar67)) =
                   *(undefined2 *)(digit_table + (uVar84 * -100 + iVar72) * 2);
              pbVar100 = pbVar100 + (8 - uVar67);
            }
            uVar101 = (uint)((uVar98 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar81 = uVar101 >> 8;
            iVar72 = uVar81 * -10000 + (int)uVar98;
            uVar81 = uVar81 * 0x147b >> 0x13;
            uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
            iVar72 = uVar84 * 0x7fffff9c + iVar72;
            *(undefined2 *)pbVar100 = *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
            *(undefined2 *)(pbVar100 + 2) =
                 *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
            uVar71 = *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
          }
          *(undefined2 *)(pbVar100 + 4) = uVar71;
          *(undefined2 *)(pbVar100 + 6) = *(undefined2 *)(digit_table + (uint)(iVar72 * 2));
          local_38 = (uint *)(pbVar100 + 8);
        }
        else {
          uVar69 = uVar67 & 0xfffffffffffff;
          uVar101 = uVar101 >> 0x14 & 0x7ff;
          if (uVar101 == 0x7ff) {
            if ((flg & 0x10) == 0) {
              if ((flg & 8) != 0) {
                if (uVar69 == 0) {
                  *(byte *)puVar102 = 0x2d;
                  lVar91 = -((long)uVar67 >> 0x3f);
                  *(undefined8 *)((long)puVar102 + lVar91) = 0x7974696e69666e49;
                  local_38 = (uint *)((long)puVar102 + lVar91 + 8);
                }
                else {
                  *puVar102 = 0x4e614e;
                  local_38 = (uint *)((long)puVar102 + 3);
                }
                goto LAB_0123bc73;
              }
              (*p_Var6)(pvVar7,puVar102);
              if (dat_len != (usize *)0x0) {
                *dat_len = 0;
              }
              pyVar70 = &local_48;
              if (err != (yyjson_write_err *)0x0) {
                pyVar70 = err;
              }
              pyVar59->code = 4;
              pcVar63 = "nan or inf number is not allowed";
              goto LAB_0123bce0;
            }
            *puVar102 = 0x6c6c756e;
            goto LAB_0123bb25;
          }
          *(byte *)puVar102 = 0x2d;
          lVar91 = -((long)uVar67 >> 0x3f);
          puVar104 = (undefined8 *)(lVar91 + (long)puVar102);
          if ((uVar67 & 0x7fffffffffffffff) == 0) {
            *(undefined4 *)puVar104 = 0x302e30;
            local_38 = (uint *)((long)puVar104 + 3);
            goto LAB_0123bc73;
          }
          if (uVar101 == 0) {
            yyjson_val_write_opts();
            goto LAB_0123bc73;
          }
          uVar98 = uVar69 + 0x10000000000000;
          if (uVar101 - 0x3ff < 0x35) {
            lVar73 = 0;
            if (uVar98 != 0) {
              for (; (uVar98 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
              }
            }
            if (0x433 - uVar101 <= (uint)lVar73) {
              uVar98 = uVar98 >> ((byte)(0x433 - uVar101) & 0x3f);
              iVar72 = (int)uVar98;
              if (uVar98 < 100000000) {
                if (uVar98 < 100) {
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + (ulong)(uVar98 < 10) + uVar98 * 2);
                  pbVar100 = (byte *)((long)puVar104 + (2 - (ulong)(uVar98 < 10)));
                }
                else if (uVar98 < 10000) {
                  uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                  uVar67 = (ulong)(uVar98 < 1000);
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + uVar67 + (ulong)uVar101 * 2);
                  *(undefined2 *)((long)puVar104 + (2 - uVar67)) =
                       *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                  pbVar100 = (byte *)((long)puVar104 + (4 - uVar67));
                }
                else if (uVar98 < 1000000) {
                  iVar72 = (int)(uVar98 * 0x68db9 >> 0x20) * -10000 + iVar72;
                  uVar101 = (uint)(iVar72 * 0x147b) >> 0x13;
                  uVar67 = (ulong)(uVar98 < 100000);
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + uVar67 + (uVar98 * 0x68db9 >> 0x20) * 2);
                  *(undefined2 *)((long)puVar104 + (2 - uVar67)) =
                       *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                  *(undefined2 *)((long)puVar104 + (4 - uVar67)) =
                       *(undefined2 *)(digit_table + (uVar101 * -100 + iVar72) * 2);
                  pbVar100 = (byte *)((long)puVar104 + (6 - uVar67));
                }
                else {
                  uVar101 = (uint)(uVar98 * 0x68db8bb >> 0x20);
                  uVar81 = uVar101 >> 8;
                  iVar72 = uVar81 * -10000 + iVar72;
                  uVar81 = uVar81 * 0x147b >> 0x13;
                  uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                  uVar67 = (ulong)(uVar98 < 10000000);
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + uVar67 + (ulong)uVar81 * 2);
                  *(undefined2 *)((long)puVar104 + (2 - uVar67)) =
                       *(undefined2 *)(digit_table + (uVar81 * -100 + (uVar101 >> 8)) * 2);
                  *(undefined2 *)((long)puVar104 + (4 - uVar67)) =
                       *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                  *(undefined2 *)((long)puVar104 + (6 - uVar67)) =
                       *(undefined2 *)(digit_table + (uVar84 * -100 + iVar72) * 2);
                  pbVar100 = (byte *)((long)puVar104 + (8 - uVar67));
                }
              }
              else {
                auVar30._8_8_ = 0;
                auVar30._0_8_ = uVar98;
                uVar67 = SUB168(auVar30 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                iVar64 = (int)uVar67;
                uVar101 = iVar64 * -100000000 + iVar72;
                if (uVar98 >> 10 < 0x9502f9) {
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + (ulong)(uVar98 < 1000000000) + uVar67 * 2);
                  puVar86 = (undefined2 *)((long)puVar104 + (2 - (ulong)(uVar98 < 1000000000)));
                }
                else if (uVar98 >> 0xc < 0xe8d4a51) {
                  uVar81 = (uint)(iVar64 * 0x147b) >> 0x13;
                  uVar67 = (ulong)(uVar98 >> 0xb < 0x2e90edd);
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + uVar67 + (ulong)uVar81 * 2);
                  *(undefined2 *)((long)puVar104 + (2 - uVar67)) =
                       *(undefined2 *)(digit_table + (uVar81 * -100 + iVar64) * 2);
                  puVar86 = (undefined2 *)((long)puVar104 + (4 - uVar67));
                }
                else if (uVar98 < 100000000000000) {
                  iVar64 = (int)(uVar67 * 0x68db9 >> 0x20) * -10000 + iVar64;
                  uVar81 = (uint)(iVar64 * 0x147b) >> 0x13;
                  uVar69 = (ulong)(uVar98 >> 0xd < 0x48c27395);
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + uVar69 + (uVar67 * 0x68db9 >> 0x20) * 2);
                  *(undefined2 *)((long)puVar104 + (2 - uVar69)) =
                       *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                  *(undefined2 *)((long)puVar104 + (4 - uVar69)) =
                       *(undefined2 *)(digit_table + (uVar81 * -100 + iVar64) * 2);
                  puVar86 = (undefined2 *)((long)puVar104 + (6 - uVar69));
                }
                else {
                  uVar81 = (uint)(uVar67 * 0x68db8bb >> 0x20);
                  uVar84 = uVar81 >> 8;
                  iVar64 = uVar84 * -10000 + iVar64;
                  uVar84 = uVar84 * 0x147b >> 0x13;
                  uVar89 = (uint)(iVar64 * 0x147b) >> 0x13;
                  uVar67 = (ulong)(uVar98 < 1000000000000000);
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + uVar67 + (ulong)uVar84 * 2);
                  *(undefined2 *)((long)puVar104 + (2 - uVar67)) =
                       *(undefined2 *)(digit_table + (uVar84 * -100 + (uVar81 >> 8)) * 2);
                  *(undefined2 *)((long)puVar104 + (4 - uVar67)) =
                       *(undefined2 *)(digit_table + (ulong)uVar89 * 2);
                  *(undefined2 *)((long)puVar104 + (6 - uVar67)) =
                       *(undefined2 *)(digit_table + (uVar89 * -100 + iVar64) * 2);
                  puVar86 = (undefined2 *)((long)puVar104 + (8 - uVar67));
                }
                uVar81 = (uint)((ulong)uVar101 * 0x68db8bb >> 0x20);
                uVar84 = uVar81 >> 8;
                iVar72 = uVar84 * -10000 + uVar101;
                uVar101 = uVar84 * 0x147b >> 0x13;
                uVar84 = (uint)(iVar72 * 0x147b) >> 0x13;
                *puVar86 = *(undefined2 *)(digit_table + (ulong)uVar101 * 2);
                puVar86[1] = *(undefined2 *)(digit_table + (uVar101 * -100 + (uVar81 >> 8)) * 2);
                puVar86[2] = *(undefined2 *)(digit_table + (ulong)uVar84 * 2);
                puVar86[3] = *(undefined2 *)(digit_table + (uVar84 * 0x7fffff9c + iVar72) * 2);
                pbVar100 = (byte *)(puVar86 + 4);
              }
              pbVar100[0] = 0x2e;
              pbVar100[1] = 0x30;
              goto LAB_0123d6e4;
            }
          }
          uVar67 = (ulong)((uint)uVar67 & 1);
          iVar72 = uVar101 * 0x4d105 + -0x200a5;
          if (uVar101 == 1 || uVar69 != 0) {
            iVar72 = uVar101 * 0x4d105;
          }
          iVar72 = iVar72 + -0x1439b7ff >> 0x14;
          uVar62 = *(ulong *)(pow10_sig_table + (ulong)(iVar72 * -2 + 0x2ae) * 8);
          uVar60 = *(long *)(pow10_sig_table + (ulong)(iVar72 * -2 + 0x2af) * 8) +
                   (ulong)(iVar72 - 1U < 0xffffffc8);
          bVar78 = ((char)((uint)(iVar72 * -0x3526b) >> 0x10) + (char)uVar101) - 0x32;
          uVar69 = (ulong)(uVar101 != 1 && uVar69 == 0) + uVar98 * 4 + -2 << (bVar78 & 0x3f);
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar60;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar69;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = SUB168(auVar24 * auVar43,8);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar62;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar69;
          auVar55 = auVar25 * auVar44 + auVar55;
          uVar69 = uVar98 * 4 << (bVar78 & 0x3f);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar60;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar69;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = SUB168(auVar26 * auVar45,8);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = uVar62;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = uVar69;
          auVar56 = auVar27 * auVar46 + auVar56;
          uVar69 = auVar56._8_8_;
          uVar98 = uVar98 * 4 + 2 << (bVar78 & 0x3f);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar60;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar98;
          auVar57._8_8_ = 0;
          auVar57._0_8_ = SUB168(auVar28 * auVar47,8);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar62;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar98;
          auVar57 = auVar29 * auVar48 + auVar57;
          uVar98 = ((ulong)((auVar55 & (undefined1  [16])0xfffffffffffffffe) !=
                           (undefined1  [16])0x0) | auVar55._8_8_) + uVar67;
          uVar67 = ((ulong)((auVar57 & (undefined1  [16])0xfffffffffffffffe) !=
                           (undefined1  [16])0x0) | auVar57._8_8_) - uVar67;
          if (uVar69 < 0x28) {
LAB_0123bebd:
            uVar60 = (auVar56 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                     uVar69;
            uVar62 = uVar69 & 0xfffffffffffffffc;
            bVar109 = true;
            if (uVar60 <= uVar62 + 2) {
              bVar109 = (bool)((byte)(uVar69 >> 2) & 0x3f & uVar60 == uVar62 + 2);
            }
            bVar108 = uVar62 + 4 <= uVar67;
            if (uVar62 < uVar98 == bVar108) {
              bVar109 = bVar108;
            }
            uVar67 = (uVar69 >> 2) + (ulong)bVar109;
          }
          else {
            uVar60 = uVar69 / 0x28;
            uVar62 = uVar60 * 0x28 + 0x28;
            if (uVar60 * 0x28 < uVar98 != uVar62 <= uVar67) goto LAB_0123bebd;
            uVar67 = (uVar60 + 1) - (ulong)(uVar67 < uVar62);
            iVar72 = iVar72 + 1;
          }
          iVar88 = (0x11 - (uint)(uVar67 < 10000000000000000)) - (uint)(uVar67 < 1000000000000000);
          uVar101 = iVar88 + iVar72;
          uVar69 = uVar67 / 100000000;
          uVar67 = uVar69 * 0xfa0a1f00 + uVar67;
          uVar81 = (uint)uVar69;
          iVar105 = (int)((uVar69 & 0xffffffff) / 10000);
          iVar85 = iVar105 * -10000 + uVar81;
          iVar64 = (int)(((uVar69 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
          uVar94 = (uint)(iVar64 * 0x29) >> 0xc;
          uVar89 = uVar94 * -100 + iVar64;
          uVar84 = iVar64 * -100 + iVar105;
          cVar93 = (char)uVar94 + '0';
          iVar64 = (int)uVar67;
          if (iVar88 + iVar72 + 5U < 0x1b) {
            if ((int)uVar101 < 1) {
              puVar86 = (undefined2 *)
                        ((long)puVar104 + (((ulong)(2 - uVar101) + 1) - (ulong)(uVar81 < 100000000))
                        );
              *(char *)((long)puVar104 + (ulong)(2 - uVar101)) = cVar93;
              uVar69 = (ulong)(uVar89 < 10 && uVar81 < 100000000);
              *puVar86 = *(undefined2 *)(digit_table + uVar69 + uVar89 * 2);
              *(undefined2 *)((long)puVar86 + (2 - uVar69)) =
                   *(undefined2 *)(digit_table + uVar84 * 2);
              if (iVar64 == 0) {
                if (iVar85 == 0) {
                  uVar81 = 0;
                  if (uVar84 == 0) {
                    uVar81 = (uint)(byte)dec_trailing_zero_table[uVar89];
                  }
                  uVar81 = 4 - (uVar81 + (byte)dec_trailing_zero_table[uVar84]);
                }
                else {
                  uVar81 = (uint)(iVar85 * 0x147b) >> 0x13;
                  uVar84 = uVar81 * -100 + iVar85;
                  *(undefined2 *)((long)puVar86 + (4 - uVar69)) =
                       *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                  *(undefined2 *)((long)puVar86 + (6 - uVar69)) =
                       *(undefined2 *)(digit_table + uVar84 * 2);
                  uVar81 = (byte)dec_trailing_zero_table[uVar81] + 2;
                  if (uVar84 != 0) {
                    uVar81 = (uint)(byte)dec_trailing_zero_table[uVar84];
                  }
                  uVar81 = 8 - uVar81;
                }
              }
              else {
                uVar94 = (uint)(iVar85 * 0x147b) >> 0x13;
                uVar81 = (uint)((uVar67 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar84 = uVar81 >> 8;
                uVar89 = uVar84 * 0x147b >> 0x13;
                uVar67 = (ulong)uVar89;
                uVar89 = uVar89 * -100 + (uVar81 >> 8);
                *(undefined2 *)((long)puVar86 + (4 - uVar69)) =
                     *(undefined2 *)(digit_table + (ulong)uVar94 * 2);
                *(undefined2 *)((long)puVar86 + (6 - uVar69)) =
                     *(undefined2 *)(digit_table + (uVar94 * 0x7fffff9c + iVar85) * 2);
                *(undefined2 *)((long)puVar86 + (8 - uVar69)) =
                     *(undefined2 *)(digit_table + uVar67 * 2);
                *(undefined2 *)((long)puVar86 + (10 - uVar69)) =
                     *(undefined2 *)(digit_table + uVar89 * 2);
                iVar64 = uVar84 * -10000 + iVar64;
                if (iVar64 == 0) {
                  iVar72 = 0xc;
                }
                else {
                  uVar81 = (uint)(iVar64 * 0x147b) >> 0x13;
                  uVar67 = (ulong)uVar81;
                  uVar89 = uVar81 * -100 + iVar64;
                  *(undefined2 *)((long)puVar86 + (0xc - uVar69)) =
                       *(undefined2 *)(digit_table + uVar67 * 2);
                  *(undefined2 *)((long)puVar86 + (0xe - uVar69)) =
                       *(undefined2 *)(digit_table + uVar89 * 2);
                  iVar72 = 0x10;
                }
                uVar81 = (byte)dec_trailing_zero_table[uVar67] + 2;
                if (uVar89 != 0) {
                  uVar81 = (uint)(byte)dec_trailing_zero_table[uVar89];
                }
                uVar81 = iVar72 - uVar81;
              }
              local_38 = (uint *)((long)puVar86 + (uVar81 - uVar69));
              *(undefined2 *)puVar104 = 0x2e30;
              if ((int)uVar101 < 0) {
                switchD_005681f0::default((undefined2 *)((long)puVar104 + 2),0x30,(ulong)-uVar101);
              }
            }
            else {
              puVar86 = (undefined2 *)((long)puVar104 + (2 - (ulong)(uVar81 < 100000000)));
              *puVar104 = 0x3030303030303030;
              puVar104[1] = 0x3030303030303030;
              puVar104[2] = 0x3030303030303030;
              *(char *)((long)puVar104 + 1) = cVar93;
              uVar69 = (ulong)(uVar89 < 10 && uVar81 < 100000000);
              *puVar86 = *(undefined2 *)(digit_table + uVar69 + uVar89 * 2);
              *(undefined2 *)((long)puVar86 + (2 - uVar69)) =
                   *(undefined2 *)(digit_table + uVar84 * 2);
              if (iVar64 == 0) {
                if (iVar85 == 0) {
                  uVar81 = 0;
                  if (uVar84 == 0) {
                    uVar81 = (uint)(byte)dec_trailing_zero_table[uVar89];
                  }
                  uVar81 = uVar81 + (byte)dec_trailing_zero_table[uVar84];
                  iVar72 = 4;
                }
                else {
                  uVar81 = (uint)(iVar85 * 0x147b) >> 0x13;
                  uVar84 = uVar81 * -100 + iVar85;
                  *(undefined2 *)((long)puVar86 + (4 - uVar69)) =
                       *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
                  *(undefined2 *)((long)puVar86 + (6 - uVar69)) =
                       *(undefined2 *)(digit_table + uVar84 * 2);
                  uVar81 = (byte)dec_trailing_zero_table[uVar81] + 2;
                  if (uVar84 != 0) {
                    uVar81 = (uint)(byte)dec_trailing_zero_table[uVar84];
                  }
                  iVar72 = 8;
                }
                uVar81 = iVar72 - uVar81;
              }
              else {
                uVar89 = (uint)(iVar85 * 0x147b) >> 0x13;
                uVar81 = (uint)((uVar67 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar94 = uVar81 >> 8;
                uVar84 = uVar94 * 0x147b >> 0x13;
                uVar67 = (ulong)uVar84;
                uVar84 = uVar84 * -100 + (uVar81 >> 8);
                *(undefined2 *)((long)puVar86 + (4 - uVar69)) =
                     *(undefined2 *)(digit_table + (ulong)uVar89 * 2);
                *(undefined2 *)((long)puVar86 + (6 - uVar69)) =
                     *(undefined2 *)(digit_table + (uVar89 * 0x7fffff9c + iVar85) * 2);
                *(undefined2 *)((long)puVar86 + (8 - uVar69)) =
                     *(undefined2 *)(digit_table + uVar67 * 2);
                *(undefined2 *)((long)puVar86 + (10 - uVar69)) =
                     *(undefined2 *)(digit_table + uVar84 * 2);
                iVar64 = uVar94 * -10000 + iVar64;
                if (iVar64 == 0) {
                  iVar72 = 0xc;
                }
                else {
                  uVar81 = (uint)(iVar64 * 0x147b) >> 0x13;
                  uVar67 = (ulong)uVar81;
                  uVar84 = uVar81 * -100 + iVar64;
                  *(undefined2 *)((long)puVar86 + (0xc - uVar69)) =
                       *(undefined2 *)(digit_table + uVar67 * 2);
                  *(undefined2 *)((long)puVar86 + (0xe - uVar69)) =
                       *(undefined2 *)(digit_table + uVar84 * 2);
                  iVar72 = 0x10;
                }
                uVar81 = (byte)dec_trailing_zero_table[uVar67] + 2;
                if (uVar84 != 0) {
                  uVar81 = (uint)(byte)dec_trailing_zero_table[uVar84];
                }
                uVar81 = iVar72 - uVar81;
              }
              puVar106 = (uint *)((long)puVar86 + (uVar81 - uVar69));
              uVar67 = 0;
              do {
                *(byte *)((long)puVar102 + uVar67 + lVar91) =
                     *(byte *)((long)puVar102 + uVar67 + lVar91 + 1);
                uVar67 = uVar67 + 1;
              } while (uVar101 != uVar67);
              puVar97 = (undefined1 *)((long)puVar104 + (ulong)uVar101);
              local_38 = (uint *)(puVar97 + 2);
              *puVar97 = 0x2e;
              if (local_38 < puVar106) {
                local_38 = puVar106;
              }
            }
            goto LAB_0123bc73;
          }
          lVar91 = 2 - (ulong)(uVar81 < 100000000);
          *(char *)((long)puVar104 + 1) = cVar93;
          uVar69 = (ulong)(uVar89 < 10 && uVar81 < 100000000);
          *(undefined2 *)((long)puVar104 + lVar91) =
               *(undefined2 *)(digit_table + uVar69 + uVar89 * 2);
          lVar91 = lVar91 - uVar69;
          *(undefined2 *)((long)puVar104 + lVar91 + 2) = *(undefined2 *)(digit_table + uVar84 * 2);
          if (iVar64 == 0) {
            if (iVar85 == 0) {
              uVar81 = 0;
              if (uVar84 == 0) {
                uVar81 = (uint)(byte)dec_trailing_zero_table[uVar89];
              }
              uVar81 = uVar81 + (byte)dec_trailing_zero_table[uVar84];
              iVar72 = 4;
            }
            else {
              uVar81 = (uint)(iVar85 * 0x147b) >> 0x13;
              uVar84 = uVar81 * -100 + iVar85;
              *(undefined2 *)((long)puVar104 + lVar91 + 4) =
                   *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
              *(undefined2 *)((long)puVar104 + lVar91 + 6) =
                   *(undefined2 *)(digit_table + uVar84 * 2);
              uVar81 = (byte)dec_trailing_zero_table[uVar81] + 2;
              if (uVar84 != 0) {
                uVar81 = (uint)(byte)dec_trailing_zero_table[uVar84];
              }
              iVar72 = 8;
            }
            uVar81 = iVar72 - uVar81;
          }
          else {
            uVar94 = (uint)(iVar85 * 0x147b) >> 0x13;
            uVar81 = (uint)((uVar67 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar95 = uVar81 >> 8;
            uVar89 = uVar95 * 0x147b >> 0x13;
            uVar84 = uVar89 * -100 + (uVar81 >> 8);
            *(undefined2 *)((long)puVar104 + lVar91 + 4) =
                 *(undefined2 *)(digit_table + (ulong)uVar94 * 2);
            *(undefined2 *)((long)puVar104 + lVar91 + 6) =
                 *(undefined2 *)(digit_table + (uVar94 * 0x7fffff9c + iVar85) * 2);
            *(undefined2 *)((long)puVar104 + lVar91 + 8) =
                 *(undefined2 *)(digit_table + (ulong)uVar89 * 2);
            *(undefined2 *)((long)puVar104 + lVar91 + 10) =
                 *(undefined2 *)(digit_table + uVar84 * 2);
            iVar64 = uVar95 * -10000 + iVar64;
            if (iVar64 == 0) {
              uVar81 = (byte)dec_trailing_zero_table[uVar89] + 2;
              if (uVar84 != 0) {
                uVar81 = (uint)(byte)dec_trailing_zero_table[uVar84];
              }
              uVar81 = 0xc - uVar81;
            }
            else {
              uVar81 = (uint)(iVar64 * 0x147b) >> 0x13;
              uVar84 = uVar81 * -100 + iVar64;
              *(undefined2 *)((long)puVar104 + lVar91 + 0xc) =
                   *(undefined2 *)(digit_table + (ulong)uVar81 * 2);
              *(undefined2 *)((long)puVar104 + lVar91 + 0xe) =
                   *(undefined2 *)(digit_table + uVar84 * 2);
              uVar81 = (byte)dec_trailing_zero_table[uVar81] + 2;
              if (uVar84 != 0) {
                uVar81 = (uint)(byte)dec_trailing_zero_table[uVar84];
              }
              uVar81 = 0x10 - uVar81;
            }
          }
          puVar86 = (undefined2 *)
                    ((long)puVar104 +
                    (((ulong)uVar81 + lVar91) - (ulong)((ulong)uVar81 + lVar91 == 2)));
          uVar101 = uVar101 - 1;
          *(undefined1 *)puVar104 = *(undefined1 *)((long)puVar104 + 1);
          *(undefined1 *)((long)puVar104 + 1) = 0x2e;
          *puVar86 = 0x2d65;
          uVar84 = uVar101 >> 0x1f;
          pcVar63 = (char *)((long)puVar86 + (ulong)uVar84 + 1);
          uVar81 = -uVar101;
          if (0 < (int)uVar101) {
            uVar81 = uVar101;
          }
          if (99 < uVar81) {
            *pcVar63 = (char)(uVar81 * 0x290 >> 0x10) + '0';
            *(undefined2 *)((long)puVar86 + (ulong)uVar84 + 2) =
                 *(undefined2 *)(digit_table + ((uVar81 * 0x290 >> 0x10) * 0x7fffff9c + uVar81) * 2)
            ;
            local_38 = (uint *)((long)puVar86 + (ulong)uVar84 + 4);
            goto LAB_0123bc73;
          }
          *(undefined2 *)pcVar63 =
               *(undefined2 *)(digit_table + (ulong)(uVar81 < 10) + (ulong)uVar81 * 2);
          pbVar100 = (byte *)(pcVar63 + -(ulong)(uVar81 < 10));
LAB_0123d6e4:
          local_38 = (uint *)(pbVar100 + 2);
        }
        goto LAB_0123bc73;
      }
      break;
    case 5:
switchD_01235b3c_caseD_5:
      uVar69 = uVar67 >> 8;
      puVar106 = (uint *)(val->uni).str;
      puVar102 = (uint *)(*p_Var5)(pvVar7,uVar69 * 6 + 4);
      if (puVar102 != (uint *)0x0) {
        if (puVar97 != enc_table_cpy) {
          puVar66 = (uint *)(uVar69 + (long)puVar106);
          *(byte *)puVar102 = 0x22;
          puVar80 = puVar102;
LAB_0123d73f:
          lVar91 = (long)puVar66 - (long)puVar106;
          if (0xf < lVar91) {
            lVar73 = 0;
            do {
              local_38 = (uint *)((long)puVar80 + lVar73 + 1);
              puVar61 = (uint *)(lVar73 + (long)puVar106);
              bVar78 = *(byte *)((long)puVar106 + lVar73);
              if (puVar97[bVar78] != '\0') goto LAB_0123d977;
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 1)] != '\0') {
                local_38 = (uint *)((long)puVar80 + lVar73 + 1);
                puVar61 = (uint *)((long)puVar106 + lVar73);
                goto LAB_0123d926;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 2)] != '\0') {
                local_38 = (uint *)((long)puVar80 + lVar73 + 1);
                puVar61 = (uint *)((long)puVar106 + lVar73);
                goto LAB_0123d93b;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 3)] != '\0') {
                local_38 = (uint *)((long)puVar80 + lVar73 + 1);
                puVar61 = (uint *)((long)puVar106 + lVar73);
                goto LAB_0123d958;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 4)] != '\0') {
                puVar61 = (uint *)((byte *)(lVar73 + (long)puVar106) + 4);
                local_38 = (uint *)((long)puVar80 + lVar73 + 5);
                *(undefined4 *)((long)puVar80 + lVar73 + 1) =
                     *(undefined4 *)(lVar73 + (long)puVar106);
                goto LAB_0123d977;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 5)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 5);
                local_38 = (uint *)((long)puVar80 + lVar73 + 6);
                *(byte *)((long)local_38 + -1) = pbVar100[4];
                *(undefined4 *)((long)local_38 + -5) = *(undefined4 *)pbVar100;
                goto LAB_0123d977;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 6)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 6);
                local_38 = (uint *)((long)puVar80 + lVar73 + 7);
                *(ushort *)((long)local_38 + -2) = *(ushort *)(pbVar100 + 4);
                *(undefined4 *)((long)local_38 + -6) = *(undefined4 *)pbVar100;
                goto LAB_0123d977;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 7)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 7);
                uVar4 = *(undefined4 *)pbVar100;
                local_38 = (uint *)((long)puVar80 + lVar73 + 8);
                *(undefined4 *)((long)puVar80 + lVar73 + 4) = *(undefined4 *)(pbVar100 + 3);
                *(undefined4 *)((long)puVar80 + lVar73 + 1) = uVar4;
                goto LAB_0123d977;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 8)] != '\0') {
                puVar61 = (uint *)((byte *)(lVar73 + (long)puVar106) + 8);
                local_38 = (uint *)((long)puVar80 + lVar73 + 9);
                *(undefined8 *)((long)puVar80 + lVar73 + 1) =
                     *(undefined8 *)(lVar73 + (long)puVar106);
                goto LAB_0123d977;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 9)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 9);
                local_38 = (uint *)((long)puVar80 + lVar73 + 10);
                *(byte *)((long)local_38 + -1) = pbVar100[8];
                *(undefined8 *)((long)local_38 + -9) = *(undefined8 *)pbVar100;
                goto LAB_0123d977;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 10)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 10);
                local_38 = (uint *)((long)puVar80 + lVar73 + 0xb);
                *(ushort *)((long)local_38 + -2) = *(ushort *)(pbVar100 + 8);
                *(undefined8 *)((long)local_38 + -10) = *(undefined8 *)pbVar100;
                goto LAB_0123d977;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 0xb)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 0xb);
                local_38 = (uint *)((long)puVar80 + lVar73 + 0xc);
                local_38[-1] = *(uint *)(pbVar100 + 7);
                *(undefined8 *)((long)local_38 + -0xb) = *(undefined8 *)pbVar100;
                goto LAB_0123d977;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 0xc)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 0xc);
                local_38 = (uint *)((long)puVar80 + lVar73 + 0xd);
                local_38[-1] = *(uint *)(pbVar100 + 8);
                *(undefined8 *)(local_38 + -3) = *(undefined8 *)pbVar100;
                goto LAB_0123d977;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 0xd)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 0xd);
                uVar75 = *(undefined8 *)pbVar100;
                local_38 = (uint *)((long)puVar80 + lVar73 + 0xe);
                *(undefined8 *)((long)puVar80 + lVar73 + 6) = *(undefined8 *)(pbVar100 + 5);
                *(undefined8 *)((long)puVar80 + lVar73 + 1) = uVar75;
                goto LAB_0123d977;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 0xe)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 0xe);
                uVar75 = *(undefined8 *)pbVar100;
                local_38 = (uint *)((long)puVar80 + lVar73 + 0xf);
                *(undefined8 *)((long)puVar80 + lVar73 + 7) = *(undefined8 *)(pbVar100 + 6);
                *(undefined8 *)((long)puVar80 + lVar73 + 1) = uVar75;
                goto LAB_0123d977;
              }
              if (puVar97[*(byte *)((long)puVar106 + lVar73 + 0xf)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 0xf);
                uVar75 = *(undefined8 *)pbVar100;
                local_38 = (uint *)((long)puVar80 + lVar73 + 0x10);
                *(undefined8 *)((long)puVar80 + lVar73 + 8) = *(undefined8 *)(pbVar100 + 7);
                *(undefined8 *)((long)puVar80 + lVar73 + 1) = uVar75;
                goto LAB_0123d977;
              }
              uVar101 = puVar61[1];
              uVar81 = puVar61[2];
              uVar84 = puVar61[3];
              *local_38 = *puVar61;
              *(uint *)((long)puVar80 + lVar73 + 5) = uVar101;
              *(uint *)((long)puVar80 + lVar73 + 9) = uVar81;
              *(uint *)((long)puVar80 + lVar73 + 0xd) = uVar84;
              lVar73 = lVar73 + 0x10;
              lVar91 = lVar91 + -0x10;
            } while (0xf < lVar91);
            puVar80 = (uint *)((long)puVar80 + lVar73);
            puVar106 = (uint *)((long)puVar106 + lVar73);
          }
          local_38 = (uint *)((long)puVar80 + 1);
          puVar61 = puVar106;
          if (3 < lVar91) {
            lVar91 = (long)puVar66 - (long)puVar106;
            do {
              bVar78 = (byte)*puVar61;
              if (puVar97[bVar78] != '\0') goto LAB_0123d977;
              if (puVar97[*(byte *)((long)puVar61 + 1)] != '\0') goto LAB_0123d926;
              if (puVar97[*(byte *)((long)puVar61 + 2)] != '\0') goto LAB_0123d93b;
              if (puVar97[*(byte *)((long)puVar61 + 3)] != '\0') goto LAB_0123d958;
              *local_38 = *puVar61;
              local_38 = local_38 + 1;
              puVar61 = puVar61 + 1;
              lVar91 = lVar91 + -4;
            } while (3 < lVar91);
          }
          if (puVar61 < puVar66) {
            while (uVar101 = *puVar61, puVar97[(byte)uVar101] == '\0') {
              puVar61 = (uint *)((long)puVar61 + 1);
              *(byte *)local_38 = (byte)uVar101;
              local_38 = (uint *)((long)local_38 + 1);
              if (puVar66 <= puVar61) goto LAB_0123df47;
            }
            goto LAB_0123d977;
          }
LAB_0123df47:
          *(byte *)local_38 = 0x22;
          local_38 = (uint *)((long)local_38 + 1);
          goto LAB_0123bc73;
        }
        uVar58 = val->tag;
        *(byte *)puVar102 = 0x22;
        if ((uVar58 & 0x18) == 0) {
          puVar66 = (uint *)(uVar69 + (long)puVar106);
          puVar80 = puVar102;
LAB_0123bf2d:
          lVar91 = (long)puVar66 - (long)puVar106;
          if (0xf < lVar91) {
            lVar73 = 0;
            do {
              local_38 = (uint *)((long)puVar80 + lVar73 + 1);
              puVar61 = (uint *)(lVar73 + (long)puVar106);
              bVar78 = *(byte *)((long)puVar106 + lVar73);
              if (enc_table_cpy[bVar78] != '\0') goto LAB_0123c165;
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 1)] != '\0') {
                local_38 = (uint *)((long)puVar80 + lVar73 + 1);
                puVar61 = (uint *)((long)puVar106 + lVar73);
                goto LAB_0123c114;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 2)] != '\0') {
                local_38 = (uint *)((long)puVar80 + lVar73 + 1);
                puVar61 = (uint *)((long)puVar106 + lVar73);
                goto LAB_0123c129;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 3)] != '\0') {
                local_38 = (uint *)((long)puVar80 + lVar73 + 1);
                puVar61 = (uint *)((long)puVar106 + lVar73);
                goto LAB_0123c146;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 4)] != '\0') {
                puVar61 = (uint *)((byte *)(lVar73 + (long)puVar106) + 4);
                local_38 = (uint *)((long)puVar80 + lVar73 + 5);
                *(undefined4 *)((long)puVar80 + lVar73 + 1) =
                     *(undefined4 *)(lVar73 + (long)puVar106);
                goto LAB_0123c165;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 5)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 5);
                local_38 = (uint *)((long)puVar80 + lVar73 + 6);
                *(byte *)((long)local_38 + -1) = pbVar100[4];
                *(undefined4 *)((long)local_38 + -5) = *(undefined4 *)pbVar100;
                goto LAB_0123c165;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 6)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 6);
                local_38 = (uint *)((long)puVar80 + lVar73 + 7);
                *(ushort *)((long)local_38 + -2) = *(ushort *)(pbVar100 + 4);
                *(undefined4 *)((long)local_38 + -6) = *(undefined4 *)pbVar100;
                goto LAB_0123c165;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 7)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 7);
                uVar4 = *(undefined4 *)pbVar100;
                local_38 = (uint *)((long)puVar80 + lVar73 + 8);
                *(undefined4 *)((long)puVar80 + lVar73 + 4) = *(undefined4 *)(pbVar100 + 3);
                *(undefined4 *)((long)puVar80 + lVar73 + 1) = uVar4;
                goto LAB_0123c165;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 8)] != '\0') {
                puVar61 = (uint *)((byte *)(lVar73 + (long)puVar106) + 8);
                local_38 = (uint *)((long)puVar80 + lVar73 + 9);
                *(undefined8 *)((long)puVar80 + lVar73 + 1) =
                     *(undefined8 *)(lVar73 + (long)puVar106);
                goto LAB_0123c165;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 9)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 9);
                local_38 = (uint *)((long)puVar80 + lVar73 + 10);
                *(byte *)((long)local_38 + -1) = pbVar100[8];
                *(undefined8 *)((long)local_38 + -9) = *(undefined8 *)pbVar100;
                goto LAB_0123c165;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 10)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 10);
                local_38 = (uint *)((long)puVar80 + lVar73 + 0xb);
                *(ushort *)((long)local_38 + -2) = *(ushort *)(pbVar100 + 8);
                *(undefined8 *)((long)local_38 + -10) = *(undefined8 *)pbVar100;
                goto LAB_0123c165;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 0xb)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 0xb);
                local_38 = (uint *)((long)puVar80 + lVar73 + 0xc);
                local_38[-1] = *(uint *)(pbVar100 + 7);
                *(undefined8 *)((long)local_38 + -0xb) = *(undefined8 *)pbVar100;
                goto LAB_0123c165;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 0xc)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 0xc);
                local_38 = (uint *)((long)puVar80 + lVar73 + 0xd);
                local_38[-1] = *(uint *)(pbVar100 + 8);
                *(undefined8 *)(local_38 + -3) = *(undefined8 *)pbVar100;
                goto LAB_0123c165;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 0xd)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 0xd);
                uVar75 = *(undefined8 *)pbVar100;
                local_38 = (uint *)((long)puVar80 + lVar73 + 0xe);
                *(undefined8 *)((long)puVar80 + lVar73 + 6) = *(undefined8 *)(pbVar100 + 5);
                *(undefined8 *)((long)puVar80 + lVar73 + 1) = uVar75;
                goto LAB_0123c165;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 0xe)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 0xe);
                uVar75 = *(undefined8 *)pbVar100;
                local_38 = (uint *)((long)puVar80 + lVar73 + 0xf);
                *(undefined8 *)((long)puVar80 + lVar73 + 7) = *(undefined8 *)(pbVar100 + 6);
                *(undefined8 *)((long)puVar80 + lVar73 + 1) = uVar75;
                goto LAB_0123c165;
              }
              if (enc_table_cpy[*(byte *)((long)puVar106 + lVar73 + 0xf)] != '\0') {
                pbVar100 = (byte *)(lVar73 + (long)puVar106);
                puVar61 = (uint *)(pbVar100 + 0xf);
                uVar75 = *(undefined8 *)pbVar100;
                local_38 = (uint *)((long)puVar80 + lVar73 + 0x10);
                *(undefined8 *)((long)puVar80 + lVar73 + 8) = *(undefined8 *)(pbVar100 + 7);
                *(undefined8 *)((long)puVar80 + lVar73 + 1) = uVar75;
                goto LAB_0123c165;
              }
              uVar101 = puVar61[1];
              uVar81 = puVar61[2];
              uVar84 = puVar61[3];
              *local_38 = *puVar61;
              *(uint *)((long)puVar80 + lVar73 + 5) = uVar101;
              *(uint *)((long)puVar80 + lVar73 + 9) = uVar81;
              *(uint *)((long)puVar80 + lVar73 + 0xd) = uVar84;
              lVar73 = lVar73 + 0x10;
              lVar91 = lVar91 + -0x10;
            } while (0xf < lVar91);
            puVar80 = (uint *)((long)puVar80 + lVar73);
            puVar106 = (uint *)((long)puVar106 + lVar73);
          }
          local_38 = (uint *)((long)puVar80 + 1);
          puVar61 = puVar106;
          if (3 < lVar91) {
            lVar91 = (long)puVar66 - (long)puVar106;
            do {
              bVar78 = (byte)*puVar61;
              if (enc_table_cpy[bVar78] != '\0') goto LAB_0123c165;
              if (enc_table_cpy[*(byte *)((long)puVar61 + 1)] != '\0') goto LAB_0123c114;
              if (enc_table_cpy[*(byte *)((long)puVar61 + 2)] != '\0') goto LAB_0123c129;
              if (enc_table_cpy[*(byte *)((long)puVar61 + 3)] != '\0') goto LAB_0123c146;
              *local_38 = *puVar61;
              local_38 = local_38 + 1;
              puVar61 = puVar61 + 1;
              lVar91 = lVar91 + -4;
            } while (3 < lVar91);
          }
          if (puVar61 < puVar66) {
            while (uVar101 = *puVar61, enc_table_cpy[(byte)uVar101] == '\0') {
              puVar61 = (uint *)((long)puVar61 + 1);
              *(byte *)local_38 = (byte)uVar101;
              local_38 = (uint *)((long)local_38 + 1);
              if (puVar66 <= puVar61) goto LAB_0123bc47;
            }
            goto LAB_0123c165;
          }
          goto LAB_0123bc47;
        }
        local_38 = (uint *)((long)puVar102 + 1);
        if (0xfff < uVar67) {
          do {
            uVar75 = *(undefined8 *)(puVar106 + 2);
            *(undefined8 *)local_38 = *(undefined8 *)puVar106;
            *(undefined8 *)(local_38 + 2) = uVar75;
            local_38 = local_38 + 4;
            puVar106 = puVar106 + 4;
            uVar69 = uVar69 - 0x10;
          } while (0xf < uVar69);
        }
        for (; 3 < uVar69; uVar69 = uVar69 - 4) {
          *local_38 = *puVar106;
          local_38 = local_38 + 1;
          puVar106 = puVar106 + 1;
        }
        if (uVar69 != 0) {
          uVar67 = 0;
          do {
            *(byte *)((long)local_38 + uVar67) = *(byte *)((long)puVar106 + uVar67);
            uVar67 = uVar67 + 1;
          } while (uVar69 != uVar67);
          local_38 = (uint *)((long)local_38 + uVar67);
        }
LAB_0123bc47:
        *(byte *)local_38 = 0x22;
        local_38 = (uint *)((long)local_38 + 1);
        goto LAB_0123bc73;
      }
      break;
    case 6:
switchD_01235b3c_caseD_6:
      puVar102 = (uint *)(*p_Var5)(pvVar7,4);
      if (puVar102 != (uint *)0x0) {
        *(ushort *)puVar102 = 0x5d5b;
LAB_0123bc64:
        local_38 = (uint *)((long)puVar102 + 2);
        goto LAB_0123bc73;
      }
      break;
    case 7:
switchD_01235b3c_caseD_7:
      puVar102 = (uint *)(*p_Var5)(pvVar7,4);
      if (puVar102 != (uint *)0x0) {
        *(ushort *)puVar102 = 0x7d7b;
        goto LAB_0123bc64;
      }
    }
  }
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar70 = &local_48;
  if (err != (yyjson_write_err *)0x0) {
    pyVar70 = err;
  }
  pyVar59->code = 2;
  pcVar63 = "memory allocation failed";
LAB_0123bce0:
  pyVar70->msg = pcVar63;
  return (char *)0x0;
LAB_0123ae2d:
  *(byte *)puVar103 = bVar78;
  puVar103 = (uint *)((long)puVar103 + 1);
  puVar61 = (uint *)((long)puVar61 + 1);
  goto LAB_0123b016;
LAB_0123ae42:
  *(ushort *)puVar103 = (ushort)*puVar61;
  puVar103 = (uint *)((long)puVar103 + 2);
  puVar61 = (uint *)((long)puVar61 + 2);
  goto LAB_0123b016;
LAB_0123ae5d:
  *(byte *)((long)puVar103 + 2) = *(byte *)((long)puVar61 + 2);
  *(ushort *)puVar103 = (ushort)*puVar61;
  puVar103 = (uint *)((long)puVar103 + 3);
  puVar61 = (uint *)((long)puVar61 + 3);
LAB_0123b016:
  puVar106 = puVar61 + 1;
  if (puVar102 < puVar106) {
    if (puVar102 != puVar61) {
      bVar78 = (byte)*puVar61;
      uVar69 = (ulong)bVar78;
      bVar2 = puVar97[uVar69];
      if ((long)(ulong)(bVar2 >> 1) <= (long)puVar102 - (long)puVar61) goto LAB_0123b031;
switchD_0123b046_caseD_1:
      if ((flg & 2) != 0) goto LAB_0123b160;
      goto LAB_0123b317;
    }
    goto switchD_01239403_default;
  }
  bVar78 = (byte)*puVar61;
  uVar69 = (ulong)bVar78;
  bVar2 = puVar97[uVar69];
LAB_0123b031:
  switch(bVar2) {
  case 0:
    goto switchD_0123b046_caseD_0;
  case 1:
    goto switchD_0123b046_caseD_1;
  case 2:
    *(ushort *)puVar103 = *(ushort *)(esc_single_char_table + uVar69 * 2);
    puVar103 = (uint *)((long)puVar103 + 2);
    puVar61 = (uint *)((long)puVar61 + 1);
    goto LAB_0123b016;
  case 3:
    *puVar103 = 0x3030755c;
    *(ushort *)(puVar103 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar61 * 2);
    puVar103 = (uint *)((long)puVar103 + 6);
    puVar61 = (uint *)((long)puVar61 + 1);
    goto LAB_0123b016;
  case 4:
    uVar3 = (ushort)*puVar61;
    bVar78 = (byte)uVar3;
    if (((uVar3 & 0xc0e0) == 0x80c0) && ((uVar3 & 0x1e) != 0)) {
      *(ushort *)puVar103 = uVar3;
      puVar103 = (uint *)((long)puVar103 + 2);
      puVar61 = (uint *)((long)puVar61 + 2);
      goto LAB_0123b016;
    }
    break;
  case 5:
    uVar3 = (ushort)*puVar61;
    if (((uVar3 & 0xc0e0) != 0x80c0) || ((uVar3 & 0x1e) == 0)) goto LAB_0123b160;
    *(ushort *)puVar103 = 0x755c;
    *(ushort *)((long)puVar103 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar3 >> 1) & 0xe));
    *(ushort *)(puVar103 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar3 >> 8) & 0x3f | (byte)uVar3 << 6) * 2);
    puVar103 = (uint *)((long)puVar103 + 6);
    puVar61 = (uint *)((long)puVar61 + 2);
    goto LAB_0123b016;
  case 6:
    if (puVar102 < puVar106) {
      uVar3 = (ushort)*puVar61;
      bVar78 = (byte)uVar3;
      uVar101 = (uint)(uint3)*puVar61;
      if ((((uVar101 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
         ((uVar3 & 0x200f) != 0x200d)) goto LAB_0123b11e;
    }
    else {
      uVar101 = *puVar61;
      bVar78 = (byte)uVar101;
      if ((((uVar101 & 0xc0c0f0) == 0x8080e0) && ((uVar101 & 0x200f) != 0)) &&
         ((uVar101 & 0x200f) != 0x200d)) {
LAB_0123b11e:
        *puVar103 = uVar101;
        puVar103 = (uint *)((long)puVar103 + 3);
        puVar61 = (uint *)((long)puVar61 + 3);
        goto LAB_0123b016;
      }
    }
    break;
  case 7:
    uVar3 = (ushort)*puVar61;
    bVar78 = *(byte *)((long)puVar61 + 2);
    if ((((*puVar61 & 0xc0c0f0) != 0x8080e0) || ((uVar3 & 0x200f) == 0)) ||
       ((uVar3 & 0x200f) == 0x200d)) {
LAB_0123b160:
      if ((flg & 0x20) != 0) {
        *(ushort *)puVar103 = 0x755c;
        ((ushort *)((long)puVar103 + 2))[0] = 0x4646;
        ((ushort *)((long)puVar103 + 2))[1] = 0x4446;
        puVar103 = (uint *)((long)puVar103 + 6);
        goto LAB_0123b32b;
      }
      goto LAB_0123b823;
    }
    uVar101 = *puVar61;
    *(ushort *)puVar103 = 0x755c;
    *(ushort *)((long)puVar103 + 2) =
         *(ushort *)
          (esc_hex_char_table +
          (ulong)((uVar3 >> 2 & 0xfc0 | (uint)(byte)uVar101 << 0xc) >> 8 & 0xff) * 2);
    *(ushort *)(puVar103 + 1) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar3 >> 2 & 0xc0 | bVar78 & 0x3f) * 2);
    puVar103 = (uint *)((long)puVar103 + 6);
    puVar61 = (uint *)((long)puVar61 + 3);
    goto LAB_0123b016;
  case 8:
    uVar101 = *puVar61;
    bVar78 = (byte)uVar101;
    if ((((uVar101 & 0xc0c0c0f8) == 0x808080f0) && ((uVar101 & 0x3007) != 0)) &&
       ((bVar78 >> 2 & (uVar101 & 0x3003) != 0) == 0)) {
      *puVar103 = uVar101;
      puVar103 = puVar103 + 1;
      puVar61 = puVar106;
      goto LAB_0123b016;
    }
    break;
  case 9:
    uVar101 = *puVar61;
    if ((((uVar101 & 0xc0c0c0f8) != 0x808080f0) || ((uVar101 & 0x3007) == 0)) ||
       (((byte)uVar101 >> 2 & (uVar101 & 0x3003) != 0) != 0)) goto LAB_0123b160;
    iVar72 = (uVar101 & 7) * 0x40000;
    iVar64 = (uVar101 & 0x3f00) * 0x10;
    *(ushort *)puVar103 = 0x755c;
    *(ushort *)((long)puVar103 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar72 + iVar64) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar103 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar101 >> 10 & 0xc00) - 0x10000) + iVar72 + iVar64 >> 9 & 0x1fe)
          );
    *(ushort *)((long)puVar103 + 6) = 0x755c;
    *(ushort *)(puVar103 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar101 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar103 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar101 >> 10 & 0xc0 | uVar101 >> 0x18 & 0x3f) * 2);
    puVar103 = puVar103 + 3;
    puVar61 = puVar106;
    goto LAB_0123b016;
  default:
    goto switchD_01239403_default;
  }
LAB_0123b317:
  if ((flg & 0x20) == 0) goto LAB_0123b823;
  *(byte *)puVar103 = bVar78;
  puVar103 = (uint *)((long)puVar103 + 1);
LAB_0123b32b:
  puVar61 = (uint *)((long)puVar61 + 1);
  goto LAB_0123b016;
switchD_0123b046_caseD_0:
  puVar66 = (uint *)((long)puVar61 + 1);
  *(byte *)puVar103 = bVar78;
  puVar106 = puVar103;
  goto LAB_0123ac59;
LAB_0123938d:
  *(byte *)puVar103 = bVar78;
  puVar103 = (uint *)((long)puVar103 + 1);
  puVar61 = (uint *)((long)puVar61 + 1);
  goto LAB_012393d8;
LAB_012393a2:
  *(ushort *)puVar103 = (ushort)*puVar61;
  puVar103 = (uint *)((long)puVar103 + 2);
  puVar61 = (uint *)((long)puVar61 + 2);
  goto LAB_012393d8;
LAB_012393bd:
  *(byte *)((long)puVar103 + 2) = *(byte *)((long)puVar61 + 2);
  *(ushort *)puVar103 = (ushort)*puVar61;
  puVar103 = (uint *)((long)puVar103 + 3);
  puVar61 = (uint *)((long)puVar61 + 3);
LAB_012393d8:
  puVar106 = puVar61 + 1;
  if (puVar102 < puVar106) {
    if (puVar102 != puVar61) {
      bVar78 = (byte)*puVar61;
      uVar69 = (ulong)bVar78;
      bVar2 = enc_table_cpy[uVar69];
      if ((long)(ulong)(bVar2 >> 1) <= (long)puVar102 - (long)puVar61) goto LAB_012393ee;
switchD_01239403_caseD_1:
      if ((flg & 2) != 0) goto LAB_01239518;
      goto LAB_012396ce;
    }
    goto switchD_01239403_default;
  }
  bVar78 = (byte)*puVar61;
  uVar69 = (ulong)bVar78;
  bVar2 = enc_table_cpy[uVar69];
LAB_012393ee:
  switch(bVar2) {
  case 0:
    goto switchD_01239403_caseD_0;
  case 1:
    goto switchD_01239403_caseD_1;
  case 2:
    *(ushort *)puVar103 = *(ushort *)(esc_single_char_table + uVar69 * 2);
    puVar103 = (uint *)((long)puVar103 + 2);
    puVar61 = (uint *)((long)puVar61 + 1);
    goto LAB_012393d8;
  case 3:
    *puVar103 = 0x3030755c;
    *(ushort *)(puVar103 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar61 * 2);
    goto LAB_01239531;
  case 4:
    uVar3 = (ushort)*puVar61;
    bVar78 = (byte)uVar3;
    if (((uVar3 & 0xc0e0) == 0x80c0) && ((uVar3 & 0x1e) != 0)) {
      *(ushort *)puVar103 = uVar3;
      puVar103 = (uint *)((long)puVar103 + 2);
      puVar61 = (uint *)((long)puVar61 + 2);
      goto LAB_012393d8;
    }
    break;
  case 5:
    uVar3 = (ushort)*puVar61;
    if (((uVar3 & 0xc0e0) != 0x80c0) || ((uVar3 & 0x1e) == 0)) goto LAB_01239518;
    *(ushort *)puVar103 = 0x755c;
    *(ushort *)((long)puVar103 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar3 >> 1) & 0xe));
    *(ushort *)(puVar103 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar3 >> 8) & 0x3f | (byte)uVar3 << 6) * 2);
    puVar103 = (uint *)((long)puVar103 + 6);
    puVar61 = (uint *)((long)puVar61 + 2);
    goto LAB_012393d8;
  case 6:
    if (puVar102 < puVar106) {
      uVar3 = (ushort)*puVar61;
      bVar78 = (byte)uVar3;
      uVar101 = (uint)(uint3)*puVar61;
      if (((uVar101 & 0xc0c0f0) == 0x8080e0) &&
         (uVar84 = uVar3 & 0x200f, uVar81 = (uint)uVar3, (uVar3 & 0x200f) != 0)) goto LAB_012394ca;
    }
    else {
      uVar101 = *puVar61;
      if (((uVar101 & 0xc0c0f0) == 0x8080e0) &&
         (uVar84 = uVar101 & 0x200f, uVar81 = uVar101, uVar84 != 0)) {
LAB_012394ca:
        bVar78 = (byte)uVar81;
        if (uVar84 != 0x200d) {
          *puVar103 = uVar101;
          puVar103 = (uint *)((long)puVar103 + 3);
          puVar61 = (uint *)((long)puVar61 + 3);
          goto LAB_012393d8;
        }
      }
      else {
        bVar78 = (byte)uVar101;
      }
    }
    break;
  case 7:
    uVar3 = (ushort)*puVar61;
    bVar78 = *(byte *)((long)puVar61 + 2);
    if ((((*puVar61 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
       ((uVar3 & 0x200f) != 0x200d)) {
      uVar101 = *puVar61;
      *(ushort *)puVar103 = 0x755c;
      *(ushort *)((long)puVar103 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar3 >> 2 & 0xfc0 | (uint)(byte)uVar101 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar103 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar3 >> 2 & 0xc0 | bVar78 & 0x3f) * 2);
      puVar103 = (uint *)((long)puVar103 + 6);
      puVar61 = (uint *)((long)puVar61 + 3);
    }
    else {
LAB_01239518:
      if ((flg & 0x20) == 0) goto LAB_0123b823;
      *(ushort *)puVar103 = 0x755c;
      ((ushort *)((long)puVar103 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar103 + 2))[1] = 0x4446;
LAB_01239531:
      puVar103 = (uint *)((long)puVar103 + 6);
      puVar61 = (uint *)((long)puVar61 + 1);
    }
    goto LAB_012393d8;
  case 8:
    uVar101 = *puVar61;
    bVar78 = (byte)uVar101;
    if ((((uVar101 & 0xc0c0c0f8) == 0x808080f0) && ((uVar101 & 0x3007) != 0)) &&
       ((bVar78 >> 2 & (uVar101 & 0x3003) != 0) == 0)) {
      *puVar103 = uVar101;
      puVar103 = puVar103 + 1;
      puVar61 = puVar106;
      goto LAB_012393d8;
    }
    break;
  case 9:
    uVar101 = *puVar61;
    if ((((uVar101 & 0xc0c0c0f8) != 0x808080f0) || ((uVar101 & 0x3007) == 0)) ||
       (((byte)uVar101 >> 2 & (uVar101 & 0x3003) != 0) != 0)) goto LAB_01239518;
    iVar72 = (uVar101 & 7) * 0x40000;
    iVar64 = (uVar101 & 0x3f00) * 0x10;
    *(ushort *)puVar103 = 0x755c;
    *(ushort *)((long)puVar103 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar72 + iVar64) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar103 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar101 >> 10 & 0xc00) - 0x10000) + iVar72 + iVar64 >> 9 & 0x1fe)
          );
    *(ushort *)((long)puVar103 + 6) = 0x755c;
    *(ushort *)(puVar103 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar101 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar103 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar101 >> 10 & 0xc0 | uVar101 >> 0x18 & 0x3f) * 2);
    puVar103 = puVar103 + 3;
    puVar61 = puVar106;
    goto LAB_012393d8;
  default:
    goto switchD_01239403_default;
  }
LAB_012396ce:
  if ((flg & 0x20) == 0) goto LAB_0123b823;
  *(byte *)puVar103 = bVar78;
  puVar103 = (uint *)((long)puVar103 + 1);
  puVar61 = (uint *)((long)puVar61 + 1);
  goto LAB_012393d8;
switchD_01239403_caseD_0:
  puVar66 = (uint *)((long)puVar61 + 1);
  *(byte *)puVar103 = bVar78;
  puVar106 = puVar103;
  goto LAB_012391c0;
LAB_01238007:
  *(byte *)puVar61 = bVar78;
  puVar61 = (uint *)((long)puVar61 + 1);
  puVar66 = (uint *)((long)puVar66 + 1);
  goto LAB_0123806a;
LAB_0123801c:
  *(ushort *)puVar61 = (ushort)*puVar66;
  puVar61 = (uint *)((long)puVar61 + 2);
  puVar66 = (uint *)((long)puVar66 + 2);
  goto LAB_0123806a;
LAB_01238038:
  *(byte *)((long)puVar61 + 2) = *(byte *)((long)puVar66 + 2);
  *(ushort *)puVar61 = (ushort)*puVar66;
  puVar61 = (uint *)((long)puVar61 + 3);
  puVar66 = (uint *)((long)puVar66 + 3);
LAB_0123806a:
  puVar102 = puVar66 + 1;
  if (puVar80 < puVar102) {
    if (puVar80 != puVar66) {
      bVar78 = (byte)*puVar66;
      uVar62 = (ulong)bVar78;
      bVar2 = local_a8[uVar62];
      if ((long)(ulong)(bVar2 >> 1) <= (long)puVar80 - (long)puVar66) goto LAB_01238085;
LAB_012380a9:
      if ((flg & 2) != 0) goto LAB_012381c4;
      goto LAB_01238390;
    }
    goto switchD_01236417_default;
  }
  bVar78 = (byte)*puVar66;
  uVar62 = (ulong)bVar78;
  bVar2 = local_a8[uVar62];
LAB_01238085:
  switch(bVar2) {
  case 0:
    goto switchD_012380a1_caseD_0;
  case 1:
    goto LAB_012380a9;
  case 2:
    *(ushort *)puVar61 = *(ushort *)(esc_single_char_table + uVar62 * 2);
    puVar61 = (uint *)((long)puVar61 + 2);
    goto LAB_012381de;
  case 3:
    *puVar61 = 0x3030755c;
    *(ushort *)(puVar61 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar66 * 2);
    goto LAB_012381da;
  case 4:
    uVar3 = (ushort)*puVar66;
    bVar78 = (byte)uVar3;
    if (((uVar3 & 0xc0e0) == 0x80c0) && ((uVar3 & 0x1e) != 0)) {
      *(ushort *)puVar61 = uVar3;
      puVar61 = (uint *)((long)puVar61 + 2);
LAB_01238382:
      puVar66 = (uint *)((long)puVar66 + 2);
      goto LAB_0123806a;
    }
    break;
  case 5:
    uVar3 = (ushort)*puVar66;
    if (((uVar3 & 0xc0e0) == 0x80c0) && ((uVar3 & 0x1e) != 0)) {
      *(ushort *)puVar61 = 0x755c;
      *(ushort *)((long)puVar61 + 2) =
           *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar3 >> 1) & 0xe));
      *(ushort *)(puVar61 + 1) =
           *(ushort *)
            (esc_hex_char_table + (ulong)(byte)((byte)(uVar3 >> 8) & 0x3f | (byte)uVar3 << 6) * 2);
      puVar61 = (uint *)((long)puVar61 + 6);
      goto LAB_01238382;
    }
    goto LAB_012381c4;
  case 6:
    if (puVar80 < puVar102) {
      uVar3 = (ushort)*puVar66;
      bVar78 = (byte)uVar3;
      uVar84 = (uint)(uint3)*puVar66;
      if ((((uVar84 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
         ((uVar3 & 0x200f) != 0x200d)) goto LAB_0123817f;
    }
    else {
      uVar84 = *puVar66;
      bVar78 = (byte)uVar84;
      if ((((uVar84 & 0xc0c0f0) == 0x8080e0) && ((uVar84 & 0x200f) != 0)) &&
         ((uVar84 & 0x200f) != 0x200d)) {
LAB_0123817f:
        *puVar61 = uVar84;
        puVar61 = (uint *)((long)puVar61 + 3);
        goto LAB_012383f2;
      }
    }
    break;
  case 7:
    uVar3 = (ushort)*puVar66;
    bVar78 = *(byte *)((long)puVar66 + 2);
    if ((((*puVar66 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
       ((uVar3 & 0x200f) != 0x200d)) {
      uVar84 = *puVar66;
      *(ushort *)puVar61 = 0x755c;
      *(ushort *)((long)puVar61 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar3 >> 2 & 0xfc0 | (uint)(byte)uVar84 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar61 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar3 >> 2 & 0xc0 | bVar78 & 0x3f) * 2);
      puVar61 = (uint *)((long)puVar61 + 6);
LAB_012383f2:
      puVar66 = (uint *)((long)puVar66 + 3);
    }
    else {
LAB_012381c4:
      if ((flg & 0x20) == 0) goto LAB_0123b823;
      *(ushort *)puVar61 = 0x755c;
      ((ushort *)((long)puVar61 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar61 + 2))[1] = 0x4446;
LAB_012381da:
      puVar61 = (uint *)((long)puVar61 + 6);
LAB_012381de:
      puVar66 = (uint *)((long)puVar66 + 1);
    }
    goto LAB_0123806a;
  case 8:
    uVar84 = *puVar66;
    bVar78 = (byte)uVar84;
    if ((((uVar84 & 0xc0c0c0f8) == 0x808080f0) && ((uVar84 & 0x3007) != 0)) &&
       ((bVar78 >> 2 & (uVar84 & 0x3003) != 0) == 0)) {
      *puVar61 = uVar84;
      puVar61 = puVar61 + 1;
      puVar66 = puVar102;
      goto LAB_0123806a;
    }
    break;
  case 9:
    uVar84 = *puVar66;
    if ((((uVar84 & 0xc0c0c0f8) != 0x808080f0) || ((uVar84 & 0x3007) == 0)) ||
       (((byte)uVar84 >> 2 & (uVar84 & 0x3003) != 0) != 0)) goto LAB_012381c4;
    iVar72 = (uVar84 & 7) * 0x40000;
    iVar64 = (uVar84 & 0x3f00) * 0x10;
    *(ushort *)puVar61 = 0x755c;
    *(ushort *)((long)puVar61 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar72 + iVar64) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar61 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar84 >> 10 & 0xc00) - 0x10000) + iVar72 + iVar64 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)puVar61 + 6) = 0x755c;
    *(ushort *)(puVar61 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(uVar84 >> 0x11 & 6) + 0x1b8)
    ;
    *(ushort *)((long)puVar61 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar84 >> 10 & 0xc0 | uVar84 >> 0x18 & 0x3f) * 2);
    puVar61 = puVar61 + 3;
    puVar66 = puVar102;
    goto LAB_0123806a;
  default:
    goto switchD_01236417_default;
  }
LAB_01238390:
  if ((flg & 0x20) == 0) goto LAB_0123b823;
  *(byte *)puVar61 = bVar78;
  puVar61 = (uint *)((long)puVar61 + 1);
  puVar66 = (uint *)((long)puVar66 + 1);
  goto LAB_0123806a;
switchD_012380a1_caseD_0:
  puVar106 = (uint *)((long)puVar66 + 1);
  *(byte *)puVar61 = bVar78;
  puVar102 = puVar61;
  goto LAB_01237e04;
LAB_01236390:
  *(byte *)puVar61 = bVar78;
  puVar61 = (uint *)((long)puVar61 + 1);
  puVar66 = (uint *)((long)puVar66 + 1);
  goto LAB_012363e9;
LAB_012363a5:
  *(ushort *)puVar61 = (ushort)*puVar66;
  puVar61 = (uint *)((long)puVar61 + 2);
  puVar66 = (uint *)((long)puVar66 + 2);
  goto LAB_012363e9;
LAB_012363c1:
  *(byte *)((long)puVar61 + 2) = *(byte *)((long)puVar66 + 2);
  *(ushort *)puVar61 = (ushort)*puVar66;
  puVar61 = (uint *)((long)puVar61 + 3);
  puVar66 = (uint *)((long)puVar66 + 3);
LAB_012363e9:
  puVar102 = puVar66 + 1;
  if (puVar80 < puVar102) {
    if (puVar80 != puVar66) {
      bVar78 = (byte)*puVar66;
      uVar62 = (ulong)bVar78;
      bVar2 = enc_table_cpy[uVar62];
      if ((long)(ulong)(bVar2 >> 1) <= (long)puVar80 - (long)puVar66) goto LAB_01236401;
switchD_01236417_caseD_1:
      if ((flg & 2) != 0) goto LAB_01236527;
      goto LAB_012366e2;
    }
    goto switchD_01236417_default;
  }
  bVar78 = (byte)*puVar66;
  uVar62 = (ulong)bVar78;
  bVar2 = enc_table_cpy[uVar62];
LAB_01236401:
  switch(bVar2) {
  case 0:
    goto switchD_01236417_caseD_0;
  case 1:
    goto switchD_01236417_caseD_1;
  case 2:
    *(ushort *)puVar61 = *(ushort *)(esc_single_char_table + uVar62 * 2);
    puVar61 = (uint *)((long)puVar61 + 2);
    puVar66 = (uint *)((long)puVar66 + 1);
    goto LAB_012363e9;
  case 3:
    *puVar61 = 0x3030755c;
    *(ushort *)(puVar61 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar66 * 2);
    goto LAB_0123653d;
  case 4:
    uVar3 = (ushort)*puVar66;
    bVar78 = (byte)uVar3;
    if (((uVar3 & 0xc0e0) == 0x80c0) && ((uVar3 & 0x1e) != 0)) {
      *(ushort *)puVar61 = uVar3;
      puVar61 = (uint *)((long)puVar61 + 2);
      puVar66 = (uint *)((long)puVar66 + 2);
      goto LAB_012363e9;
    }
    break;
  case 5:
    uVar3 = (ushort)*puVar66;
    if (((uVar3 & 0xc0e0) != 0x80c0) || ((uVar3 & 0x1e) == 0)) goto LAB_01236527;
    *(ushort *)puVar61 = 0x755c;
    *(ushort *)((long)puVar61 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar3 >> 1) & 0xe));
    *(ushort *)(puVar61 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar3 >> 8) & 0x3f | (byte)uVar3 << 6) * 2);
    puVar61 = (uint *)((long)puVar61 + 6);
    puVar66 = (uint *)((long)puVar66 + 2);
    goto LAB_012363e9;
  case 6:
    if (puVar80 < puVar102) {
      uVar3 = (ushort)*puVar66;
      bVar78 = (byte)uVar3;
      uVar84 = (uint)(uint3)*puVar66;
      if (((uVar84 & 0xc0c0f0) == 0x8080e0) &&
         (uVar94 = uVar3 & 0x200f, uVar89 = (uint)uVar3, (uVar3 & 0x200f) != 0)) goto LAB_012364da;
    }
    else {
      uVar84 = *puVar66;
      if (((uVar84 & 0xc0c0f0) == 0x8080e0) &&
         (uVar94 = uVar84 & 0x200f, uVar89 = uVar84, uVar94 != 0)) {
LAB_012364da:
        bVar78 = (byte)uVar89;
        if (uVar94 != 0x200d) {
          *puVar61 = uVar84;
          puVar61 = (uint *)((long)puVar61 + 3);
          puVar66 = (uint *)((long)puVar66 + 3);
          goto LAB_012363e9;
        }
      }
      else {
        bVar78 = (byte)uVar84;
      }
    }
    break;
  case 7:
    uVar3 = (ushort)*puVar66;
    bVar78 = *(byte *)((long)puVar66 + 2);
    if ((((*puVar66 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
       ((uVar3 & 0x200f) != 0x200d)) {
      uVar84 = *puVar66;
      *(ushort *)puVar61 = 0x755c;
      *(ushort *)((long)puVar61 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar3 >> 2 & 0xfc0 | (uint)(byte)uVar84 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar61 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar3 >> 2 & 0xc0 | bVar78 & 0x3f) * 2);
      puVar61 = (uint *)((long)puVar61 + 6);
      puVar66 = (uint *)((long)puVar66 + 3);
    }
    else {
LAB_01236527:
      if ((flg & 0x20) == 0) goto LAB_0123b823;
      *(ushort *)puVar61 = 0x755c;
      ((ushort *)((long)puVar61 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar61 + 2))[1] = 0x4446;
LAB_0123653d:
      puVar61 = (uint *)((long)puVar61 + 6);
      puVar66 = (uint *)((long)puVar66 + 1);
    }
    goto LAB_012363e9;
  case 8:
    uVar84 = *puVar66;
    bVar78 = (byte)uVar84;
    if ((((uVar84 & 0xc0c0c0f8) == 0x808080f0) && ((uVar84 & 0x3007) != 0)) &&
       ((bVar78 >> 2 & (uVar84 & 0x3003) != 0) == 0)) {
      *puVar61 = uVar84;
      puVar61 = puVar61 + 1;
      puVar66 = puVar102;
      goto LAB_012363e9;
    }
    break;
  case 9:
    uVar84 = *puVar66;
    if ((((uVar84 & 0xc0c0c0f8) != 0x808080f0) || ((uVar84 & 0x3007) == 0)) ||
       (((byte)uVar84 >> 2 & (uVar84 & 0x3003) != 0) != 0)) goto LAB_01236527;
    iVar72 = (uVar84 & 7) * 0x40000;
    iVar64 = (uVar84 & 0x3f00) * 0x10;
    *(ushort *)puVar61 = 0x755c;
    *(ushort *)((long)puVar61 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar72 + iVar64) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar61 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar84 >> 10 & 0xc00) - 0x10000) + iVar72 + iVar64 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)puVar61 + 6) = 0x755c;
    *(ushort *)(puVar61 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(uVar84 >> 0x11 & 6) + 0x1b8)
    ;
    *(ushort *)((long)puVar61 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar84 >> 10 & 0xc0 | uVar84 >> 0x18 & 0x3f) * 2);
    puVar61 = puVar61 + 3;
    puVar66 = puVar102;
    goto LAB_012363e9;
  default:
    goto switchD_01236417_default;
  }
LAB_012366e2:
  if ((flg & 0x20) == 0) goto LAB_0123b823;
  *(byte *)puVar61 = bVar78;
  puVar61 = (uint *)((long)puVar61 + 1);
  puVar66 = (uint *)((long)puVar66 + 1);
  goto LAB_012363e9;
switchD_01236417_caseD_0:
  puVar106 = (uint *)((long)puVar66 + 1);
  *(byte *)puVar61 = bVar78;
  puVar102 = puVar61;
  goto LAB_0123619c;
LAB_0123b8e7:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar70 = &local_48;
  if (err != (yyjson_write_err *)0x0) {
    pyVar70 = err;
  }
  pyVar59->code = 3;
  pcVar63 = "invalid JSON value type";
  goto LAB_0123b860;
  while( true ) {
    uVar67 = *local_c0;
    local_c0 = local_c0 + 1;
    local_68 = uVar67 & 0xffffffffffffff01;
    puVar102 = (uint *)(pbVar100 + 3);
    pbVar100[1] = 0x2c;
    pbVar100[2] = 10;
    lVar99 = (uVar67 >> 1) - 1;
    lVar83 = lVar73;
    if (lVar99 != 0) break;
LAB_01238c36:
    pbVar100 = (byte *)((long)puVar102 + -1);
    *(byte *)((long)puVar102 + -2) = 10;
    if (local_c0 <= (ulong *)((long)puVar102 + lVar83 * 4 + -1)) {
      uVar67 = (ulong)local_b8 >> 1;
      if ((ulong)local_b8 >> 1 <= (ulong)(lVar83 * 4)) {
        uVar67 = lVar83 * 4;
      }
      sVar77 = (uVar67 + 7 & 0xfffffffffffffff8) + (long)local_b8;
      pbVar107 = (byte *)(*p_Var8)(pvVar7,local_e0,(size_t)local_b8,sVar77);
      if (pbVar107 == (byte *)0x0) goto LAB_0123b888;
      sVar76 = (long)local_88 - (long)local_c0;
      memmove(pbVar107 + (sVar77 - sVar76),pbVar107 + ((long)local_c0 - (long)local_e0),sVar76);
      pbVar100 = pbVar107 + ((long)pbVar100 - (long)local_e0);
      local_88 = (ulong *)(pbVar107 + sVar77);
      local_e0 = pbVar107;
      local_c0 = (ulong *)(pbVar107 + (sVar77 - sVar76));
      local_b8 = (uint *)sVar77;
    }
    lVar73 = lVar83 + -1;
    if (lVar73 != 0) {
      lVar99 = 1;
      do {
        pbVar100[0] = 0x20;
        pbVar100[1] = 0x20;
        pbVar100[2] = 0x20;
        pbVar100[3] = 0x20;
        pbVar100 = pbVar100 + lVar91;
        lVar99 = lVar99 + 1;
      } while (lVar83 != lVar99);
    }
    *pbVar100 = (char)local_68 * ' ' + 0x5d;
    if (local_88 <= local_c0) {
      pbVar107 = pbVar100 + 1;
      if (local_ec < '\0') {
        if (local_c0 <= pbVar100 + 3) {
          uVar67 = 2;
          if (2 < (ulong)local_b8 >> 1) {
            uVar67 = (ulong)local_b8 >> 1;
          }
          sVar77 = (uVar67 + 7 & 0xfffffffffffffff8) + (long)local_b8;
          pbVar100 = (byte *)(*p_Var8)(pvVar7,local_e0,(size_t)local_b8,sVar77);
          if (pbVar100 == (byte *)0x0) goto LAB_0123b888;
          memmove(pbVar100 + (sVar77 - ((long)local_88 - (long)local_c0)),
                  pbVar100 + ((long)local_c0 - (long)local_e0),(long)local_88 - (long)local_c0);
          pbVar107 = pbVar100 + ((long)pbVar107 - (long)local_e0);
          local_e0 = pbVar100;
        }
        *pbVar107 = 10;
        pbVar107 = pbVar107 + 1;
      }
      *pbVar107 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)pbVar107 - (long)local_e0;
      }
LAB_0123e059:
      *(undefined8 *)pyVar59 = 0;
      pyVar59->msg = (char *)0x0;
      return (char *)local_e0;
    }
  }
  goto LAB_01235c51;
LAB_0123d926:
  *(byte *)local_38 = bVar78;
  local_38 = (uint *)((long)local_38 + 1);
  puVar61 = (uint *)((long)puVar61 + 1);
  goto LAB_0123d977;
LAB_0123d93b:
  *(ushort *)local_38 = (ushort)*puVar61;
  local_38 = (uint *)((long)local_38 + 2);
  puVar61 = (uint *)((long)puVar61 + 2);
  goto LAB_0123d977;
LAB_0123d958:
  *(byte *)((long)local_38 + 2) = *(byte *)((long)puVar61 + 2);
  *(ushort *)local_38 = (ushort)*puVar61;
  local_38 = (uint *)((long)local_38 + 3);
  puVar61 = (uint *)((long)puVar61 + 3);
LAB_0123d977:
  puVar106 = puVar61 + 1;
  if (puVar66 < puVar106) {
    if (puVar66 == puVar61) goto switchD_0123d9a2_default;
    uVar101 = (uint)(byte)*puVar61;
    uVar67 = (ulong)(byte)*puVar61;
    bVar78 = puVar97[uVar67];
    if ((long)(ulong)(bVar78 >> 1) <= (long)puVar66 - (long)puVar61) goto LAB_0123d98f;
switchD_0123d9a2_caseD_1:
    if ((flg & 2) != 0) goto LAB_0123dac8;
    goto LAB_0123dc7a;
  }
  uVar101 = (uint)(byte)*puVar61;
  uVar67 = (ulong)(byte)*puVar61;
  bVar78 = puVar97[uVar67];
LAB_0123d98f:
  switch(bVar78) {
  case 0:
    goto switchD_0123d9a2_caseD_0;
  case 1:
    goto switchD_0123d9a2_caseD_1;
  case 2:
    *(ushort *)local_38 = *(ushort *)(esc_single_char_table + uVar67 * 2);
    local_38 = (uint *)((long)local_38 + 2);
    puVar61 = (uint *)((long)puVar61 + 1);
    goto LAB_0123d977;
  case 3:
    *local_38 = 0x3030755c;
    *(ushort *)(local_38 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar61 * 2);
    goto LAB_0123dadf;
  case 4:
    uVar3 = (ushort)*puVar61;
    uVar101 = (uint)uVar3;
    if (((uVar101 & 0xc0e0) == 0x80c0) && ((uVar3 & 0x1e) != 0)) {
      *(ushort *)local_38 = uVar3;
      local_38 = (uint *)((long)local_38 + 2);
      puVar61 = (uint *)((long)puVar61 + 2);
      goto LAB_0123d977;
    }
    break;
  case 5:
    uVar3 = (ushort)*puVar61;
    if (((uVar3 & 0xc0e0) != 0x80c0) || ((uVar3 & 0x1e) == 0)) goto LAB_0123dac8;
    *(ushort *)local_38 = 0x755c;
    *(ushort *)((long)local_38 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar3 >> 1) & 0xe));
    *(ushort *)(local_38 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar3 >> 8) & 0x3f | (byte)uVar3 << 6) * 2);
    local_38 = (uint *)((long)local_38 + 6);
    puVar61 = (uint *)((long)puVar61 + 2);
    goto LAB_0123d977;
  case 6:
    if (puVar66 < puVar106) {
      uVar3 = (ushort)*puVar61;
      uVar101 = (uint)uVar3;
      uVar81 = (uint)(uint3)*puVar61;
      if (((uVar81 & 0xc0c0f0) == 0x8080e0) && (uVar84 = uVar3 & 0x200f, (uVar3 & 0x200f) != 0))
      goto LAB_0123da6f;
    }
    else {
      uVar81 = *puVar61;
      uVar101 = uVar81;
      if (((uVar81 & 0xc0c0f0) == 0x8080e0) && (uVar84 = uVar81 & 0x200f, uVar84 != 0)) {
LAB_0123da6f:
        if (uVar84 != 0x200d) {
          *local_38 = uVar81;
          local_38 = (uint *)((long)local_38 + 3);
          puVar61 = (uint *)((long)puVar61 + 3);
          goto LAB_0123d977;
        }
      }
    }
    break;
  case 7:
    uVar3 = (ushort)*puVar61;
    bVar78 = *(byte *)((long)puVar61 + 2);
    if ((((*puVar61 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
       ((uVar3 & 0x200f) != 0x200d)) {
      uVar101 = *puVar61;
      *(ushort *)local_38 = 0x755c;
      *(ushort *)((long)local_38 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar3 >> 2 & 0xfc0 | (uint)(byte)uVar101 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(local_38 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar3 >> 2 & 0xc0 | bVar78 & 0x3f) * 2);
      local_38 = (uint *)((long)local_38 + 6);
      puVar61 = (uint *)((long)puVar61 + 3);
    }
    else {
LAB_0123dac8:
      if ((flg & 0x20) == 0) goto LAB_0123def6;
      *(ushort *)local_38 = 0x755c;
      ((ushort *)((long)local_38 + 2))[0] = 0x4646;
      ((ushort *)((long)local_38 + 2))[1] = 0x4446;
LAB_0123dadf:
      local_38 = (uint *)((long)local_38 + 6);
      puVar61 = (uint *)((long)puVar61 + 1);
    }
    goto LAB_0123d977;
  case 8:
    uVar101 = *puVar61;
    if ((((uVar101 & 0xc0c0c0f8) == 0x808080f0) && ((uVar101 & 0x3007) != 0)) &&
       (((byte)uVar101 >> 2 & (uVar101 & 0x3003) != 0) == 0)) {
      *local_38 = uVar101;
      local_38 = local_38 + 1;
      puVar61 = puVar106;
      goto LAB_0123d977;
    }
    break;
  case 9:
    uVar101 = *puVar61;
    if ((((uVar101 & 0xc0c0c0f8) != 0x808080f0) || ((uVar101 & 0x3007) == 0)) ||
       (((byte)uVar101 >> 2 & (uVar101 & 0x3003) != 0) != 0)) goto LAB_0123dac8;
    iVar72 = (uVar101 & 7) * 0x40000;
    iVar64 = (uVar101 & 0x3f00) * 0x10;
    *(ushort *)local_38 = 0x755c;
    *(ushort *)((long)local_38 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar72 + iVar64) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(local_38 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar101 >> 10 & 0xc00) - 0x10000) + iVar72 + iVar64 >> 9 & 0x1fe)
          );
    *(ushort *)((long)local_38 + 6) = 0x755c;
    *(ushort *)(local_38 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar101 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)local_38 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar101 >> 10 & 0xc0 | uVar101 >> 0x18 & 0x3f) * 2);
    local_38 = local_38 + 3;
    puVar61 = puVar106;
    goto LAB_0123d977;
  default:
switchD_0123d9a2_default:
    *(byte *)local_38 = 0x22;
    local_38 = (uint *)((long)local_38 + 1);
    goto LAB_0123bc73;
  }
LAB_0123dc7a:
  if ((flg & 0x20) == 0) goto LAB_0123def6;
  *(byte *)local_38 = (byte)uVar101;
  local_38 = (uint *)((long)local_38 + 1);
  puVar61 = (uint *)((long)puVar61 + 1);
  goto LAB_0123d977;
switchD_0123d9a2_caseD_0:
  puVar106 = (uint *)((long)puVar61 + 1);
  *(byte *)local_38 = (byte)uVar101;
  puVar80 = local_38;
  goto LAB_0123d73f;
LAB_0123c114:
  *(byte *)local_38 = bVar78;
  local_38 = (uint *)((long)local_38 + 1);
  puVar61 = (uint *)((long)puVar61 + 1);
  goto LAB_0123c165;
LAB_0123c129:
  *(ushort *)local_38 = (ushort)*puVar61;
  local_38 = (uint *)((long)local_38 + 2);
  puVar61 = (uint *)((long)puVar61 + 2);
  goto LAB_0123c165;
LAB_0123c146:
  *(byte *)((long)local_38 + 2) = *(byte *)((long)puVar61 + 2);
  *(ushort *)local_38 = (ushort)*puVar61;
  local_38 = (uint *)((long)local_38 + 3);
  puVar61 = (uint *)((long)puVar61 + 3);
LAB_0123c165:
  puVar106 = puVar61 + 1;
  if (puVar66 < puVar106) {
    if (puVar66 == puVar61) goto switchD_0123c192_default;
    uVar67 = (ulong)(byte)*puVar61;
    bVar78 = enc_table_cpy[uVar67];
    if ((long)(ulong)(bVar78 >> 1) <= (long)puVar66 - (long)puVar61) goto LAB_0123c17d;
switchD_0123c192_caseD_1:
    bVar78 = (byte)uVar67;
    if ((flg & 2) != 0) goto LAB_0123c2b3;
    goto LAB_0123c469;
  }
  uVar67 = (ulong)(byte)*puVar61;
  bVar78 = enc_table_cpy[uVar67];
LAB_0123c17d:
  switch(bVar78) {
  case 0:
    goto switchD_0123c192_caseD_0;
  case 1:
    goto switchD_0123c192_caseD_1;
  case 2:
    *(ushort *)local_38 = *(ushort *)(esc_single_char_table + uVar67 * 2);
    local_38 = (uint *)((long)local_38 + 2);
    puVar61 = (uint *)((long)puVar61 + 1);
    goto LAB_0123c165;
  case 3:
    *local_38 = 0x3030755c;
    *(ushort *)(local_38 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar61 * 2);
    goto LAB_0123c2cc;
  case 4:
    uVar3 = (ushort)*puVar61;
    bVar78 = (byte)uVar3;
    if (((uVar3 & 0xc0e0) == 0x80c0) && ((uVar3 & 0x1e) != 0)) {
      *(ushort *)local_38 = uVar3;
      local_38 = (uint *)((long)local_38 + 2);
      puVar61 = (uint *)((long)puVar61 + 2);
      goto LAB_0123c165;
    }
    break;
  case 5:
    uVar3 = (ushort)*puVar61;
    if (((uVar3 & 0xc0e0) != 0x80c0) || ((uVar3 & 0x1e) == 0)) goto LAB_0123c2b3;
    *(ushort *)local_38 = 0x755c;
    *(ushort *)((long)local_38 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar3 >> 1) & 0xe));
    *(ushort *)(local_38 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar3 >> 8) & 0x3f | (byte)uVar3 << 6) * 2);
    local_38 = (uint *)((long)local_38 + 6);
    puVar61 = (uint *)((long)puVar61 + 2);
    goto LAB_0123c165;
  case 6:
    if (puVar66 < puVar106) {
      uVar3 = (ushort)*puVar61;
      bVar78 = (byte)uVar3;
      uVar101 = (uint)(uint3)*puVar61;
      if (((uVar101 & 0xc0c0f0) == 0x8080e0) &&
         (uVar84 = uVar3 & 0x200f, uVar81 = (uint)uVar3, (uVar3 & 0x200f) != 0)) goto LAB_0123c260;
    }
    else {
      uVar101 = *puVar61;
      if (((uVar101 & 0xc0c0f0) == 0x8080e0) &&
         (uVar84 = uVar101 & 0x200f, uVar81 = uVar101, uVar84 != 0)) {
LAB_0123c260:
        bVar78 = (byte)uVar81;
        if (uVar84 != 0x200d) {
          *local_38 = uVar101;
          local_38 = (uint *)((long)local_38 + 3);
          puVar61 = (uint *)((long)puVar61 + 3);
          goto LAB_0123c165;
        }
      }
      else {
        bVar78 = (byte)uVar101;
      }
    }
    break;
  case 7:
    uVar3 = (ushort)*puVar61;
    bVar78 = *(byte *)((long)puVar61 + 2);
    if ((((*puVar61 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
       ((uVar3 & 0x200f) != 0x200d)) {
      uVar101 = *puVar61;
      *(ushort *)local_38 = 0x755c;
      *(ushort *)((long)local_38 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar3 >> 2 & 0xfc0 | (uint)(byte)uVar101 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(local_38 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar3 >> 2 & 0xc0 | bVar78 & 0x3f) * 2);
      local_38 = (uint *)((long)local_38 + 6);
      puVar61 = (uint *)((long)puVar61 + 3);
    }
    else {
LAB_0123c2b3:
      if ((flg & 0x20) == 0) goto LAB_0123def6;
      *(ushort *)local_38 = 0x755c;
      ((ushort *)((long)local_38 + 2))[0] = 0x4646;
      ((ushort *)((long)local_38 + 2))[1] = 0x4446;
LAB_0123c2cc:
      local_38 = (uint *)((long)local_38 + 6);
      puVar61 = (uint *)((long)puVar61 + 1);
    }
    goto LAB_0123c165;
  case 8:
    uVar101 = *puVar61;
    bVar78 = (byte)uVar101;
    if ((((uVar101 & 0xc0c0c0f8) == 0x808080f0) && ((uVar101 & 0x3007) != 0)) &&
       ((bVar78 >> 2 & (uVar101 & 0x3003) != 0) == 0)) {
      *local_38 = uVar101;
      local_38 = local_38 + 1;
      puVar61 = puVar106;
      goto LAB_0123c165;
    }
    break;
  case 9:
    uVar101 = *puVar61;
    if ((((uVar101 & 0xc0c0c0f8) != 0x808080f0) || ((uVar101 & 0x3007) == 0)) ||
       (((byte)uVar101 >> 2 & (uVar101 & 0x3003) != 0) != 0)) goto LAB_0123c2b3;
    iVar64 = (uVar101 & 7) * 0x40000;
    iVar72 = (uVar101 & 0x3f00) * 0x10;
    *(ushort *)local_38 = 0x755c;
    *(ushort *)((long)local_38 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar64 + iVar72) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(local_38 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar101 >> 10 & 0xc00) - 0x10000) + iVar64 + iVar72 >> 9 & 0x1fe)
          );
    *(ushort *)((long)local_38 + 6) = 0x755c;
    *(ushort *)(local_38 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar101 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)local_38 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar101 >> 10 & 0xc0 | uVar101 >> 0x18 & 0x3f) * 2);
    local_38 = local_38 + 3;
    puVar61 = puVar106;
    goto LAB_0123c165;
  default:
switchD_0123c192_default:
    *(byte *)local_38 = 0x22;
    local_38 = (uint *)((long)local_38 + 1);
    goto LAB_0123bc73;
  }
LAB_0123c469:
  if ((flg & 0x20) == 0) goto LAB_0123def6;
  *(byte *)local_38 = bVar78;
  local_38 = (uint *)((long)local_38 + 1);
  puVar61 = (uint *)((long)puVar61 + 1);
  goto LAB_0123c165;
LAB_0123def6:
  (*p_Var6)(pvVar7,puVar102);
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar70 = &local_48;
  if (err != (yyjson_write_err *)0x0) {
    pyVar70 = err;
  }
  pyVar59->code = 7;
  pcVar63 = "invalid utf-8 encoding in string";
  goto LAB_0123bce0;
switchD_0123c192_caseD_0:
  puVar106 = (uint *)((long)puVar61 + 1);
  *(byte *)local_38 = (byte)uVar67;
  puVar80 = local_38;
  goto LAB_0123bf2d;
LAB_0123b823:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar70 = &local_48;
  if (err != (yyjson_write_err *)0x0) {
    pyVar70 = err;
  }
  pyVar59->code = 7;
  pcVar63 = "invalid utf-8 encoding in string";
LAB_0123b860:
  pyVar70->msg = pcVar63;
  if (local_e0 == (byte *)0x0) {
    return (char *)0x0;
  }
  (*p_Var6)(pvVar7,local_e0);
  return (char *)0x0;
}

Assistant:

char *yyjson_val_write_opts(const yyjson_val *val,
                            yyjson_write_flag flg,
                            const yyjson_alc *alc_ptr,
                            usize *dat_len,
                            yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    usize dummy_dat_len;
    yyjson_alc alc = alc_ptr ? *alc_ptr : YYJSON_DEFAULT_ALC;
    yyjson_val *root = constcast(yyjson_val *)val;

    err = err ? err : &dummy_err;
    dat_len = dat_len ? dat_len : &dummy_dat_len;

    if (unlikely(!root)) {
        *dat_len = 0;
        err->msg = "input JSON is NULL";
        err->code = YYJSON_READ_ERROR_INVALID_PARAMETER;
        return NULL;
    }

    if (!unsafe_yyjson_is_ctn(root) || unsafe_yyjson_get_len(root) == 0) {
        return (char *)yyjson_write_single(root, flg, alc, dat_len, err);
    } else if (flg & (YYJSON_WRITE_PRETTY | YYJSON_WRITE_PRETTY_TWO_SPACES)) {
        return (char *)yyjson_write_pretty(root, flg, alc, dat_len, err);
    } else {
        return (char *)yyjson_write_minify(root, flg, alc, dat_len, err);
    }
}